

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O1

void embree::avx::CurveNiMBIntersector1<8>::
     intersect_t<embree::avx::SweepCurve1Intersector1<embree::BSplineCurveT>,embree::avx::Intersect1Epilog1<true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  undefined4 uVar8;
  undefined8 uVar9;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar10;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar11;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  Primitive PVar31;
  Geometry *pGVar32;
  __int_type_conflict _Var33;
  long lVar34;
  RTCFilterFunctionN p_Var35;
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  bool bVar88;
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  bool bVar102;
  bool bVar103;
  bool bVar104;
  bool bVar105;
  bool bVar106;
  bool bVar107;
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  uint uVar117;
  ulong uVar118;
  ulong uVar119;
  long lVar120;
  long lVar121;
  uint uVar122;
  long lVar123;
  ulong uVar124;
  bool bVar125;
  float fVar126;
  float fVar154;
  float fVar156;
  __m128 a;
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  float fVar127;
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  float fVar160;
  float fVar162;
  float fVar163;
  undefined1 auVar141 [32];
  undefined1 auVar161 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  float fVar155;
  float fVar157;
  float fVar158;
  float fVar159;
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  float fVar164;
  float fVar199;
  float fVar201;
  undefined1 auVar165 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  float fVar205;
  undefined1 auVar178 [32];
  undefined1 auVar166 [16];
  anon_union_4_3_4e909a83_for_anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1_3
  aVar202;
  undefined1 auVar167 [16];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  float fVar200;
  float fVar203;
  float fVar204;
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar344 [16];
  undefined1 auVar345 [16];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [32];
  float fVar225;
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  float fVar226;
  float fVar242;
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [28];
  float fVar241;
  float fVar243;
  float fVar244;
  undefined1 auVar234 [32];
  undefined1 auVar235 [32];
  float fVar245;
  undefined1 auVar236 [32];
  undefined1 auVar237 [32];
  undefined1 auVar238 [32];
  undefined1 auVar239 [32];
  undefined1 auVar240 [32];
  float fVar246;
  float fVar247;
  float fVar263;
  float fVar265;
  float fVar267;
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  float fVar269;
  float fVar271;
  float fVar273;
  undefined1 auVar258 [32];
  float fVar264;
  float fVar266;
  float fVar268;
  float fVar270;
  float fVar272;
  float fVar274;
  undefined1 auVar259 [32];
  undefined1 auVar260 [32];
  undefined1 auVar261 [32];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar262 [32];
  float fVar275;
  float fVar293;
  float fVar294;
  undefined1 auVar276 [16];
  float fVar295;
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  float fVar296;
  float fVar297;
  float fVar298;
  undefined1 auVar281 [32];
  undefined1 auVar282 [32];
  undefined1 auVar283 [32];
  undefined1 auVar284 [32];
  undefined1 auVar285 [32];
  undefined1 auVar286 [32];
  undefined1 auVar287 [32];
  float fVar299;
  undefined1 auVar288 [32];
  undefined1 auVar289 [32];
  undefined1 auVar290 [32];
  undefined1 auVar291 [32];
  undefined1 auVar292 [64];
  float fVar300;
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  float fVar311;
  float fVar312;
  float fVar316;
  float fVar318;
  float fVar322;
  undefined1 auVar304 [32];
  float fVar314;
  float fVar319;
  float fVar320;
  float fVar323;
  float fVar324;
  float fVar326;
  undefined1 auVar305 [32];
  undefined1 auVar306 [32];
  float fVar313;
  float fVar315;
  float fVar317;
  float fVar321;
  float fVar325;
  undefined1 auVar307 [32];
  undefined1 auVar308 [32];
  undefined1 auVar309 [32];
  undefined1 auVar310 [64];
  float fVar327;
  float fVar336;
  float fVar337;
  float fVar338;
  float fVar339;
  float fVar340;
  float fVar341;
  undefined1 auVar328 [32];
  undefined1 auVar329 [32];
  undefined1 auVar330 [32];
  undefined1 auVar331 [32];
  undefined1 auVar332 [32];
  undefined1 auVar333 [32];
  undefined1 auVar334 [32];
  undefined1 auVar335 [64];
  float fVar342;
  float fVar356;
  float fVar358;
  float fVar362;
  float fVar364;
  float fVar366;
  undefined1 auVar346 [32];
  undefined1 auVar347 [32];
  undefined1 auVar348 [32];
  undefined1 auVar349 [32];
  undefined1 auVar350 [32];
  float fVar343;
  undefined1 auVar351 [32];
  float fVar357;
  float fVar359;
  float fVar360;
  float fVar361;
  float fVar363;
  float fVar365;
  float fVar367;
  float fVar368;
  float fVar369;
  undefined1 auVar352 [32];
  undefined1 auVar353 [32];
  undefined1 auVar354 [32];
  undefined1 auVar355 [32];
  undefined1 auVar370 [16];
  undefined1 auVar371 [16];
  float fVar378;
  undefined1 auVar372 [32];
  undefined1 auVar373 [32];
  undefined1 auVar374 [32];
  undefined1 auVar375 [32];
  float fVar379;
  float fVar380;
  undefined1 auVar376 [32];
  undefined1 auVar377 [64];
  undefined1 auVar381 [16];
  undefined1 auVar382 [32];
  undefined1 auVar383 [32];
  undefined1 auVar384 [32];
  undefined1 auVar385 [32];
  undefined1 auVar386 [32];
  undefined1 auVar387 [32];
  undefined1 auVar388 [32];
  undefined1 auVar389 [64];
  undefined1 auVar391 [16];
  undefined1 auVar392 [16];
  float fVar390;
  float fVar401;
  float fVar402;
  float fVar404;
  float fVar405;
  float fVar406;
  undefined1 auVar393 [32];
  undefined1 auVar394 [32];
  undefined1 auVar395 [32];
  undefined1 auVar396 [32];
  undefined1 auVar397 [32];
  float fVar403;
  float fVar407;
  undefined1 auVar398 [32];
  undefined1 auVar399 [32];
  undefined1 auVar400 [64];
  float fVar408;
  float fVar409;
  float fVar416;
  float fVar417;
  float fVar418;
  float fVar419;
  float fVar420;
  float fVar421;
  float fVar422;
  float in_register_0000151c;
  undefined1 auVar410 [32];
  undefined1 auVar411 [32];
  undefined1 auVar412 [32];
  undefined1 auVar413 [32];
  float fVar423;
  undefined1 auVar414 [32];
  undefined1 auVar415 [64];
  float fVar424;
  float fVar425;
  float fVar428;
  float fVar429;
  float fVar430;
  float fVar431;
  float fVar432;
  float fVar433;
  float fVar434;
  float fVar435;
  float fVar436;
  float fVar437;
  float fVar438;
  float fVar439;
  undefined1 auVar426 [32];
  undefined1 auVar427 [32];
  undefined1 auVar440 [16];
  float in_register_0000159c;
  undefined1 auVar441 [32];
  undefined1 auVar442 [32];
  undefined1 auVar443 [32];
  undefined1 auVar444 [32];
  undefined1 auVar445 [16];
  undefined1 auVar446 [32];
  float in_register_000015dc;
  undefined1 auVar447 [64];
  RTCFilterFunctionNArguments args;
  vfloatx_conflict u_outer1;
  vfloatx_conflict u_outer0;
  BBox<embree::vfloat_impl<8>_> tp1;
  BBox<embree::vfloat_impl<8>_> tp0;
  StackEntry stack [3];
  int local_aec;
  ulong local_ae8;
  float local_ae0;
  float fStack_adc;
  float fStack_ad8;
  float fStack_ad4;
  float fStack_ad0;
  float fStack_acc;
  float fStack_ac8;
  float fStack_ac4;
  float local_ac0;
  float fStack_abc;
  float fStack_ab8;
  float fStack_ab4;
  float fStack_ab0;
  float fStack_aac;
  float fStack_aa8;
  float fStack_aa4;
  ulong local_a88;
  undefined1 local_a80 [8];
  float fStack_a78;
  float fStack_a74;
  float fStack_a70;
  float fStack_a6c;
  float fStack_a68;
  float fStack_a64;
  float local_a60;
  float fStack_a5c;
  float fStack_a58;
  float fStack_a54;
  float fStack_a50;
  float fStack_a4c;
  float fStack_a48;
  float fStack_a44;
  RTCFilterFunctionNArguments local_a30;
  undefined1 local_a00 [32];
  undefined1 local_9e0 [8];
  float fStack_9d8;
  float fStack_9d4;
  undefined1 local_9d0 [8];
  float fStack_9c8;
  float fStack_9c4;
  undefined1 local_9c0 [8];
  float fStack_9b8;
  float fStack_9b4;
  undefined1 local_9b0 [8];
  float fStack_9a8;
  float fStack_9a4;
  undefined1 local_9a0 [32];
  undefined1 local_980 [32];
  undefined1 local_960 [32];
  undefined1 local_940 [32];
  undefined8 local_910;
  float local_908;
  float local_904;
  undefined4 local_900;
  uint local_8fc;
  uint local_8f8;
  uint local_8f4;
  uint local_8f0;
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [8];
  float fStack_898;
  float fStack_894;
  undefined1 auStack_890 [16];
  undefined1 local_880 [8];
  float fStack_878;
  float fStack_874;
  undefined1 auStack_870 [16];
  undefined1 local_860 [32];
  undefined1 local_840 [8];
  float fStack_838;
  float fStack_834;
  float fStack_830;
  float fStack_82c;
  float fStack_828;
  float fStack_824;
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [32];
  undefined8 local_7b0;
  undefined8 uStack_7a8;
  undefined1 local_7a0 [16];
  Primitive *local_790;
  ulong local_788;
  undefined1 local_780 [8];
  float fStack_778;
  float fStack_774;
  float fStack_770;
  float fStack_76c;
  float fStack_768;
  float fStack_764;
  undefined1 local_760 [32];
  undefined1 local_740 [8];
  float fStack_738;
  float fStack_734;
  float fStack_730;
  float fStack_72c;
  float fStack_728;
  float fStack_724;
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [8];
  float fStack_6b8;
  float fStack_6b4;
  float fStack_6b0;
  float fStack_6ac;
  float fStack_6a8;
  float fStack_6a4;
  undefined1 local_6a0 [8];
  float fStack_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float fStack_688;
  undefined1 local_680 [8];
  float fStack_678;
  float fStack_674;
  float fStack_670;
  float fStack_66c;
  float fStack_668;
  undefined1 local_660 [8];
  float fStack_658;
  float fStack_654;
  float fStack_650;
  float fStack_64c;
  float fStack_648;
  undefined1 local_640 [32];
  float local_620;
  float fStack_61c;
  float fStack_618;
  float fStack_614;
  float fStack_610;
  float fStack_60c;
  float fStack_608;
  float fStack_604;
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  float local_540;
  float fStack_53c;
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  float fStack_524;
  float local_520;
  float fStack_51c;
  float fStack_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  float fStack_504;
  float local_500 [4];
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  float fStack_4e4;
  float local_4e0 [4];
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  float fStack_4c4;
  undefined1 local_4b0 [16];
  undefined1 local_4a0 [8];
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  float fStack_484;
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [8];
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  undefined1 local_3c0 [8];
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  undefined1 local_3a0 [8];
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  undefined1 local_340 [8];
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  undefined1 local_320 [8];
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  undefined1 local_300 [8];
  float fStack_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  undefined1 local_2e0 [8];
  float fStack_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  undefined1 local_2c0 [8];
  float fStack_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [8];
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  undefined1 local_220 [8];
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  undefined1 local_200 [8];
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  undefined4 uStack_1e4;
  undefined1 local_1e0 [8];
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  undefined4 uStack_1c4;
  undefined1 local_1c0 [8];
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  undefined4 uStack_1a4;
  undefined1 local_1a0 [8];
  float fStack_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  float afStack_140 [2];
  uint auStack_138 [66];
  
  PVar31 = prim[1];
  uVar124 = (ulong)(byte)PVar31;
  lVar120 = uVar124 * 0x25;
  fVar226 = *(float *)(prim + lVar120 + 0x12);
  auVar132 = vsubps_avx((undefined1  [16])(ray->super_RayK<1>).org.field_0,
                        *(undefined1 (*) [16])(prim + lVar120 + 6));
  auVar276._0_4_ = fVar226 * (ray->super_RayK<1>).dir.field_0.m128[0];
  auVar276._4_4_ = fVar226 * (ray->super_RayK<1>).dir.field_0.m128[1];
  auVar276._8_4_ = fVar226 * (ray->super_RayK<1>).dir.field_0.m128[2];
  auVar276._12_4_ = fVar226 * (ray->super_RayK<1>).dir.field_0.m128[3];
  auVar170 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar124 * 4 + 6)));
  auVar165._0_4_ = fVar226 * auVar132._0_4_;
  auVar165._4_4_ = fVar226 * auVar132._4_4_;
  auVar165._8_4_ = fVar226 * auVar132._8_4_;
  auVar165._12_4_ = fVar226 * auVar132._12_4_;
  auVar132 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar124 * 4 + 10)));
  auVar147._16_16_ = auVar132;
  auVar147._0_16_ = auVar170;
  auVar147 = vcvtdq2ps_avx(auVar147);
  lVar34 = uVar124 * 5;
  auVar170 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar34 + 6)));
  auVar132 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar34 + 10)));
  auVar216._16_16_ = auVar132;
  auVar216._0_16_ = auVar170;
  auVar170 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar124 * 6 + 6)));
  auVar132 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar124 * 6 + 10)));
  auVar182 = vcvtdq2ps_avx(auVar216);
  auVar234._16_16_ = auVar132;
  auVar234._0_16_ = auVar170;
  auVar36 = vcvtdq2ps_avx(auVar234);
  auVar170 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar124 * 0xf + 6)));
  auVar132 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar124 * 0xf + 10)));
  auVar235._16_16_ = auVar132;
  auVar235._0_16_ = auVar170;
  auVar37 = vcvtdq2ps_avx(auVar235);
  lVar123 = (ulong)(byte)PVar31 * 0x10;
  auVar170 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar123 + 6)));
  auVar132 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar123 + 10)));
  auVar304._16_16_ = auVar132;
  auVar304._0_16_ = auVar170;
  auVar170 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar123 + uVar124 + 6)));
  auVar183 = vcvtdq2ps_avx(auVar304);
  auVar132 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar123 + uVar124 + 10)));
  auVar328._16_16_ = auVar132;
  auVar328._0_16_ = auVar170;
  auVar170 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar124 * 0x1a + 6)));
  auVar186 = vcvtdq2ps_avx(auVar328);
  auVar132 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar124 * 0x1a + 10)));
  auVar329._16_16_ = auVar132;
  auVar329._0_16_ = auVar170;
  auVar352 = vcvtdq2ps_avx(auVar329);
  auVar170 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar124 * 0x1b + 6)));
  auVar132 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar124 * 0x1b + 10)));
  auVar372._16_16_ = auVar132;
  auVar372._0_16_ = auVar170;
  auVar170 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar124 * 0x1c + 6)));
  auVar132 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar124 * 0x1c + 10)));
  auVar38 = vcvtdq2ps_avx(auVar372);
  auVar382._16_16_ = auVar132;
  auVar382._0_16_ = auVar170;
  auVar39 = vcvtdq2ps_avx(auVar382);
  auVar170 = vshufps_avx(auVar276,auVar276,0);
  auVar132 = vshufps_avx(auVar276,auVar276,0x55);
  auVar161 = vshufps_avx(auVar276,auVar276,0xaa);
  fVar226 = auVar161._0_4_;
  fVar200 = auVar161._4_4_;
  fVar241 = auVar161._8_4_;
  fVar204 = auVar161._12_4_;
  fVar225 = auVar132._0_4_;
  fVar205 = auVar132._4_4_;
  fVar242 = auVar132._8_4_;
  fVar127 = auVar132._12_4_;
  fVar243 = auVar170._0_4_;
  fVar244 = auVar170._4_4_;
  fVar245 = auVar170._8_4_;
  fVar246 = auVar170._12_4_;
  auVar410._0_4_ = fVar243 * auVar147._0_4_ + fVar225 * auVar182._0_4_ + fVar226 * auVar36._0_4_;
  auVar410._4_4_ = fVar244 * auVar147._4_4_ + fVar205 * auVar182._4_4_ + fVar200 * auVar36._4_4_;
  auVar410._8_4_ = fVar245 * auVar147._8_4_ + fVar242 * auVar182._8_4_ + fVar241 * auVar36._8_4_;
  auVar410._12_4_ = fVar246 * auVar147._12_4_ + fVar127 * auVar182._12_4_ + fVar204 * auVar36._12_4_
  ;
  auVar410._16_4_ = fVar243 * auVar147._16_4_ + fVar225 * auVar182._16_4_ + fVar226 * auVar36._16_4_
  ;
  auVar410._20_4_ = fVar244 * auVar147._20_4_ + fVar205 * auVar182._20_4_ + fVar200 * auVar36._20_4_
  ;
  auVar410._24_4_ = fVar245 * auVar147._24_4_ + fVar242 * auVar182._24_4_ + fVar241 * auVar36._24_4_
  ;
  auVar410._28_4_ = fVar127 + in_register_000015dc + in_register_0000151c;
  auVar393._0_4_ = fVar243 * auVar37._0_4_ + fVar225 * auVar183._0_4_ + auVar186._0_4_ * fVar226;
  auVar393._4_4_ = fVar244 * auVar37._4_4_ + fVar205 * auVar183._4_4_ + auVar186._4_4_ * fVar200;
  auVar393._8_4_ = fVar245 * auVar37._8_4_ + fVar242 * auVar183._8_4_ + auVar186._8_4_ * fVar241;
  auVar393._12_4_ = fVar246 * auVar37._12_4_ + fVar127 * auVar183._12_4_ + auVar186._12_4_ * fVar204
  ;
  auVar393._16_4_ = fVar243 * auVar37._16_4_ + fVar225 * auVar183._16_4_ + auVar186._16_4_ * fVar226
  ;
  auVar393._20_4_ = fVar244 * auVar37._20_4_ + fVar205 * auVar183._20_4_ + auVar186._20_4_ * fVar200
  ;
  auVar393._24_4_ = fVar245 * auVar37._24_4_ + fVar242 * auVar183._24_4_ + auVar186._24_4_ * fVar241
  ;
  auVar393._28_4_ = fVar127 + in_register_000015dc + in_register_0000159c;
  auVar281._0_4_ = fVar243 * auVar352._0_4_ + fVar225 * auVar38._0_4_ + auVar39._0_4_ * fVar226;
  auVar281._4_4_ = fVar244 * auVar352._4_4_ + fVar205 * auVar38._4_4_ + auVar39._4_4_ * fVar200;
  auVar281._8_4_ = fVar245 * auVar352._8_4_ + fVar242 * auVar38._8_4_ + auVar39._8_4_ * fVar241;
  auVar281._12_4_ = fVar246 * auVar352._12_4_ + fVar127 * auVar38._12_4_ + auVar39._12_4_ * fVar204;
  auVar281._16_4_ = fVar243 * auVar352._16_4_ + fVar225 * auVar38._16_4_ + auVar39._16_4_ * fVar226;
  auVar281._20_4_ = fVar244 * auVar352._20_4_ + fVar205 * auVar38._20_4_ + auVar39._20_4_ * fVar200;
  auVar281._24_4_ = fVar245 * auVar352._24_4_ + fVar242 * auVar38._24_4_ + auVar39._24_4_ * fVar241;
  auVar281._28_4_ = fVar246 + fVar127 + fVar204;
  auVar170 = vshufps_avx(auVar165,auVar165,0);
  auVar132 = vshufps_avx(auVar165,auVar165,0x55);
  auVar161 = vshufps_avx(auVar165,auVar165,0xaa);
  fVar226 = auVar161._0_4_;
  fVar200 = auVar161._4_4_;
  fVar241 = auVar161._8_4_;
  fVar204 = auVar161._12_4_;
  fVar244 = auVar132._0_4_;
  fVar245 = auVar132._4_4_;
  fVar246 = auVar132._8_4_;
  fVar263 = auVar132._12_4_;
  fVar225 = auVar182._28_4_ + auVar36._28_4_;
  fVar205 = auVar170._0_4_;
  fVar242 = auVar170._4_4_;
  fVar127 = auVar170._8_4_;
  fVar243 = auVar170._12_4_;
  auVar178._0_4_ = fVar205 * auVar147._0_4_ + fVar244 * auVar182._0_4_ + fVar226 * auVar36._0_4_;
  auVar178._4_4_ = fVar242 * auVar147._4_4_ + fVar245 * auVar182._4_4_ + fVar200 * auVar36._4_4_;
  auVar178._8_4_ = fVar127 * auVar147._8_4_ + fVar246 * auVar182._8_4_ + fVar241 * auVar36._8_4_;
  auVar178._12_4_ = fVar243 * auVar147._12_4_ + fVar263 * auVar182._12_4_ + fVar204 * auVar36._12_4_
  ;
  auVar178._16_4_ = fVar205 * auVar147._16_4_ + fVar244 * auVar182._16_4_ + fVar226 * auVar36._16_4_
  ;
  auVar178._20_4_ = fVar242 * auVar147._20_4_ + fVar245 * auVar182._20_4_ + fVar200 * auVar36._20_4_
  ;
  auVar178._24_4_ = fVar127 * auVar147._24_4_ + fVar246 * auVar182._24_4_ + fVar241 * auVar36._24_4_
  ;
  auVar178._28_4_ = auVar147._28_4_ + fVar225;
  auVar141._0_4_ = fVar205 * auVar37._0_4_ + auVar186._0_4_ * fVar226 + fVar244 * auVar183._0_4_;
  auVar141._4_4_ = fVar242 * auVar37._4_4_ + auVar186._4_4_ * fVar200 + fVar245 * auVar183._4_4_;
  auVar141._8_4_ = fVar127 * auVar37._8_4_ + auVar186._8_4_ * fVar241 + fVar246 * auVar183._8_4_;
  auVar141._12_4_ = fVar243 * auVar37._12_4_ + auVar186._12_4_ * fVar204 + fVar263 * auVar183._12_4_
  ;
  auVar141._16_4_ = fVar205 * auVar37._16_4_ + auVar186._16_4_ * fVar226 + fVar244 * auVar183._16_4_
  ;
  auVar141._20_4_ = fVar242 * auVar37._20_4_ + auVar186._20_4_ * fVar200 + fVar245 * auVar183._20_4_
  ;
  auVar141._24_4_ = fVar127 * auVar37._24_4_ + auVar186._24_4_ * fVar241 + fVar246 * auVar183._24_4_
  ;
  auVar141._28_4_ = auVar147._28_4_ + auVar186._28_4_ + auVar36._28_4_;
  auVar330._8_4_ = 0x7fffffff;
  auVar330._0_8_ = 0x7fffffff7fffffff;
  auVar330._12_4_ = 0x7fffffff;
  auVar330._16_4_ = 0x7fffffff;
  auVar330._20_4_ = 0x7fffffff;
  auVar330._24_4_ = 0x7fffffff;
  auVar330._28_4_ = 0x7fffffff;
  auVar346._8_4_ = 0x219392ef;
  auVar346._0_8_ = 0x219392ef219392ef;
  auVar346._12_4_ = 0x219392ef;
  auVar346._16_4_ = 0x219392ef;
  auVar346._20_4_ = 0x219392ef;
  auVar346._24_4_ = 0x219392ef;
  auVar346._28_4_ = 0x219392ef;
  auVar147 = vandps_avx(auVar410,auVar330);
  auVar147 = vcmpps_avx(auVar147,auVar346,1);
  auVar182 = vblendvps_avx(auVar410,auVar346,auVar147);
  auVar147 = vandps_avx(auVar393,auVar330);
  auVar147 = vcmpps_avx(auVar147,auVar346,1);
  auVar36 = vblendvps_avx(auVar393,auVar346,auVar147);
  auVar147 = vandps_avx(auVar281,auVar330);
  auVar147 = vcmpps_avx(auVar147,auVar346,1);
  auVar147 = vblendvps_avx(auVar281,auVar346,auVar147);
  auVar217._0_4_ = fVar205 * auVar352._0_4_ + fVar244 * auVar38._0_4_ + auVar39._0_4_ * fVar226;
  auVar217._4_4_ = fVar242 * auVar352._4_4_ + fVar245 * auVar38._4_4_ + auVar39._4_4_ * fVar200;
  auVar217._8_4_ = fVar127 * auVar352._8_4_ + fVar246 * auVar38._8_4_ + auVar39._8_4_ * fVar241;
  auVar217._12_4_ = fVar243 * auVar352._12_4_ + fVar263 * auVar38._12_4_ + auVar39._12_4_ * fVar204;
  auVar217._16_4_ = fVar205 * auVar352._16_4_ + fVar244 * auVar38._16_4_ + auVar39._16_4_ * fVar226;
  auVar217._20_4_ = fVar242 * auVar352._20_4_ + fVar245 * auVar38._20_4_ + auVar39._20_4_ * fVar200;
  auVar217._24_4_ = fVar127 * auVar352._24_4_ + fVar246 * auVar38._24_4_ + auVar39._24_4_ * fVar241;
  auVar217._28_4_ = fVar225 + auVar183._28_4_ + fVar204;
  auVar37 = vrcpps_avx(auVar182);
  fVar226 = auVar37._0_4_;
  fVar241 = auVar37._4_4_;
  auVar183._4_4_ = auVar182._4_4_ * fVar241;
  auVar183._0_4_ = auVar182._0_4_ * fVar226;
  fVar225 = auVar37._8_4_;
  auVar183._8_4_ = auVar182._8_4_ * fVar225;
  fVar242 = auVar37._12_4_;
  auVar183._12_4_ = auVar182._12_4_ * fVar242;
  fVar243 = auVar37._16_4_;
  auVar183._16_4_ = auVar182._16_4_ * fVar243;
  fVar244 = auVar37._20_4_;
  auVar183._20_4_ = auVar182._20_4_ * fVar244;
  fVar245 = auVar37._24_4_;
  auVar183._24_4_ = auVar182._24_4_ * fVar245;
  auVar183._28_4_ = auVar182._28_4_;
  auVar347._8_4_ = 0x3f800000;
  auVar347._0_8_ = &DAT_3f8000003f800000;
  auVar347._12_4_ = 0x3f800000;
  auVar347._16_4_ = 0x3f800000;
  auVar347._20_4_ = 0x3f800000;
  auVar347._24_4_ = 0x3f800000;
  auVar347._28_4_ = 0x3f800000;
  auVar186 = vsubps_avx(auVar347,auVar183);
  auVar183 = vrcpps_avx(auVar36);
  fVar226 = fVar226 + fVar226 * auVar186._0_4_;
  fVar241 = fVar241 + fVar241 * auVar186._4_4_;
  fVar225 = fVar225 + fVar225 * auVar186._8_4_;
  fVar242 = fVar242 + fVar242 * auVar186._12_4_;
  fVar243 = fVar243 + fVar243 * auVar186._16_4_;
  fVar244 = fVar244 + fVar244 * auVar186._20_4_;
  fVar245 = fVar245 + fVar245 * auVar186._24_4_;
  fVar246 = auVar183._0_4_;
  fVar263 = auVar183._4_4_;
  auVar182._4_4_ = fVar263 * auVar36._4_4_;
  auVar182._0_4_ = fVar246 * auVar36._0_4_;
  fVar265 = auVar183._8_4_;
  auVar182._8_4_ = fVar265 * auVar36._8_4_;
  fVar267 = auVar183._12_4_;
  auVar182._12_4_ = fVar267 * auVar36._12_4_;
  fVar269 = auVar183._16_4_;
  auVar182._16_4_ = fVar269 * auVar36._16_4_;
  fVar271 = auVar183._20_4_;
  auVar182._20_4_ = fVar271 * auVar36._20_4_;
  fVar273 = auVar183._24_4_;
  auVar182._24_4_ = fVar273 * auVar36._24_4_;
  auVar182._28_4_ = auVar36._28_4_;
  auVar36 = vsubps_avx(auVar347,auVar182);
  fVar246 = fVar246 + fVar246 * auVar36._0_4_;
  fVar263 = fVar263 + fVar263 * auVar36._4_4_;
  fVar265 = fVar265 + fVar265 * auVar36._8_4_;
  fVar267 = fVar267 + fVar267 * auVar36._12_4_;
  fVar269 = fVar269 + fVar269 * auVar36._16_4_;
  fVar271 = fVar271 + fVar271 * auVar36._20_4_;
  fVar273 = fVar273 + fVar273 * auVar36._24_4_;
  auVar182 = vrcpps_avx(auVar147);
  fVar275 = auVar182._0_4_;
  fVar293 = auVar182._4_4_;
  auVar352._4_4_ = fVar293 * auVar147._4_4_;
  auVar352._0_4_ = fVar275 * auVar147._0_4_;
  fVar294 = auVar182._8_4_;
  auVar352._8_4_ = fVar294 * auVar147._8_4_;
  fVar295 = auVar182._12_4_;
  auVar352._12_4_ = fVar295 * auVar147._12_4_;
  fVar296 = auVar182._16_4_;
  auVar352._16_4_ = fVar296 * auVar147._16_4_;
  fVar297 = auVar182._20_4_;
  auVar352._20_4_ = fVar297 * auVar147._20_4_;
  fVar298 = auVar182._24_4_;
  auVar352._24_4_ = fVar298 * auVar147._24_4_;
  auVar352._28_4_ = auVar147._28_4_;
  auVar147 = vsubps_avx(auVar347,auVar352);
  fVar275 = fVar275 + fVar275 * auVar147._0_4_;
  fVar293 = fVar293 + fVar293 * auVar147._4_4_;
  fVar294 = fVar294 + fVar294 * auVar147._8_4_;
  fVar295 = fVar295 + fVar295 * auVar147._12_4_;
  fVar296 = fVar296 + fVar296 * auVar147._16_4_;
  fVar297 = fVar297 + fVar297 * auVar147._20_4_;
  fVar298 = fVar298 + fVar298 * auVar147._24_4_;
  auVar170 = ZEXT416((uint)(((ray->super_RayK<1>).dir.field_0.m128[3] -
                            *(float *)(prim + lVar120 + 0x16)) * *(float *)(prim + lVar120 + 0x1a)))
  ;
  auVar137 = vshufps_avx(auVar170,auVar170,0);
  auVar170._8_8_ = 0;
  auVar170._0_8_ = *(ulong *)(prim + uVar124 * 7 + 6);
  auVar170 = vpmovsxwd_avx(auVar170);
  auVar132._8_8_ = 0;
  auVar132._0_8_ = *(ulong *)(prim + uVar124 * 7 + 0xe);
  auVar132 = vpmovsxwd_avx(auVar132);
  auVar331._16_16_ = auVar132;
  auVar331._0_16_ = auVar170;
  auVar147 = vcvtdq2ps_avx(auVar331);
  auVar161._8_8_ = 0;
  auVar161._0_8_ = *(ulong *)(prim + uVar124 * 0xb + 6);
  auVar170 = vpmovsxwd_avx(auVar161);
  auVar131._8_8_ = 0;
  auVar131._0_8_ = *(ulong *)(prim + uVar124 * 0xb + 0xe);
  auVar132 = vpmovsxwd_avx(auVar131);
  auVar348._16_16_ = auVar132;
  auVar348._0_16_ = auVar170;
  auVar182 = vcvtdq2ps_avx(auVar348);
  auVar182 = vsubps_avx(auVar182,auVar147);
  fVar200 = auVar137._0_4_;
  fVar204 = auVar137._4_4_;
  fVar205 = auVar137._8_4_;
  fVar127 = auVar137._12_4_;
  auVar137._8_8_ = 0;
  auVar137._0_8_ = *(ulong *)(prim + uVar124 * 9 + 6);
  auVar170 = vpmovsxwd_avx(auVar137);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + uVar124 * 9 + 0xe);
  auVar132 = vpmovsxwd_avx(auVar13);
  auVar332._0_4_ = auVar182._0_4_ * fVar200 + auVar147._0_4_;
  auVar332._4_4_ = auVar182._4_4_ * fVar204 + auVar147._4_4_;
  auVar332._8_4_ = auVar182._8_4_ * fVar205 + auVar147._8_4_;
  auVar332._12_4_ = auVar182._12_4_ * fVar127 + auVar147._12_4_;
  auVar332._16_4_ = auVar182._16_4_ * fVar200 + auVar147._16_4_;
  auVar332._20_4_ = auVar182._20_4_ * fVar204 + auVar147._20_4_;
  auVar332._24_4_ = auVar182._24_4_ * fVar205 + auVar147._24_4_;
  auVar332._28_4_ = auVar182._28_4_ + auVar147._28_4_;
  auVar349._16_16_ = auVar132;
  auVar349._0_16_ = auVar170;
  auVar147 = vcvtdq2ps_avx(auVar349);
  auVar175._8_8_ = 0;
  auVar175._0_8_ = *(ulong *)(prim + uVar124 * 0xd + 6);
  auVar170 = vpmovsxwd_avx(auVar175);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + uVar124 * 0xd + 0xe);
  auVar132 = vpmovsxwd_avx(auVar14);
  auVar373._16_16_ = auVar132;
  auVar373._0_16_ = auVar170;
  auVar182 = vcvtdq2ps_avx(auVar373);
  auVar182 = vsubps_avx(auVar182,auVar147);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar124 * 0x12 + 6);
  auVar170 = vpmovsxwd_avx(auVar15);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar124 * 0x12 + 0xe);
  auVar132 = vpmovsxwd_avx(auVar16);
  auVar350._0_4_ = auVar147._0_4_ + auVar182._0_4_ * fVar200;
  auVar350._4_4_ = auVar147._4_4_ + auVar182._4_4_ * fVar204;
  auVar350._8_4_ = auVar147._8_4_ + auVar182._8_4_ * fVar205;
  auVar350._12_4_ = auVar147._12_4_ + auVar182._12_4_ * fVar127;
  auVar350._16_4_ = auVar147._16_4_ + auVar182._16_4_ * fVar200;
  auVar350._20_4_ = auVar147._20_4_ + auVar182._20_4_ * fVar204;
  auVar350._24_4_ = auVar147._24_4_ + auVar182._24_4_ * fVar205;
  auVar350._28_4_ = auVar147._28_4_ + auVar182._28_4_;
  auVar374._16_16_ = auVar132;
  auVar374._0_16_ = auVar170;
  auVar147 = vcvtdq2ps_avx(auVar374);
  uVar118 = (ulong)(uint)((int)lVar34 << 2);
  lVar120 = uVar124 * 2 + uVar118;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + lVar120 + 6);
  auVar170 = vpmovsxwd_avx(auVar17);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + lVar120 + 0xe);
  auVar132 = vpmovsxwd_avx(auVar18);
  auVar383._16_16_ = auVar132;
  auVar383._0_16_ = auVar170;
  auVar182 = vcvtdq2ps_avx(auVar383);
  auVar182 = vsubps_avx(auVar182,auVar147);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + uVar118 + 6);
  auVar170 = vpmovsxwd_avx(auVar19);
  auVar375._0_4_ = auVar147._0_4_ + auVar182._0_4_ * fVar200;
  auVar375._4_4_ = auVar147._4_4_ + auVar182._4_4_ * fVar204;
  auVar375._8_4_ = auVar147._8_4_ + auVar182._8_4_ * fVar205;
  auVar375._12_4_ = auVar147._12_4_ + auVar182._12_4_ * fVar127;
  auVar375._16_4_ = auVar147._16_4_ + auVar182._16_4_ * fVar200;
  auVar375._20_4_ = auVar147._20_4_ + auVar182._20_4_ * fVar204;
  auVar375._24_4_ = auVar147._24_4_ + auVar182._24_4_ * fVar205;
  auVar375._28_4_ = auVar147._28_4_ + auVar182._28_4_;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + uVar118 + 0xe);
  auVar132 = vpmovsxwd_avx(auVar20);
  auVar384._16_16_ = auVar132;
  auVar384._0_16_ = auVar170;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)(prim + uVar124 * 0x18 + 6);
  auVar170 = vpmovsxwd_avx(auVar21);
  auVar22._8_8_ = 0;
  auVar22._0_8_ = *(ulong *)(prim + uVar124 * 0x18 + 0xe);
  auVar132 = vpmovsxwd_avx(auVar22);
  auVar147 = vcvtdq2ps_avx(auVar384);
  auVar394._16_16_ = auVar132;
  auVar394._0_16_ = auVar170;
  auVar182 = vcvtdq2ps_avx(auVar394);
  auVar182 = vsubps_avx(auVar182,auVar147);
  auVar23._8_8_ = 0;
  auVar23._0_8_ = *(ulong *)(prim + uVar124 * 0x1d + 6);
  auVar170 = vpmovsxwd_avx(auVar23);
  auVar385._0_4_ = auVar147._0_4_ + auVar182._0_4_ * fVar200;
  auVar385._4_4_ = auVar147._4_4_ + auVar182._4_4_ * fVar204;
  auVar385._8_4_ = auVar147._8_4_ + auVar182._8_4_ * fVar205;
  auVar385._12_4_ = auVar147._12_4_ + auVar182._12_4_ * fVar127;
  auVar385._16_4_ = auVar147._16_4_ + auVar182._16_4_ * fVar200;
  auVar385._20_4_ = auVar147._20_4_ + auVar182._20_4_ * fVar204;
  auVar385._24_4_ = auVar147._24_4_ + auVar182._24_4_ * fVar205;
  auVar385._28_4_ = auVar147._28_4_ + auVar182._28_4_;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = *(ulong *)(prim + uVar124 * 0x1d + 0xe);
  auVar132 = vpmovsxwd_avx(auVar24);
  lVar120 = uVar124 + (ulong)(byte)PVar31 * 0x20;
  auVar25._8_8_ = 0;
  auVar25._0_8_ = *(ulong *)(prim + lVar120 + 6);
  auVar161 = vpmovsxwd_avx(auVar25);
  auVar395._16_16_ = auVar132;
  auVar395._0_16_ = auVar170;
  auVar26._8_8_ = 0;
  auVar26._0_8_ = *(ulong *)(prim + lVar120 + 0xe);
  auVar170 = vpmovsxwd_avx(auVar26);
  auVar411._16_16_ = auVar170;
  auVar411._0_16_ = auVar161;
  auVar147 = vcvtdq2ps_avx(auVar395);
  auVar182 = vcvtdq2ps_avx(auVar411);
  auVar182 = vsubps_avx(auVar182,auVar147);
  auVar396._0_4_ = auVar147._0_4_ + auVar182._0_4_ * fVar200;
  auVar396._4_4_ = auVar147._4_4_ + auVar182._4_4_ * fVar204;
  auVar396._8_4_ = auVar147._8_4_ + auVar182._8_4_ * fVar205;
  auVar396._12_4_ = auVar147._12_4_ + auVar182._12_4_ * fVar127;
  auVar396._16_4_ = auVar147._16_4_ + auVar182._16_4_ * fVar200;
  auVar396._20_4_ = auVar147._20_4_ + auVar182._20_4_ * fVar204;
  auVar396._24_4_ = auVar147._24_4_ + auVar182._24_4_ * fVar205;
  auVar396._28_4_ = auVar147._28_4_ + auVar182._28_4_;
  lVar120 = (ulong)(byte)PVar31 * 0x20 - uVar124;
  auVar27._8_8_ = 0;
  auVar27._0_8_ = *(ulong *)(prim + lVar120 + 6);
  auVar170 = vpmovsxwd_avx(auVar27);
  auVar28._8_8_ = 0;
  auVar28._0_8_ = *(ulong *)(prim + lVar120 + 0xe);
  auVar132 = vpmovsxwd_avx(auVar28);
  auVar412._16_16_ = auVar132;
  auVar412._0_16_ = auVar170;
  auVar29._8_8_ = 0;
  auVar29._0_8_ = *(ulong *)(prim + uVar124 * 0x23 + 6);
  auVar170 = vpmovsxwd_avx(auVar29);
  local_790 = prim;
  auVar30._8_8_ = 0;
  auVar30._0_8_ = *(ulong *)(prim + uVar124 * 0x23 + 0xe);
  auVar132 = vpmovsxwd_avx(auVar30);
  auVar426._16_16_ = auVar132;
  auVar426._0_16_ = auVar170;
  auVar147 = vcvtdq2ps_avx(auVar412);
  auVar182 = vcvtdq2ps_avx(auVar426);
  auVar182 = vsubps_avx(auVar182,auVar147);
  auVar413._0_4_ = auVar147._0_4_ + auVar182._0_4_ * fVar200;
  auVar413._4_4_ = auVar147._4_4_ + auVar182._4_4_ * fVar204;
  auVar413._8_4_ = auVar147._8_4_ + auVar182._8_4_ * fVar205;
  auVar413._12_4_ = auVar147._12_4_ + auVar182._12_4_ * fVar127;
  auVar413._16_4_ = auVar147._16_4_ + auVar182._16_4_ * fVar200;
  auVar413._20_4_ = auVar147._20_4_ + auVar182._20_4_ * fVar204;
  auVar413._24_4_ = auVar147._24_4_ + auVar182._24_4_ * fVar205;
  auVar413._28_4_ = auVar147._28_4_ + fVar127;
  auVar147 = vsubps_avx(auVar332,auVar178);
  auVar301._0_4_ = fVar226 * auVar147._0_4_;
  auVar301._4_4_ = fVar241 * auVar147._4_4_;
  auVar301._8_4_ = fVar225 * auVar147._8_4_;
  auVar301._12_4_ = fVar242 * auVar147._12_4_;
  auVar38._16_4_ = fVar243 * auVar147._16_4_;
  auVar38._0_16_ = auVar301;
  auVar38._20_4_ = fVar244 * auVar147._20_4_;
  auVar38._24_4_ = fVar245 * auVar147._24_4_;
  auVar38._28_4_ = auVar147._28_4_;
  auVar147 = vsubps_avx(auVar350,auVar178);
  auVar227._0_4_ = fVar226 * auVar147._0_4_;
  auVar227._4_4_ = fVar241 * auVar147._4_4_;
  auVar227._8_4_ = fVar225 * auVar147._8_4_;
  auVar227._12_4_ = fVar242 * auVar147._12_4_;
  auVar39._16_4_ = fVar243 * auVar147._16_4_;
  auVar39._0_16_ = auVar227;
  auVar39._20_4_ = fVar244 * auVar147._20_4_;
  auVar39._24_4_ = fVar245 * auVar147._24_4_;
  auVar39._28_4_ = auVar37._28_4_ + auVar186._28_4_;
  auVar147 = vsubps_avx(auVar375,auVar141);
  auVar166._0_4_ = fVar246 * auVar147._0_4_;
  auVar166._4_4_ = fVar263 * auVar147._4_4_;
  auVar166._8_4_ = fVar265 * auVar147._8_4_;
  auVar166._12_4_ = fVar267 * auVar147._12_4_;
  auVar37._16_4_ = fVar269 * auVar147._16_4_;
  auVar37._0_16_ = auVar166;
  auVar37._20_4_ = fVar271 * auVar147._20_4_;
  auVar37._24_4_ = fVar273 * auVar147._24_4_;
  auVar37._28_4_ = auVar147._28_4_;
  auVar147 = vsubps_avx(auVar385,auVar141);
  auVar248._0_4_ = fVar246 * auVar147._0_4_;
  auVar248._4_4_ = fVar263 * auVar147._4_4_;
  auVar248._8_4_ = fVar265 * auVar147._8_4_;
  auVar248._12_4_ = fVar267 * auVar147._12_4_;
  auVar186._16_4_ = fVar269 * auVar147._16_4_;
  auVar186._0_16_ = auVar248;
  auVar186._20_4_ = fVar271 * auVar147._20_4_;
  auVar186._24_4_ = fVar273 * auVar147._24_4_;
  auVar186._28_4_ = auVar183._28_4_ + auVar36._28_4_;
  auVar147 = vsubps_avx(auVar396,auVar217);
  auVar128._0_4_ = fVar275 * auVar147._0_4_;
  auVar128._4_4_ = fVar293 * auVar147._4_4_;
  auVar128._8_4_ = fVar294 * auVar147._8_4_;
  auVar128._12_4_ = fVar295 * auVar147._12_4_;
  auVar36._16_4_ = fVar296 * auVar147._16_4_;
  auVar36._0_16_ = auVar128;
  auVar36._20_4_ = fVar297 * auVar147._20_4_;
  auVar36._24_4_ = fVar298 * auVar147._24_4_;
  auVar36._28_4_ = auVar147._28_4_;
  auVar147 = vsubps_avx(auVar413,auVar217);
  auVar206._0_4_ = fVar275 * auVar147._0_4_;
  auVar206._4_4_ = fVar293 * auVar147._4_4_;
  auVar206._8_4_ = fVar294 * auVar147._8_4_;
  auVar206._12_4_ = fVar295 * auVar147._12_4_;
  auVar48._16_4_ = fVar296 * auVar147._16_4_;
  auVar48._0_16_ = auVar206;
  auVar48._20_4_ = fVar297 * auVar147._20_4_;
  auVar48._24_4_ = fVar298 * auVar147._24_4_;
  auVar48._28_4_ = auVar147._28_4_;
  auVar170 = vpminsd_avx(auVar38._16_16_,auVar39._16_16_);
  auVar132 = vpminsd_avx(auVar301,auVar227);
  auVar351._16_16_ = auVar170;
  auVar351._0_16_ = auVar132;
  auVar131 = auVar37._16_16_;
  auVar389 = ZEXT1664(auVar131);
  auVar170 = vpminsd_avx(auVar131,auVar186._16_16_);
  auVar132 = vpminsd_avx(auVar166,auVar248);
  auVar397._16_16_ = auVar170;
  auVar397._0_16_ = auVar132;
  auVar147 = vmaxps_avx(auVar351,auVar397);
  auVar137 = auVar48._16_16_;
  auVar400 = ZEXT1664(auVar137);
  auVar161 = auVar36._16_16_;
  auVar415 = ZEXT1664(auVar161);
  auVar170 = vpminsd_avx(auVar161,auVar137);
  auVar132 = vpminsd_avx(auVar128,auVar206);
  auVar427._16_16_ = auVar170;
  auVar427._0_16_ = auVar132;
  uVar8 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar441._4_4_ = uVar8;
  auVar441._0_4_ = uVar8;
  auVar441._8_4_ = uVar8;
  auVar441._12_4_ = uVar8;
  auVar441._16_4_ = uVar8;
  auVar441._20_4_ = uVar8;
  auVar441._24_4_ = uVar8;
  auVar441._28_4_ = uVar8;
  auVar182 = vmaxps_avx(auVar427,auVar441);
  auVar147 = vmaxps_avx(auVar147,auVar182);
  local_2a0._4_4_ = auVar147._4_4_ * 0.99999964;
  local_2a0._0_4_ = auVar147._0_4_ * 0.99999964;
  local_2a0._8_4_ = auVar147._8_4_ * 0.99999964;
  local_2a0._12_4_ = auVar147._12_4_ * 0.99999964;
  local_2a0._16_4_ = auVar147._16_4_ * 0.99999964;
  local_2a0._20_4_ = auVar147._20_4_ * 0.99999964;
  local_2a0._24_4_ = auVar147._24_4_ * 0.99999964;
  local_2a0._28_4_ = auVar147._28_4_;
  auVar170 = vpmaxsd_avx(auVar38._16_16_,auVar39._16_16_);
  auVar132 = vpmaxsd_avx(auVar301,auVar227);
  auVar236._16_16_ = auVar170;
  auVar236._0_16_ = auVar132;
  auVar170 = vpmaxsd_avx(auVar131,auVar186._16_16_);
  auVar132 = vpmaxsd_avx(auVar166,auVar248);
  auVar179._16_16_ = auVar170;
  auVar179._0_16_ = auVar132;
  auVar147 = vminps_avx(auVar236,auVar179);
  auVar170 = vpmaxsd_avx(auVar161,auVar137);
  auVar132 = vpmaxsd_avx(auVar128,auVar206);
  fVar226 = (ray->super_RayK<1>).tfar;
  auVar218._4_4_ = fVar226;
  auVar218._0_4_ = fVar226;
  auVar218._8_4_ = fVar226;
  auVar218._12_4_ = fVar226;
  auVar218._16_4_ = fVar226;
  auVar218._20_4_ = fVar226;
  auVar218._24_4_ = fVar226;
  auVar218._28_4_ = fVar226;
  auVar142._16_16_ = auVar170;
  auVar142._0_16_ = auVar132;
  auVar182 = vminps_avx(auVar142,auVar218);
  auVar147 = vminps_avx(auVar147,auVar182);
  auVar49._4_4_ = auVar147._4_4_ * 1.0000004;
  auVar49._0_4_ = auVar147._0_4_ * 1.0000004;
  auVar49._8_4_ = auVar147._8_4_ * 1.0000004;
  auVar49._12_4_ = auVar147._12_4_ * 1.0000004;
  auVar49._16_4_ = auVar147._16_4_ * 1.0000004;
  auVar49._20_4_ = auVar147._20_4_ * 1.0000004;
  auVar49._24_4_ = auVar147._24_4_ * 1.0000004;
  auVar49._28_4_ = auVar147._28_4_;
  auVar147 = vcmpps_avx(local_2a0,auVar49,2);
  auVar170 = vpshufd_avx(ZEXT116((byte)PVar31),0);
  auVar180._16_16_ = auVar170;
  auVar180._0_16_ = auVar170;
  auVar182 = vcvtdq2ps_avx(auVar180);
  auVar182 = vcmpps_avx(_DAT_02020f40,auVar182,1);
  auVar147 = vandps_avx(auVar147,auVar182);
  uVar117 = vmovmskps_avx(auVar147);
  if (uVar117 == 0) {
    return;
  }
  uVar117 = uVar117 & 0xff;
  auVar143._16_16_ = mm_lookupmask_ps._240_16_;
  auVar143._0_16_ = mm_lookupmask_ps._240_16_;
  local_280 = vblendps_avx(auVar143,ZEXT832(0) << 0x20,0x80);
  auVar335 = ZEXT1664((undefined1  [16])0x0);
LAB_01212281:
  local_788 = (ulong)uVar117;
  lVar120 = 0;
  if ((ulong)uVar117 != 0) {
    for (; (uVar117 >> lVar120 & 1) == 0; lVar120 = lVar120 + 1) {
    }
  }
  local_ae8 = (ulong)*(uint *)(local_790 + 2);
  pGVar32 = (context->scene->geometries).items[*(uint *)(local_790 + 2)].ptr;
  local_a88 = (ulong)*(uint *)(local_790 + lVar120 * 4 + 6);
  uVar124 = (ulong)*(uint *)(*(long *)&pGVar32->field_0x58 +
                            (ulong)*(uint *)(local_790 + lVar120 * 4 + 6) *
                            pGVar32[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                            _M_i);
  fVar226 = (pGVar32->time_range).lower;
  fVar226 = pGVar32->fnumTimeSegments *
            (((ray->super_RayK<1>).dir.field_0.m128[3] - fVar226) /
            ((pGVar32->time_range).upper - fVar226));
  auVar170 = vroundss_avx(ZEXT416((uint)fVar226),ZEXT416((uint)fVar226),9);
  auVar170 = vminss_avx(auVar170,ZEXT416((uint)(pGVar32->fnumTimeSegments + -1.0)));
  auVar170 = vmaxss_avx(auVar335._0_16_,auVar170);
  fVar226 = fVar226 - auVar170._0_4_;
  _Var33 = pGVar32[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar121 = (long)(int)auVar170._0_4_ * 0x38;
  lVar120 = *(long *)(_Var33 + 0x10 + lVar121);
  lVar34 = *(long *)(_Var33 + 0x38 + lVar121);
  lVar123 = *(long *)(_Var33 + 0x48 + lVar121);
  auVar170 = vshufps_avx(ZEXT416((uint)fVar226),ZEXT416((uint)fVar226),0);
  pfVar1 = (float *)(lVar34 + uVar124 * lVar123);
  fVar225 = auVar170._0_4_;
  fVar205 = auVar170._4_4_;
  fVar242 = auVar170._8_4_;
  fVar127 = auVar170._12_4_;
  pfVar2 = (float *)(lVar34 + (uVar124 + 1) * lVar123);
  pfVar3 = (float *)(lVar34 + (uVar124 + 2) * lVar123);
  pfVar4 = (float *)(lVar34 + lVar123 * (uVar124 + 3));
  lVar34 = *(long *)(_Var33 + lVar121);
  auVar170 = vshufps_avx(ZEXT416((uint)(1.0 - fVar226)),ZEXT416((uint)(1.0 - fVar226)),0);
  pfVar5 = (float *)(lVar34 + lVar120 * uVar124);
  fVar226 = auVar170._0_4_;
  fVar200 = auVar170._4_4_;
  fVar241 = auVar170._8_4_;
  fVar204 = auVar170._12_4_;
  pfVar6 = (float *)(lVar34 + lVar120 * (uVar124 + 1));
  pfVar7 = (float *)(lVar34 + lVar120 * (uVar124 + 2));
  auVar207._0_4_ = fVar225 * *pfVar1 + fVar226 * *pfVar5;
  auVar207._4_4_ = fVar205 * pfVar1[1] + fVar200 * pfVar5[1];
  auVar207._8_4_ = fVar242 * pfVar1[2] + fVar241 * pfVar5[2];
  auVar207._12_4_ = fVar127 * pfVar1[3] + fVar204 * pfVar5[3];
  auVar228._0_4_ = fVar226 * *pfVar6 + fVar225 * *pfVar2;
  auVar228._4_4_ = fVar200 * pfVar6[1] + fVar205 * pfVar2[1];
  auVar228._8_4_ = fVar241 * pfVar6[2] + fVar242 * pfVar2[2];
  auVar228._12_4_ = fVar204 * pfVar6[3] + fVar127 * pfVar2[3];
  auVar249._0_4_ = fVar226 * *pfVar7 + fVar225 * *pfVar3;
  auVar249._4_4_ = fVar200 * pfVar7[1] + fVar205 * pfVar3[1];
  auVar249._8_4_ = fVar241 * pfVar7[2] + fVar242 * pfVar3[2];
  auVar249._12_4_ = fVar204 * pfVar7[3] + fVar127 * pfVar3[3];
  pfVar1 = (float *)(lVar34 + lVar120 * (uVar124 + 3));
  auVar277._0_4_ = fVar226 * *pfVar1 + fVar225 * *pfVar4;
  auVar277._4_4_ = fVar200 * pfVar1[1] + fVar205 * pfVar4[1];
  auVar277._8_4_ = fVar241 * pfVar1[2] + fVar242 * pfVar4[2];
  auVar277._12_4_ = fVar204 * pfVar1[3] + fVar127 * pfVar4[3];
  auVar129._0_4_ = (auVar207._0_4_ + auVar228._0_4_ + auVar249._0_4_ + auVar277._0_4_) * 0.25;
  auVar129._4_4_ = (auVar207._4_4_ + auVar228._4_4_ + auVar249._4_4_ + auVar277._4_4_) * 0.25;
  auVar129._8_4_ = (auVar207._8_4_ + auVar228._8_4_ + auVar249._8_4_ + auVar277._8_4_) * 0.25;
  auVar129._12_4_ = (auVar207._12_4_ + auVar228._12_4_ + auVar249._12_4_ + auVar277._12_4_) * 0.25;
  aVar10 = (ray->super_RayK<1>).org.field_0.field_1;
  aVar11 = (ray->super_RayK<1>).dir.field_0.field_1;
  auVar170 = vsubps_avx(auVar129,(undefined1  [16])aVar10);
  auVar170 = vdpps_avx(auVar170,(undefined1  [16])aVar11,0x7f);
  auVar132 = vdpps_avx((undefined1  [16])aVar11,(undefined1  [16])aVar11,0x7f);
  auVar161 = vrcpss_avx(auVar132,auVar132);
  auVar377 = ZEXT464(0x40000000);
  fVar226 = auVar170._0_4_ * auVar161._0_4_ * (2.0 - auVar161._0_4_ * auVar132._0_4_);
  local_7a0 = ZEXT416((uint)fVar226);
  auVar132 = vshufps_avx(ZEXT416((uint)fVar226),ZEXT416((uint)fVar226),0);
  fVar226 = aVar11.x;
  fVar200 = aVar11.y;
  fVar241 = aVar11.z;
  aVar202 = aVar11.field_3;
  auVar302._0_4_ = aVar10.x + fVar226 * auVar132._0_4_;
  auVar302._4_4_ = aVar10.y + fVar200 * auVar132._4_4_;
  auVar302._8_4_ = aVar10.z + fVar241 * auVar132._8_4_;
  auVar302._12_4_ = aVar10.field_3.w + aVar202.w * auVar132._12_4_;
  auVar170 = vblendps_avx(auVar302,_DAT_01feba10,8);
  _local_9b0 = vsubps_avx(auVar207,auVar170);
  auVar335 = ZEXT1664(_local_9b0);
  _local_9c0 = vsubps_avx(auVar249,auVar170);
  _local_9d0 = vsubps_avx(auVar228,auVar170);
  _local_9e0 = vsubps_avx(auVar277,auVar170);
  auVar170 = vshufps_avx(_local_9b0,_local_9b0,0);
  register0x00001290 = auVar170;
  _local_1a0 = auVar170;
  auVar170 = vshufps_avx(_local_9b0,_local_9b0,0x55);
  register0x00001290 = auVar170;
  _local_1c0 = auVar170;
  auVar170 = vshufps_avx(_local_9b0,_local_9b0,0xaa);
  register0x00001290 = auVar170;
  _local_1e0 = auVar170;
  auVar170 = vshufps_avx(_local_9b0,_local_9b0,0xff);
  register0x00001290 = auVar170;
  _local_2c0 = auVar170;
  auVar170 = vshufps_avx(_local_9d0,_local_9d0,0);
  register0x00001290 = auVar170;
  _local_200 = auVar170;
  auVar170 = vshufps_avx(_local_9d0,_local_9d0,0x55);
  register0x00001290 = auVar170;
  _local_220 = auVar170;
  auVar170 = vshufps_avx(_local_9d0,_local_9d0,0xaa);
  register0x00001290 = auVar170;
  _local_240 = auVar170;
  auVar167._0_4_ = fVar226 * fVar226;
  auVar167._4_4_ = fVar200 * fVar200;
  auVar167._8_4_ = fVar241 * fVar241;
  auVar167._12_4_ = aVar202.w * aVar202.w;
  auVar170 = vshufps_avx(auVar167,auVar167,0xaa);
  auVar161 = vshufps_avx(auVar167,auVar167,0x55);
  auVar131 = vshufps_avx(_local_9d0,_local_9d0,0xff);
  register0x000012d0 = auVar131;
  _local_2e0 = auVar131;
  auVar131 = vshufps_avx(auVar167,auVar167,0);
  local_260._0_4_ = auVar131._0_4_ + auVar161._0_4_ + auVar170._0_4_;
  local_260._4_4_ = auVar131._4_4_ + auVar161._4_4_ + auVar170._4_4_;
  local_260._8_4_ = auVar131._8_4_ + auVar161._8_4_ + auVar170._8_4_;
  local_260._12_4_ = auVar131._12_4_ + auVar161._12_4_ + auVar170._12_4_;
  local_260._16_4_ = auVar131._0_4_ + auVar161._0_4_ + auVar170._0_4_;
  local_260._20_4_ = auVar131._4_4_ + auVar161._4_4_ + auVar170._4_4_;
  local_260._24_4_ = auVar131._8_4_ + auVar161._8_4_ + auVar170._8_4_;
  local_260._28_4_ = auVar131._12_4_ + auVar161._12_4_ + auVar170._12_4_;
  auVar170 = vshufps_avx(_local_9c0,_local_9c0,0);
  register0x00001250 = auVar170;
  _local_300 = auVar170;
  auVar170 = vshufps_avx(_local_9c0,_local_9c0,0x55);
  register0x00001250 = auVar170;
  _local_320 = auVar170;
  auVar170 = vshufps_avx(_local_9c0,_local_9c0,0xaa);
  register0x00001250 = auVar170;
  _local_340 = auVar170;
  auVar170 = vshufps_avx(_local_9c0,_local_9c0,0xff);
  register0x00001250 = auVar170;
  _local_360 = auVar170;
  auVar170 = vshufps_avx(_local_9e0,_local_9e0,0);
  register0x00001250 = auVar170;
  _local_380 = auVar170;
  auVar170 = vshufps_avx(_local_9e0,_local_9e0,0x55);
  register0x00001250 = auVar170;
  _local_3a0 = auVar170;
  auVar170 = vshufps_avx(_local_9e0,_local_9e0,0xaa);
  register0x00001250 = auVar170;
  _local_3c0 = auVar170;
  auVar170 = vshufps_avx(_local_9e0,_local_9e0,0xff);
  register0x00001250 = auVar170;
  _local_3e0 = auVar170;
  local_820._16_16_ = auVar132;
  local_820._0_16_ = auVar132;
  auVar310 = ZEXT3264(local_820);
  uVar124 = 1;
  uVar118 = 0;
  local_520 = (ray->super_RayK<1>).dir.field_0.m128[0];
  fStack_51c = local_520;
  fStack_518 = local_520;
  fStack_514 = local_520;
  fStack_510 = local_520;
  fStack_50c = local_520;
  fStack_508 = local_520;
  fStack_504 = local_520;
  local_540 = (ray->super_RayK<1>).dir.field_0.m128[1];
  fStack_53c = local_540;
  fStack_538 = local_540;
  fStack_534 = local_540;
  fStack_530 = local_540;
  fStack_52c = local_540;
  fStack_528 = local_540;
  fStack_524 = local_540;
  local_620 = (ray->super_RayK<1>).dir.field_0.m128[2];
  fStack_61c = local_620;
  fStack_618 = local_620;
  fStack_614 = local_620;
  fStack_610 = local_620;
  fStack_60c = local_620;
  fStack_608 = local_620;
  fStack_604 = local_620;
  auVar144._8_4_ = 0x7fffffff;
  auVar144._0_8_ = 0x7fffffff7fffffff;
  auVar144._12_4_ = 0x7fffffff;
  auVar144._16_4_ = 0x7fffffff;
  auVar144._20_4_ = 0x7fffffff;
  auVar144._24_4_ = 0x7fffffff;
  auVar144._28_4_ = 0x7fffffff;
  local_400 = vandps_avx(local_260,auVar144);
  local_7b0 = 0x3f80000000000000;
  uStack_7a8 = 0;
  auVar292 = ZEXT3264(CONCAT428(0x3f800000,
                                CONCAT424(0x3f800000,
                                          CONCAT420(0x3f800000,
                                                    CONCAT416(0x3f800000,
                                                              CONCAT412(0x3f800000,
                                                                        CONCAT48(0x3f800000,
                                                                                 &
                                                  DAT_3f8000003f800000)))))));
  do {
    auVar113._8_8_ = uStack_7a8;
    auVar113._0_8_ = local_7b0;
    auVar170 = vmovshdup_avx(auVar113);
    fVar127 = auVar170._0_4_ - (float)local_7b0;
    auVar170 = vshufps_avx(auVar113,auVar113,0);
    register0x00001210 = auVar170;
    _local_840 = auVar170;
    auVar132 = vshufps_avx(ZEXT416((uint)fVar127),ZEXT416((uint)fVar127),0);
    local_860._16_16_ = auVar132;
    local_860._0_16_ = auVar132;
    fVar164 = auVar132._0_4_;
    fVar199 = auVar132._4_4_;
    fVar201 = auVar132._8_4_;
    fVar203 = auVar132._12_4_;
    fVar126 = auVar170._0_4_;
    auVar237._0_4_ = fVar126 + fVar164 * 0.0;
    fVar154 = auVar170._4_4_;
    auVar237._4_4_ = fVar154 + fVar199 * 0.14285715;
    fVar156 = auVar170._8_4_;
    auVar237._8_4_ = fVar156 + fVar201 * 0.2857143;
    fVar158 = auVar170._12_4_;
    auVar237._12_4_ = fVar158 + fVar203 * 0.42857146;
    auVar237._16_4_ = fVar126 + fVar164 * 0.5714286;
    auVar237._20_4_ = fVar154 + fVar199 * 0.71428573;
    auVar237._24_4_ = fVar156 + fVar201 * 0.8571429;
    auVar237._28_4_ = fVar158 + fVar203;
    auVar147 = vsubps_avx(auVar292._0_32_,auVar237);
    fVar226 = auVar147._0_4_;
    fVar200 = auVar147._4_4_;
    fVar241 = auVar147._8_4_;
    fVar204 = auVar147._12_4_;
    fVar225 = auVar147._16_4_;
    fVar205 = auVar147._20_4_;
    fVar242 = auVar147._24_4_;
    fVar244 = fVar226 * fVar226 * fVar226;
    fVar273 = fVar200 * fVar200 * fVar200;
    fVar293 = fVar241 * fVar241 * fVar241;
    fVar295 = fVar204 * fVar204 * fVar204;
    fVar297 = fVar225 * fVar225 * fVar225;
    fVar318 = fVar205 * fVar205 * fVar205;
    fVar322 = fVar242 * fVar242 * fVar242;
    fVar327 = auVar237._0_4_ * auVar237._0_4_ * auVar237._0_4_;
    fVar336 = auVar237._4_4_ * auVar237._4_4_ * auVar237._4_4_;
    fVar337 = auVar237._8_4_ * auVar237._8_4_ * auVar237._8_4_;
    fVar338 = auVar237._12_4_ * auVar237._12_4_ * auVar237._12_4_;
    fVar339 = auVar237._16_4_ * auVar237._16_4_ * auVar237._16_4_;
    fVar340 = auVar237._20_4_ * auVar237._20_4_ * auVar237._20_4_;
    fVar341 = auVar237._24_4_ * auVar237._24_4_ * auVar237._24_4_;
    fVar243 = auVar237._0_4_ * fVar226;
    fVar245 = auVar237._4_4_ * fVar200;
    fVar246 = auVar237._8_4_ * fVar241;
    fVar263 = auVar237._12_4_ * fVar204;
    fVar265 = auVar237._16_4_ * fVar225;
    fVar267 = auVar237._20_4_ * fVar205;
    fVar271 = auVar237._24_4_ * fVar242;
    fVar269 = auVar389._28_4_ + auVar415._28_4_;
    fVar368 = auVar335._28_4_ + auVar292._28_4_ + fVar269;
    fVar379 = fVar269 + auVar310._28_4_ + auVar400._28_4_ + auVar377._28_4_;
    fVar269 = fVar244 * 0.16666667;
    fVar275 = fVar273 * 0.16666667;
    fVar294 = fVar293 * 0.16666667;
    fVar296 = fVar295 * 0.16666667;
    fVar298 = fVar297 * 0.16666667;
    fVar319 = fVar318 * 0.16666667;
    fVar323 = fVar322 * 0.16666667;
    fVar342 = (fVar327 + fVar244 * 4.0 + fVar226 * fVar243 * 12.0 + auVar237._0_4_ * fVar243 * 6.0)
              * 0.16666667;
    fVar356 = (fVar336 + fVar273 * 4.0 + fVar200 * fVar245 * 12.0 + auVar237._4_4_ * fVar245 * 6.0)
              * 0.16666667;
    fVar358 = (fVar337 + fVar293 * 4.0 + fVar241 * fVar246 * 12.0 + auVar237._8_4_ * fVar246 * 6.0)
              * 0.16666667;
    fVar360 = (fVar338 + fVar295 * 4.0 + fVar204 * fVar263 * 12.0 + auVar237._12_4_ * fVar263 * 6.0)
              * 0.16666667;
    fVar362 = (fVar339 + fVar297 * 4.0 + fVar225 * fVar265 * 12.0 + auVar237._16_4_ * fVar265 * 6.0)
              * 0.16666667;
    fVar364 = (fVar340 + fVar318 * 4.0 + fVar205 * fVar267 * 12.0 + auVar237._20_4_ * fVar267 * 6.0)
              * 0.16666667;
    fVar366 = (fVar341 + fVar322 * 4.0 + fVar242 * fVar271 * 12.0 + auVar237._24_4_ * fVar271 * 6.0)
              * 0.16666667;
    fVar244 = (fVar327 * 4.0 + fVar244 + auVar237._0_4_ * fVar243 * 12.0 + fVar226 * fVar243 * 6.0)
              * 0.16666667;
    fVar273 = (fVar336 * 4.0 + fVar273 + auVar237._4_4_ * fVar245 * 12.0 + fVar200 * fVar245 * 6.0)
              * 0.16666667;
    fVar293 = (fVar337 * 4.0 + fVar293 + auVar237._8_4_ * fVar246 * 12.0 + fVar241 * fVar246 * 6.0)
              * 0.16666667;
    fVar295 = (fVar338 * 4.0 + fVar295 + auVar237._12_4_ * fVar263 * 12.0 + fVar204 * fVar263 * 6.0)
              * 0.16666667;
    fVar297 = (fVar339 * 4.0 + fVar297 + auVar237._16_4_ * fVar265 * 12.0 + fVar225 * fVar265 * 6.0)
              * 0.16666667;
    fVar318 = (fVar340 * 4.0 + fVar318 + auVar237._20_4_ * fVar267 * 12.0 + fVar205 * fVar267 * 6.0)
              * 0.16666667;
    fVar322 = (fVar341 * 4.0 + fVar322 + auVar237._24_4_ * fVar271 * 12.0 + fVar242 * fVar271 * 6.0)
              * 0.16666667;
    fVar327 = fVar327 * 0.16666667;
    fVar336 = fVar336 * 0.16666667;
    fVar337 = fVar337 * 0.16666667;
    fVar338 = fVar338 * 0.16666667;
    fVar339 = fVar339 * 0.16666667;
    fVar340 = fVar340 * 0.16666667;
    fVar341 = fVar341 * 0.16666667;
    fVar407 = auVar400._28_4_ + 12.0;
    fVar380 = fVar379 + 12.166667;
    local_a60 = (float)local_1a0._0_4_ * fVar269 +
                (float)local_200._0_4_ * fVar342 +
                fVar327 * (float)local_380._0_4_ + fVar244 * (float)local_300._0_4_;
    fStack_a5c = (float)local_1a0._4_4_ * fVar275 +
                 (float)local_200._4_4_ * fVar356 +
                 fVar336 * (float)local_380._4_4_ + fVar273 * (float)local_300._4_4_;
    fStack_a58 = fStack_198 * fVar294 +
                 fStack_1f8 * fVar358 + fVar337 * fStack_378 + fVar293 * fStack_2f8;
    fStack_a54 = fStack_194 * fVar296 +
                 fStack_1f4 * fVar360 + fVar338 * fStack_374 + fVar295 * fStack_2f4;
    fStack_a50 = fStack_190 * fVar298 +
                 fStack_1f0 * fVar362 + fVar339 * fStack_370 + fVar297 * fStack_2f0;
    fStack_a4c = fStack_18c * fVar319 +
                 fStack_1ec * fVar364 + fVar340 * fStack_36c + fVar318 * fStack_2ec;
    fStack_a48 = fStack_188 * fVar323 +
                 fStack_1e8 * fVar366 + fVar341 * fStack_368 + fVar322 * fStack_2e8;
    fStack_a44 = fVar368 + fVar380;
    local_ae0 = (float)local_1c0._0_4_ * fVar269 +
                (float)local_220._0_4_ * fVar342 +
                fVar327 * (float)local_3a0._0_4_ + fVar244 * (float)local_320._0_4_;
    fStack_adc = (float)local_1c0._4_4_ * fVar275 +
                 (float)local_220._4_4_ * fVar356 +
                 fVar336 * (float)local_3a0._4_4_ + fVar273 * (float)local_320._4_4_;
    fStack_ad8 = fStack_1b8 * fVar294 +
                 fStack_218 * fVar358 + fVar337 * fStack_398 + fVar293 * fStack_318;
    fStack_ad4 = fStack_1b4 * fVar296 +
                 fStack_214 * fVar360 + fVar338 * fStack_394 + fVar295 * fStack_314;
    fStack_ad0 = fStack_1b0 * fVar298 +
                 fStack_210 * fVar362 + fVar339 * fStack_390 + fVar297 * fStack_310;
    fStack_acc = fStack_1ac * fVar319 +
                 fStack_20c * fVar364 + fVar340 * fStack_38c + fVar318 * fStack_30c;
    fStack_ac8 = fStack_1a8 * fVar323 +
                 fStack_208 * fVar366 + fVar341 * fStack_388 + fVar322 * fStack_308;
    fStack_ac4 = fStack_a44 + fVar407 + 12.166667;
    local_ac0 = (float)local_1e0._0_4_ * fVar269 +
                fVar342 * (float)local_240._0_4_ +
                fVar327 * (float)local_3c0._0_4_ + fVar244 * (float)local_340._0_4_;
    fStack_abc = (float)local_1e0._4_4_ * fVar275 +
                 fVar356 * (float)local_240._4_4_ +
                 fVar336 * (float)local_3c0._4_4_ + fVar273 * (float)local_340._4_4_;
    fStack_ab8 = fStack_1d8 * fVar294 +
                 fVar358 * fStack_238 + fVar337 * fStack_3b8 + fVar293 * fStack_338;
    fStack_ab4 = fStack_1d4 * fVar296 +
                 fVar360 * fStack_234 + fVar338 * fStack_3b4 + fVar295 * fStack_334;
    fStack_ab0 = fStack_1d0 * fVar298 +
                 fVar362 * fStack_230 + fVar339 * fStack_3b0 + fVar297 * fStack_330;
    fStack_aac = fStack_1cc * fVar319 +
                 fVar364 * fStack_22c + fVar340 * fStack_3ac + fVar318 * fStack_32c;
    fStack_aa8 = fStack_1c8 * fVar323 +
                 fVar366 * fStack_228 + fVar341 * fStack_3a8 + fVar322 * fStack_328;
    fStack_aa4 = fStack_ac4 + fVar407 + auVar415._28_4_ + 12.0;
    local_800._0_4_ =
         fVar269 * (float)local_2c0._0_4_ +
         fVar342 * (float)local_2e0._0_4_ +
         fVar244 * (float)local_360._0_4_ + fVar327 * (float)local_3e0._0_4_;
    local_800._4_4_ =
         fVar275 * (float)local_2c0._4_4_ +
         fVar356 * (float)local_2e0._4_4_ +
         fVar273 * (float)local_360._4_4_ + fVar336 * (float)local_3e0._4_4_;
    local_800._8_4_ =
         fVar294 * fStack_2b8 + fVar358 * fStack_2d8 + fVar293 * fStack_358 + fVar337 * fStack_3d8;
    local_800._12_4_ =
         fVar296 * fStack_2b4 + fVar360 * fStack_2d4 + fVar295 * fStack_354 + fVar338 * fStack_3d4;
    local_800._16_4_ =
         fVar298 * fStack_2b0 + fVar362 * fStack_2d0 + fVar297 * fStack_350 + fVar339 * fStack_3d0;
    local_800._20_4_ =
         fVar319 * fStack_2ac + fVar364 * fStack_2cc + fVar318 * fStack_34c + fVar340 * fStack_3cc;
    local_800._24_4_ =
         fVar323 * fStack_2a8 + fVar366 * fStack_2c8 + fVar322 * fStack_348 + fVar341 * fStack_3c8;
    local_800._28_4_ = auVar310._28_4_ + fVar368 + fVar379 + auVar335._28_4_;
    auVar50._4_4_ = auVar237._4_4_ * -auVar237._4_4_;
    auVar50._0_4_ = auVar237._0_4_ * -auVar237._0_4_;
    auVar50._8_4_ = auVar237._8_4_ * -auVar237._8_4_;
    auVar50._12_4_ = auVar237._12_4_ * -auVar237._12_4_;
    auVar50._16_4_ = auVar237._16_4_ * -auVar237._16_4_;
    auVar50._20_4_ = auVar237._20_4_ * -auVar237._20_4_;
    auVar50._24_4_ = auVar237._24_4_ * -auVar237._24_4_;
    auVar50._28_4_ = auVar237._28_4_;
    auVar51._4_4_ = fVar245 * 4.0;
    auVar51._0_4_ = fVar243 * 4.0;
    auVar51._8_4_ = fVar246 * 4.0;
    auVar51._12_4_ = fVar263 * 4.0;
    auVar51._16_4_ = fVar265 * 4.0;
    auVar51._20_4_ = fVar267 * 4.0;
    auVar51._24_4_ = fVar271 * 4.0;
    auVar51._28_4_ = auVar292._28_4_;
    auVar147 = vsubps_avx(auVar50,auVar51);
    fVar296 = fVar226 * -fVar226 * 0.5;
    fVar298 = fVar200 * -fVar200 * 0.5;
    fVar323 = fVar241 * -fVar241 * 0.5;
    fVar327 = fVar204 * -fVar204 * 0.5;
    fVar336 = fVar225 * -fVar225 * 0.5;
    fVar337 = fVar205 * -fVar205 * 0.5;
    fVar338 = fVar242 * -fVar242 * 0.5;
    fVar269 = auVar147._0_4_ * 0.5;
    fVar293 = auVar147._4_4_ * 0.5;
    fVar294 = auVar147._8_4_ * 0.5;
    fVar295 = auVar147._12_4_ * 0.5;
    fVar318 = auVar147._16_4_ * 0.5;
    fVar319 = auVar147._20_4_ * 0.5;
    fVar322 = auVar147._24_4_ * 0.5;
    fVar244 = (fVar226 * fVar226 + fVar243 * 4.0) * 0.5;
    fVar245 = (fVar200 * fVar200 + fVar245 * 4.0) * 0.5;
    fVar246 = (fVar241 * fVar241 + fVar246 * 4.0) * 0.5;
    fVar263 = (fVar204 * fVar204 + fVar263 * 4.0) * 0.5;
    fVar265 = (fVar225 * fVar225 + fVar265 * 4.0) * 0.5;
    fVar273 = (fVar205 * fVar205 + fVar267 * 4.0) * 0.5;
    fVar275 = (fVar242 * fVar242 + fVar271 * 4.0) * 0.5;
    fVar226 = auVar237._0_4_ * auVar237._0_4_ * 0.5;
    fVar200 = auVar237._4_4_ * auVar237._4_4_ * 0.5;
    fVar241 = auVar237._8_4_ * auVar237._8_4_ * 0.5;
    fVar204 = auVar237._12_4_ * auVar237._12_4_ * 0.5;
    fVar225 = auVar237._16_4_ * auVar237._16_4_ * 0.5;
    fVar205 = auVar237._20_4_ * auVar237._20_4_ * 0.5;
    fVar243 = auVar237._24_4_ * auVar237._24_4_ * 0.5;
    fVar326 = fStack_aa4 + fVar380 + fVar380 + 4.0;
    auVar170 = vpermilps_avx(ZEXT416((uint)(fVar127 * 0.04761905)),0);
    fVar242 = auVar170._0_4_;
    fVar300 = fVar242 * ((float)local_1a0._0_4_ * fVar296 +
                        (float)local_200._0_4_ * fVar269 +
                        fVar244 * (float)local_300._0_4_ + fVar226 * (float)local_380._0_4_);
    fVar267 = auVar170._4_4_;
    fVar311 = fVar267 * ((float)local_1a0._4_4_ * fVar298 +
                        (float)local_200._4_4_ * fVar293 +
                        fVar245 * (float)local_300._4_4_ + fVar200 * (float)local_380._4_4_);
    local_9a0._4_4_ = fVar311;
    local_9a0._0_4_ = fVar300;
    fVar271 = auVar170._8_4_;
    fVar312 = fVar271 * (fStack_198 * fVar323 +
                        fStack_1f8 * fVar294 + fVar246 * fStack_2f8 + fVar241 * fStack_378);
    local_9a0._8_4_ = fVar312;
    fVar297 = auVar170._12_4_;
    fVar314 = fVar297 * (fStack_194 * fVar327 +
                        fStack_1f4 * fVar295 + fVar263 * fStack_2f4 + fVar204 * fStack_374);
    local_9a0._12_4_ = fVar314;
    fVar316 = fVar242 * (fStack_190 * fVar336 +
                        fStack_1f0 * fVar318 + fVar265 * fStack_2f0 + fVar225 * fStack_370);
    local_9a0._16_4_ = fVar316;
    fVar320 = fVar267 * (fStack_18c * fVar337 +
                        fStack_1ec * fVar319 + fVar273 * fStack_2ec + fVar205 * fStack_36c);
    local_9a0._20_4_ = fVar320;
    fVar324 = fVar271 * (fStack_188 * fVar338 +
                        fStack_1e8 * fVar322 + fVar275 * fStack_2e8 + fVar243 * fStack_368);
    local_9a0._24_4_ = fVar324;
    local_9a0._28_4_ = fVar326;
    fVar408 = fVar242 * ((float)local_1c0._0_4_ * fVar296 +
                        (float)local_220._0_4_ * fVar269 +
                        fVar244 * (float)local_320._0_4_ + fVar226 * (float)local_3a0._0_4_);
    fVar416 = fVar267 * ((float)local_1c0._4_4_ * fVar298 +
                        (float)local_220._4_4_ * fVar293 +
                        fVar245 * (float)local_320._4_4_ + fVar200 * (float)local_3a0._4_4_);
    local_940._4_4_ = fVar416;
    local_940._0_4_ = fVar408;
    fVar418 = fVar271 * (fStack_1b8 * fVar323 +
                        fStack_218 * fVar294 + fVar246 * fStack_318 + fVar241 * fStack_398);
    local_940._8_4_ = fVar418;
    fVar419 = fVar297 * (fStack_1b4 * fVar327 +
                        fStack_214 * fVar295 + fVar263 * fStack_314 + fVar204 * fStack_394);
    local_940._12_4_ = fVar419;
    fVar420 = fVar242 * (fStack_1b0 * fVar336 +
                        fStack_210 * fVar318 + fVar265 * fStack_310 + fVar225 * fStack_390);
    local_940._16_4_ = fVar420;
    fVar421 = fVar267 * (fStack_1ac * fVar337 +
                        fStack_20c * fVar319 + fVar273 * fStack_30c + fVar205 * fStack_38c);
    local_940._20_4_ = fVar421;
    fVar422 = fVar271 * (fStack_1a8 * fVar338 +
                        fStack_208 * fVar322 + fVar275 * fStack_308 + fVar243 * fStack_388);
    local_940._24_4_ = fVar422;
    local_940._28_4_ = fStack_184;
    fVar424 = fVar242 * ((float)local_1e0._0_4_ * fVar296 +
                        fVar226 * (float)local_3c0._0_4_ + fVar244 * (float)local_340._0_4_ +
                        (float)local_240._0_4_ * fVar269);
    fVar428 = fVar267 * ((float)local_1e0._4_4_ * fVar298 +
                        fVar200 * (float)local_3c0._4_4_ + fVar245 * (float)local_340._4_4_ +
                        (float)local_240._4_4_ * fVar293);
    local_8c0._4_4_ = fVar428;
    local_8c0._0_4_ = fVar424;
    fVar430 = fVar271 * (fStack_1d8 * fVar323 +
                        fVar241 * fStack_3b8 + fVar246 * fStack_338 + fStack_238 * fVar294);
    local_8c0._8_4_ = fVar430;
    fVar432 = fVar297 * (fStack_1d4 * fVar327 +
                        fVar204 * fStack_3b4 + fVar263 * fStack_334 + fStack_234 * fVar295);
    local_8c0._12_4_ = fVar432;
    fVar434 = fVar242 * (fStack_1d0 * fVar336 +
                        fVar225 * fStack_3b0 + fVar265 * fStack_330 + fStack_230 * fVar318);
    local_8c0._16_4_ = fVar434;
    fVar436 = fVar267 * (fStack_1cc * fVar337 +
                        fVar205 * fStack_3ac + fVar273 * fStack_32c + fStack_22c * fVar319);
    local_8c0._20_4_ = fVar436;
    fVar438 = fVar271 * (fStack_1c8 * fVar338 +
                        fVar243 * fStack_3a8 + fVar275 * fStack_328 + fStack_228 * fVar322);
    local_8c0._24_4_ = fVar438;
    local_8c0._28_4_ = uStack_1a4;
    fVar127 = fVar242 * (fVar296 * (float)local_2c0._0_4_ +
                        fVar269 * (float)local_2e0._0_4_ +
                        fVar226 * (float)local_3e0._0_4_ + fVar244 * (float)local_360._0_4_);
    fVar269 = fVar267 * (fVar298 * (float)local_2c0._4_4_ +
                        fVar293 * (float)local_2e0._4_4_ +
                        fVar200 * (float)local_3e0._4_4_ + fVar245 * (float)local_360._4_4_);
    auVar52._4_4_ = fVar269;
    auVar52._0_4_ = fVar127;
    fVar296 = fVar271 * (fVar323 * fStack_2b8 +
                        fVar294 * fStack_2d8 + fVar241 * fStack_3d8 + fVar246 * fStack_358);
    auVar52._8_4_ = fVar296;
    fVar298 = fVar297 * (fVar327 * fStack_2b4 +
                        fVar295 * fStack_2d4 + fVar204 * fStack_3d4 + fVar263 * fStack_354);
    auVar52._12_4_ = fVar298;
    fVar242 = fVar242 * (fVar336 * fStack_2b0 +
                        fVar318 * fStack_2d0 + fVar225 * fStack_3d0 + fVar265 * fStack_350);
    auVar52._16_4_ = fVar242;
    fVar267 = fVar267 * (fVar337 * fStack_2ac +
                        fVar319 * fStack_2cc + fVar205 * fStack_3cc + fVar273 * fStack_34c);
    auVar52._20_4_ = fVar267;
    fVar271 = fVar271 * (fVar338 * fStack_2a8 +
                        fVar322 * fStack_2c8 + fVar243 * fStack_3c8 + fVar275 * fStack_348);
    auVar52._24_4_ = fVar271;
    auVar52._28_4_ = fVar297;
    auVar108._4_4_ = fStack_adc;
    auVar108._0_4_ = local_ae0;
    auVar108._8_4_ = fStack_ad8;
    auVar108._12_4_ = fStack_ad4;
    auVar108._16_4_ = fStack_ad0;
    auVar108._20_4_ = fStack_acc;
    auVar108._24_4_ = fStack_ac8;
    auVar108._28_4_ = fStack_ac4;
    auVar147 = vperm2f128_avx(auVar108,auVar108,1);
    auVar147 = vshufps_avx(auVar147,auVar108,0x30);
    _local_880 = vshufps_avx(auVar108,auVar147,0x29);
    auVar110._4_4_ = fStack_abc;
    auVar110._0_4_ = local_ac0;
    auVar110._8_4_ = fStack_ab8;
    auVar110._12_4_ = fStack_ab4;
    auVar110._16_4_ = fStack_ab0;
    auVar110._20_4_ = fStack_aac;
    auVar110._24_4_ = fStack_aa8;
    auVar110._28_4_ = fStack_aa4;
    auVar147 = vperm2f128_avx(auVar110,auVar110,1);
    auVar147 = vshufps_avx(auVar147,auVar110,0x30);
    _local_8a0 = vshufps_avx(auVar110,auVar147,0x29);
    auVar182 = vsubps_avx(local_800,auVar52);
    auVar147 = vperm2f128_avx(auVar182,auVar182,1);
    auVar147 = vshufps_avx(auVar147,auVar182,0x30);
    local_700 = vshufps_avx(auVar182,auVar147,0x29);
    _local_6a0 = vsubps_avx(_local_880,auVar108);
    _local_680 = vsubps_avx(_local_8a0,auVar110);
    fVar200 = local_6a0._0_4_;
    fVar244 = local_6a0._4_4_;
    auVar53._4_4_ = fVar428 * fVar244;
    auVar53._0_4_ = fVar424 * fVar200;
    fVar273 = local_6a0._8_4_;
    auVar53._8_4_ = fVar430 * fVar273;
    fVar318 = local_6a0._12_4_;
    auVar53._12_4_ = fVar432 * fVar318;
    fVar339 = local_6a0._16_4_;
    auVar53._16_4_ = fVar434 * fVar339;
    fVar364 = local_6a0._20_4_;
    auVar53._20_4_ = fVar436 * fVar364;
    fVar41 = local_6a0._24_4_;
    auVar53._24_4_ = fVar438 * fVar41;
    auVar53._28_4_ = auVar182._28_4_;
    fVar241 = local_680._0_4_;
    fVar245 = local_680._4_4_;
    auVar54._4_4_ = fVar416 * fVar245;
    auVar54._0_4_ = fVar408 * fVar241;
    fVar275 = local_680._8_4_;
    auVar54._8_4_ = fVar418 * fVar275;
    fVar319 = local_680._12_4_;
    auVar54._12_4_ = fVar419 * fVar319;
    fVar340 = local_680._16_4_;
    auVar54._16_4_ = fVar420 * fVar340;
    fVar366 = local_680._20_4_;
    auVar54._20_4_ = fVar421 * fVar366;
    fVar42 = local_680._24_4_;
    auVar54._24_4_ = fVar422 * fVar42;
    auVar54._28_4_ = auVar147._28_4_;
    auVar36 = vsubps_avx(auVar54,auVar53);
    auVar112._4_4_ = fStack_a5c;
    auVar112._0_4_ = local_a60;
    auVar112._8_4_ = fStack_a58;
    auVar112._12_4_ = fStack_a54;
    auVar112._16_4_ = fStack_a50;
    auVar112._20_4_ = fStack_a4c;
    auVar112._24_4_ = fStack_a48;
    auVar112._28_4_ = fStack_a44;
    auVar147 = vperm2f128_avx(auVar112,auVar112,1);
    auVar147 = vshufps_avx(auVar147,auVar112,0x30);
    local_960 = vshufps_avx(auVar112,auVar147,0x29);
    local_560 = vsubps_avx(local_960,auVar112);
    auVar55._4_4_ = fVar245 * fVar311;
    auVar55._0_4_ = fVar241 * fVar300;
    auVar55._8_4_ = fVar275 * fVar312;
    auVar55._12_4_ = fVar319 * fVar314;
    auVar55._16_4_ = fVar340 * fVar316;
    auVar55._20_4_ = fVar366 * fVar320;
    auVar55._24_4_ = fVar42 * fVar324;
    auVar55._28_4_ = auVar147._28_4_;
    fVar204 = local_560._0_4_;
    fVar246 = local_560._4_4_;
    auVar56._4_4_ = fVar428 * fVar246;
    auVar56._0_4_ = fVar424 * fVar204;
    fVar293 = local_560._8_4_;
    auVar56._8_4_ = fVar430 * fVar293;
    fVar322 = local_560._12_4_;
    auVar56._12_4_ = fVar432 * fVar322;
    fVar341 = local_560._16_4_;
    auVar56._16_4_ = fVar434 * fVar341;
    fVar368 = local_560._20_4_;
    auVar56._20_4_ = fVar436 * fVar368;
    fVar43 = local_560._24_4_;
    auVar56._24_4_ = fVar438 * fVar43;
    auVar56._28_4_ = local_8a0._28_4_;
    auVar37 = vsubps_avx(auVar56,auVar55);
    auVar57._4_4_ = fVar416 * fVar246;
    auVar57._0_4_ = fVar408 * fVar204;
    auVar57._8_4_ = fVar418 * fVar293;
    auVar57._12_4_ = fVar419 * fVar322;
    auVar57._16_4_ = fVar420 * fVar341;
    auVar57._20_4_ = fVar421 * fVar368;
    auVar57._24_4_ = fVar422 * fVar43;
    auVar57._28_4_ = local_8a0._28_4_;
    auVar58._4_4_ = fVar244 * fVar311;
    auVar58._0_4_ = fVar200 * fVar300;
    auVar58._8_4_ = fVar273 * fVar312;
    auVar58._12_4_ = fVar318 * fVar314;
    auVar58._16_4_ = fVar339 * fVar316;
    auVar58._20_4_ = fVar364 * fVar320;
    auVar58._24_4_ = fVar41 * fVar324;
    auVar58._28_4_ = uStack_1c4;
    auVar183 = vsubps_avx(auVar58,auVar57);
    fVar226 = auVar183._28_4_;
    auVar181._0_4_ = fVar204 * fVar204 + fVar200 * fVar200 + fVar241 * fVar241;
    auVar181._4_4_ = fVar246 * fVar246 + fVar244 * fVar244 + fVar245 * fVar245;
    auVar181._8_4_ = fVar293 * fVar293 + fVar273 * fVar273 + fVar275 * fVar275;
    auVar181._12_4_ = fVar322 * fVar322 + fVar318 * fVar318 + fVar319 * fVar319;
    auVar181._16_4_ = fVar341 * fVar341 + fVar339 * fVar339 + fVar340 * fVar340;
    auVar181._20_4_ = fVar368 * fVar368 + fVar364 * fVar364 + fVar366 * fVar366;
    auVar181._24_4_ = fVar43 * fVar43 + fVar41 * fVar41 + fVar42 * fVar42;
    auVar181._28_4_ = fVar226 + fVar226 + auVar36._28_4_;
    auVar147 = vrcpps_avx(auVar181);
    fVar336 = auVar147._0_4_;
    fVar337 = auVar147._4_4_;
    auVar59._4_4_ = fVar337 * auVar181._4_4_;
    auVar59._0_4_ = fVar336 * auVar181._0_4_;
    fVar338 = auVar147._8_4_;
    auVar59._8_4_ = fVar338 * auVar181._8_4_;
    fVar358 = auVar147._12_4_;
    auVar59._12_4_ = fVar358 * auVar181._12_4_;
    fVar360 = auVar147._16_4_;
    auVar59._16_4_ = fVar360 * auVar181._16_4_;
    fVar362 = auVar147._20_4_;
    auVar59._20_4_ = fVar362 * auVar181._20_4_;
    fVar407 = auVar147._24_4_;
    auVar59._24_4_ = fVar407 * auVar181._24_4_;
    auVar59._28_4_ = uStack_1c4;
    auVar219._8_4_ = 0x3f800000;
    auVar219._0_8_ = &DAT_3f8000003f800000;
    auVar219._12_4_ = 0x3f800000;
    auVar219._16_4_ = 0x3f800000;
    auVar219._20_4_ = 0x3f800000;
    auVar219._24_4_ = 0x3f800000;
    auVar219._28_4_ = 0x3f800000;
    auVar186 = vsubps_avx(auVar219,auVar59);
    fVar336 = auVar186._0_4_ * fVar336 + fVar336;
    fVar337 = auVar186._4_4_ * fVar337 + fVar337;
    fVar338 = auVar186._8_4_ * fVar338 + fVar338;
    fVar358 = auVar186._12_4_ * fVar358 + fVar358;
    fVar360 = auVar186._16_4_ * fVar360 + fVar360;
    fVar362 = auVar186._20_4_ * fVar362 + fVar362;
    fVar407 = auVar186._24_4_ * fVar407 + fVar407;
    auVar182 = vperm2f128_avx(local_940,local_940,1);
    auVar182 = vshufps_avx(auVar182,local_940,0x30);
    local_a00 = vshufps_avx(local_940,auVar182,0x29);
    auVar182 = vperm2f128_avx(local_8c0,local_8c0,1);
    auVar182 = vshufps_avx(auVar182,local_8c0,0x30);
    local_7e0 = vshufps_avx(local_8c0,auVar182,0x29);
    fVar425 = local_7e0._0_4_;
    fVar429 = local_7e0._4_4_;
    auVar60._4_4_ = fVar429 * fVar244;
    auVar60._0_4_ = fVar425 * fVar200;
    fVar431 = local_7e0._8_4_;
    auVar60._8_4_ = fVar431 * fVar273;
    fVar433 = local_7e0._12_4_;
    auVar60._12_4_ = fVar433 * fVar318;
    fVar435 = local_7e0._16_4_;
    auVar60._16_4_ = fVar435 * fVar339;
    fVar437 = local_7e0._20_4_;
    auVar60._20_4_ = fVar437 * fVar364;
    fVar439 = local_7e0._24_4_;
    auVar60._24_4_ = fVar439 * fVar41;
    auVar60._28_4_ = auVar182._28_4_;
    fVar225 = local_a00._0_4_;
    fVar263 = local_a00._4_4_;
    auVar61._4_4_ = fVar245 * fVar263;
    auVar61._0_4_ = fVar241 * fVar225;
    fVar294 = local_a00._8_4_;
    auVar61._8_4_ = fVar275 * fVar294;
    fVar323 = local_a00._12_4_;
    auVar61._12_4_ = fVar319 * fVar323;
    fVar342 = local_a00._16_4_;
    auVar61._16_4_ = fVar340 * fVar342;
    fVar379 = local_a00._20_4_;
    auVar61._20_4_ = fVar366 * fVar379;
    fVar44 = local_a00._24_4_;
    auVar61._24_4_ = fVar42 * fVar44;
    auVar61._28_4_ = fStack_184;
    auVar352 = vsubps_avx(auVar61,auVar60);
    auVar182 = vperm2f128_avx(local_9a0,local_9a0,1);
    auVar182 = vshufps_avx(auVar182,local_9a0,0x30);
    local_980 = vshufps_avx(local_9a0,auVar182,0x29);
    fVar205 = local_980._0_4_;
    fVar265 = local_980._4_4_;
    auVar62._4_4_ = fVar245 * fVar265;
    auVar62._0_4_ = fVar241 * fVar205;
    fVar295 = local_980._8_4_;
    auVar62._8_4_ = fVar275 * fVar295;
    fVar327 = local_980._12_4_;
    auVar62._12_4_ = fVar319 * fVar327;
    fVar356 = local_980._16_4_;
    auVar62._16_4_ = fVar340 * fVar356;
    fVar380 = local_980._20_4_;
    auVar62._20_4_ = fVar366 * fVar380;
    fVar45 = local_980._24_4_;
    auVar62._24_4_ = fVar42 * fVar45;
    auVar62._28_4_ = auVar182._28_4_;
    auVar63._4_4_ = fVar429 * fVar246;
    auVar63._0_4_ = fVar425 * fVar204;
    auVar63._8_4_ = fVar431 * fVar293;
    auVar63._12_4_ = fVar433 * fVar322;
    auVar63._16_4_ = fVar435 * fVar341;
    auVar63._20_4_ = fVar437 * fVar368;
    uVar117 = local_7e0._28_4_;
    auVar63._24_4_ = fVar439 * fVar43;
    auVar63._28_4_ = uVar117;
    auVar182 = vsubps_avx(auVar63,auVar62);
    auVar39 = local_a00;
    auVar64._4_4_ = fVar246 * fVar263;
    auVar64._0_4_ = fVar204 * fVar225;
    auVar64._8_4_ = fVar293 * fVar294;
    auVar64._12_4_ = fVar322 * fVar323;
    auVar64._16_4_ = fVar341 * fVar342;
    auVar64._20_4_ = fVar368 * fVar379;
    auVar64._24_4_ = fVar43 * fVar44;
    auVar64._28_4_ = uVar117;
    auVar65._4_4_ = fVar244 * fVar265;
    auVar65._0_4_ = fVar200 * fVar205;
    auVar65._8_4_ = fVar273 * fVar295;
    auVar65._12_4_ = fVar318 * fVar327;
    auVar65._16_4_ = fVar339 * fVar356;
    auVar65._20_4_ = fVar364 * fVar380;
    auVar65._24_4_ = fVar41 * fVar45;
    auVar65._28_4_ = uStack_1e4;
    auVar38 = vsubps_avx(auVar65,auVar64);
    fVar243 = auVar38._28_4_;
    fVar423 = auVar182._28_4_ + fVar243;
    auVar66._4_4_ =
         (auVar36._4_4_ * auVar36._4_4_ +
         auVar37._4_4_ * auVar37._4_4_ + auVar183._4_4_ * auVar183._4_4_) * fVar337;
    auVar66._0_4_ =
         (auVar36._0_4_ * auVar36._0_4_ +
         auVar37._0_4_ * auVar37._0_4_ + auVar183._0_4_ * auVar183._0_4_) * fVar336;
    auVar66._8_4_ =
         (auVar36._8_4_ * auVar36._8_4_ +
         auVar37._8_4_ * auVar37._8_4_ + auVar183._8_4_ * auVar183._8_4_) * fVar338;
    auVar66._12_4_ =
         (auVar36._12_4_ * auVar36._12_4_ +
         auVar37._12_4_ * auVar37._12_4_ + auVar183._12_4_ * auVar183._12_4_) * fVar358;
    auVar66._16_4_ =
         (auVar36._16_4_ * auVar36._16_4_ +
         auVar37._16_4_ * auVar37._16_4_ + auVar183._16_4_ * auVar183._16_4_) * fVar360;
    auVar66._20_4_ =
         (auVar36._20_4_ * auVar36._20_4_ +
         auVar37._20_4_ * auVar37._20_4_ + auVar183._20_4_ * auVar183._20_4_) * fVar362;
    auVar66._24_4_ =
         (auVar36._24_4_ * auVar36._24_4_ +
         auVar37._24_4_ * auVar37._24_4_ + auVar183._24_4_ * auVar183._24_4_) * fVar407;
    auVar66._28_4_ = auVar36._28_4_ + auVar37._28_4_ + fVar226;
    auVar67._4_4_ =
         (auVar352._4_4_ * auVar352._4_4_ +
         auVar182._4_4_ * auVar182._4_4_ + auVar38._4_4_ * auVar38._4_4_) * fVar337;
    auVar67._0_4_ =
         (auVar352._0_4_ * auVar352._0_4_ +
         auVar182._0_4_ * auVar182._0_4_ + auVar38._0_4_ * auVar38._0_4_) * fVar336;
    auVar67._8_4_ =
         (auVar352._8_4_ * auVar352._8_4_ +
         auVar182._8_4_ * auVar182._8_4_ + auVar38._8_4_ * auVar38._8_4_) * fVar338;
    auVar67._12_4_ =
         (auVar352._12_4_ * auVar352._12_4_ +
         auVar182._12_4_ * auVar182._12_4_ + auVar38._12_4_ * auVar38._12_4_) * fVar358;
    auVar67._16_4_ =
         (auVar352._16_4_ * auVar352._16_4_ +
         auVar182._16_4_ * auVar182._16_4_ + auVar38._16_4_ * auVar38._16_4_) * fVar360;
    auVar67._20_4_ =
         (auVar352._20_4_ * auVar352._20_4_ +
         auVar182._20_4_ * auVar182._20_4_ + auVar38._20_4_ * auVar38._20_4_) * fVar362;
    auVar67._24_4_ =
         (auVar352._24_4_ * auVar352._24_4_ +
         auVar182._24_4_ * auVar182._24_4_ + auVar38._24_4_ * auVar38._24_4_) * fVar407;
    auVar67._28_4_ = auVar186._28_4_ + auVar147._28_4_;
    auVar147 = vmaxps_avx(auVar66,auVar67);
    auVar182 = vperm2f128_avx(local_800,local_800,1);
    auVar182 = vshufps_avx(auVar182,local_800,0x30);
    local_720 = vshufps_avx(local_800,auVar182,0x29);
    local_740._0_4_ = (float)local_800._0_4_ + fVar127;
    local_740._4_4_ = local_800._4_4_ + fVar269;
    fStack_738 = local_800._8_4_ + fVar296;
    fStack_734 = local_800._12_4_ + fVar298;
    fStack_730 = local_800._16_4_ + fVar242;
    fStack_72c = local_800._20_4_ + fVar267;
    fStack_728 = local_800._24_4_ + fVar271;
    fStack_724 = local_800._28_4_ + fVar297;
    auVar182 = vmaxps_avx(local_800,_local_740);
    auVar36 = vmaxps_avx(local_700,local_720);
    _local_a80 = vmaxps_avx(auVar182,auVar36);
    auVar182 = vrsqrtps_avx(auVar181);
    fVar226 = auVar182._0_4_;
    fVar242 = auVar182._4_4_;
    fVar127 = auVar182._8_4_;
    fVar267 = auVar182._12_4_;
    fVar269 = auVar182._16_4_;
    fVar271 = auVar182._20_4_;
    fVar296 = auVar182._24_4_;
    auVar68._4_4_ = fVar242 * fVar242 * fVar242 * auVar181._4_4_ * 0.5;
    auVar68._0_4_ = fVar226 * fVar226 * fVar226 * auVar181._0_4_ * 0.5;
    auVar68._8_4_ = fVar127 * fVar127 * fVar127 * auVar181._8_4_ * 0.5;
    auVar68._12_4_ = fVar267 * fVar267 * fVar267 * auVar181._12_4_ * 0.5;
    auVar68._16_4_ = fVar269 * fVar269 * fVar269 * auVar181._16_4_ * 0.5;
    auVar68._20_4_ = fVar271 * fVar271 * fVar271 * auVar181._20_4_ * 0.5;
    auVar68._24_4_ = fVar296 * fVar296 * fVar296 * auVar181._24_4_ * 0.5;
    auVar68._28_4_ = auVar181._28_4_;
    auVar69._4_4_ = fVar242 * 1.5;
    auVar69._0_4_ = fVar226 * 1.5;
    auVar69._8_4_ = fVar127 * 1.5;
    auVar69._12_4_ = fVar267 * 1.5;
    auVar69._16_4_ = fVar269 * 1.5;
    auVar69._20_4_ = fVar271 * 1.5;
    auVar69._24_4_ = fVar296 * 1.5;
    auVar69._28_4_ = auVar182._28_4_;
    local_5a0 = vsubps_avx(auVar69,auVar68);
    auVar109._4_4_ = fStack_adc;
    auVar109._0_4_ = local_ae0;
    auVar109._8_4_ = fStack_ad8;
    auVar109._12_4_ = fStack_ad4;
    auVar109._16_4_ = fStack_ad0;
    auVar109._20_4_ = fStack_acc;
    auVar109._24_4_ = fStack_ac8;
    auVar109._28_4_ = fStack_ac4;
    auVar182 = ZEXT1232(ZEXT412(0)) << 0x20;
    local_8e0 = vsubps_avx(auVar182,auVar109);
    auVar111._4_4_ = fStack_abc;
    auVar111._0_4_ = local_ac0;
    auVar111._8_4_ = fStack_ab8;
    auVar111._12_4_ = fStack_ab4;
    auVar111._16_4_ = fStack_ab0;
    auVar111._20_4_ = fStack_aac;
    auVar111._24_4_ = fStack_aa8;
    auVar111._28_4_ = fStack_aa4;
    auVar182 = vsubps_avx(auVar182,auVar111);
    fVar242 = auVar182._0_4_;
    fVar267 = auVar182._4_4_;
    fVar296 = auVar182._8_4_;
    fVar336 = auVar182._12_4_;
    fVar358 = auVar182._16_4_;
    fVar407 = auVar182._20_4_;
    fVar46 = auVar182._24_4_;
    fVar127 = local_8e0._0_4_;
    fVar269 = local_8e0._4_4_;
    fVar297 = local_8e0._8_4_;
    fVar337 = local_8e0._12_4_;
    fVar360 = local_8e0._16_4_;
    fVar40 = local_8e0._20_4_;
    fVar47 = local_8e0._24_4_;
    auVar183 = ZEXT1232(ZEXT412(0)) << 0x20;
    auVar36 = vsubps_avx(auVar183,auVar112);
    auVar400 = ZEXT3264(auVar36);
    fVar390 = auVar36._0_4_;
    fVar401 = auVar36._4_4_;
    fVar402 = auVar36._8_4_;
    fVar403 = auVar36._12_4_;
    fVar404 = auVar36._16_4_;
    fVar405 = auVar36._20_4_;
    fVar406 = auVar36._24_4_;
    auVar386._0_4_ = fVar390 * local_520 + local_540 * fVar127 + local_620 * fVar242;
    auVar386._4_4_ = fVar401 * fStack_51c + fStack_53c * fVar269 + fStack_61c * fVar267;
    auVar386._8_4_ = fVar402 * fStack_518 + fStack_538 * fVar297 + fStack_618 * fVar296;
    auVar386._12_4_ = fVar403 * fStack_514 + fStack_534 * fVar337 + fStack_614 * fVar336;
    auVar386._16_4_ = fVar404 * fStack_510 + fStack_530 * fVar360 + fStack_610 * fVar358;
    auVar386._20_4_ = fVar405 * fStack_50c + fStack_52c * fVar40 + fStack_60c * fVar407;
    auVar386._24_4_ = fVar406 * fStack_508 + fStack_528 * fVar47 + fStack_608 * fVar46;
    auVar386._28_4_ = fVar423 + fVar423 + auVar352._28_4_ + fVar423;
    auVar389 = ZEXT3264(auVar386);
    auVar414._0_4_ = fVar390 * fVar390 + fVar127 * fVar127 + fVar242 * fVar242;
    auVar414._4_4_ = fVar401 * fVar401 + fVar269 * fVar269 + fVar267 * fVar267;
    auVar414._8_4_ = fVar402 * fVar402 + fVar297 * fVar297 + fVar296 * fVar296;
    auVar414._12_4_ = fVar403 * fVar403 + fVar337 * fVar337 + fVar336 * fVar336;
    auVar414._16_4_ = fVar404 * fVar404 + fVar360 * fVar360 + fVar358 * fVar358;
    auVar414._20_4_ = fVar405 * fVar405 + fVar40 * fVar40 + fVar407 * fVar407;
    auVar414._24_4_ = fVar406 * fVar406 + fVar47 * fVar47 + fVar46 * fVar46;
    auVar414._28_4_ = fVar243 + fVar243 + fVar423;
    fVar243 = local_5a0._0_4_;
    fVar271 = local_5a0._4_4_;
    fVar298 = local_5a0._8_4_;
    fVar338 = local_5a0._12_4_;
    fVar362 = local_5a0._16_4_;
    fVar423 = local_5a0._20_4_;
    fVar299 = local_5a0._24_4_;
    fVar343 = local_520 * fVar204 * fVar243 +
              fVar200 * fVar243 * local_540 + fVar241 * fVar243 * local_620;
    fVar357 = fStack_51c * fVar246 * fVar271 +
              fVar244 * fVar271 * fStack_53c + fVar245 * fVar271 * fStack_61c;
    fVar359 = fStack_518 * fVar293 * fVar298 +
              fVar273 * fVar298 * fStack_538 + fVar275 * fVar298 * fStack_618;
    fVar361 = fStack_514 * fVar322 * fVar338 +
              fVar318 * fVar338 * fStack_534 + fVar319 * fVar338 * fStack_614;
    fVar363 = fStack_510 * fVar341 * fVar362 +
              fVar339 * fVar362 * fStack_530 + fVar340 * fVar362 * fStack_610;
    fVar365 = fStack_50c * fVar368 * fVar423 +
              fVar364 * fVar423 * fStack_52c + fVar366 * fVar423 * fStack_60c;
    fVar367 = fStack_508 * fVar43 * fVar299 +
              fVar41 * fVar299 * fStack_528 + fVar42 * fVar299 * fStack_608;
    fVar369 = fStack_504 + fStack_524 + fStack_604;
    fVar226 = fStack_504 + fStack_524 + fStack_604;
    local_6e0._0_4_ =
         fVar390 * fVar204 * fVar243 + fVar200 * fVar243 * fVar127 + fVar241 * fVar243 * fVar242;
    local_6e0._4_4_ =
         fVar401 * fVar246 * fVar271 + fVar244 * fVar271 * fVar269 + fVar245 * fVar271 * fVar267;
    local_6e0._8_4_ =
         fVar402 * fVar293 * fVar298 + fVar273 * fVar298 * fVar297 + fVar275 * fVar298 * fVar296;
    local_6e0._12_4_ =
         fVar403 * fVar322 * fVar338 + fVar318 * fVar338 * fVar337 + fVar319 * fVar338 * fVar336;
    local_6e0._16_4_ =
         fVar404 * fVar341 * fVar362 + fVar339 * fVar362 * fVar360 + fVar340 * fVar362 * fVar358;
    local_6e0._20_4_ =
         fVar405 * fVar368 * fVar423 + fVar364 * fVar423 * fVar40 + fVar366 * fVar423 * fVar407;
    local_6e0._24_4_ =
         fVar406 * fVar43 * fVar299 + fVar41 * fVar299 * fVar47 + fVar42 * fVar299 * fVar46;
    local_6e0._28_4_ = fStack_524 + fVar226;
    auVar70._4_4_ = fVar357 * local_6e0._4_4_;
    auVar70._0_4_ = fVar343 * local_6e0._0_4_;
    auVar70._8_4_ = fVar359 * local_6e0._8_4_;
    auVar70._12_4_ = fVar361 * local_6e0._12_4_;
    auVar70._16_4_ = fVar363 * local_6e0._16_4_;
    auVar70._20_4_ = fVar365 * local_6e0._20_4_;
    auVar70._24_4_ = fVar367 * local_6e0._24_4_;
    auVar70._28_4_ = fVar226;
    auVar36 = vsubps_avx(auVar386,auVar70);
    auVar71._4_4_ = local_6e0._4_4_ * local_6e0._4_4_;
    auVar71._0_4_ = local_6e0._0_4_ * local_6e0._0_4_;
    auVar71._8_4_ = local_6e0._8_4_ * local_6e0._8_4_;
    auVar71._12_4_ = local_6e0._12_4_ * local_6e0._12_4_;
    auVar71._16_4_ = local_6e0._16_4_ * local_6e0._16_4_;
    auVar71._20_4_ = local_6e0._20_4_ * local_6e0._20_4_;
    auVar71._24_4_ = local_6e0._24_4_ * local_6e0._24_4_;
    auVar71._28_4_ = fStack_524;
    local_760 = vsubps_avx(auVar414,auVar71);
    _local_660 = vsqrtps_avx(auVar147);
    fVar226 = (local_660._0_4_ + (float)local_a80._0_4_) * 1.0000002;
    fVar155 = (local_660._4_4_ + (float)local_a80._4_4_) * 1.0000002;
    fVar157 = (local_660._8_4_ + fStack_a78) * 1.0000002;
    fVar159 = (local_660._12_4_ + fStack_a74) * 1.0000002;
    fVar160 = (local_660._16_4_ + fStack_a70) * 1.0000002;
    fVar162 = (local_660._20_4_ + fStack_a6c) * 1.0000002;
    fVar163 = (local_660._24_4_ + fStack_a68) * 1.0000002;
    auVar72._4_4_ = fVar155 * fVar155;
    auVar72._0_4_ = fVar226 * fVar226;
    auVar72._8_4_ = fVar157 * fVar157;
    auVar72._12_4_ = fVar159 * fVar159;
    auVar72._16_4_ = fVar160 * fVar160;
    auVar72._20_4_ = fVar162 * fVar162;
    auVar72._24_4_ = fVar163 * fVar163;
    auVar72._28_4_ = local_660._28_4_ + fStack_a64;
    fVar409 = auVar36._0_4_ + auVar36._0_4_;
    fVar417 = auVar36._4_4_ + auVar36._4_4_;
    local_580._0_8_ = CONCAT44(fVar417,fVar409);
    local_580._8_4_ = auVar36._8_4_ + auVar36._8_4_;
    local_580._12_4_ = auVar36._12_4_ + auVar36._12_4_;
    local_580._16_4_ = auVar36._16_4_ + auVar36._16_4_;
    local_580._20_4_ = auVar36._20_4_ + auVar36._20_4_;
    local_580._24_4_ = auVar36._24_4_ + auVar36._24_4_;
    local_580._28_4_ = auVar36._28_4_ + auVar36._28_4_;
    auVar36 = vsubps_avx(local_760,auVar72);
    local_5c0._4_4_ = (uint)(fVar357 * fVar357);
    local_5c0._0_4_ = (uint)(fVar343 * fVar343);
    local_5c0._8_4_ = (uint)(fVar359 * fVar359);
    local_5c0._12_4_ = (uint)(fVar361 * fVar361);
    local_5c0._16_4_ = (uint)(fVar363 * fVar363);
    local_5c0._20_4_ = (uint)(fVar365 * fVar365);
    local_5c0._24_4_ = (uint)(fVar367 * fVar367);
    local_5c0._28_4_ = local_560._28_4_;
    _local_6c0 = vsubps_avx(local_260,local_5c0);
    auVar377 = ZEXT3264(_local_6c0);
    local_640._4_4_ = fVar417 * fVar417;
    local_640._0_4_ = fVar409 * fVar409;
    local_640._8_4_ = local_580._8_4_ * local_580._8_4_;
    local_640._12_4_ = local_580._12_4_ * local_580._12_4_;
    local_640._16_4_ = local_580._16_4_ * local_580._16_4_;
    local_640._20_4_ = local_580._20_4_ * local_580._20_4_;
    local_640._24_4_ = local_580._24_4_ * local_580._24_4_;
    local_640._28_4_ = 0x3f800002;
    fVar155 = local_6c0._0_4_;
    local_780._0_4_ = fVar155 * 4.0;
    fVar157 = local_6c0._4_4_;
    local_780._4_4_ = fVar157 * 4.0;
    fVar159 = local_6c0._8_4_;
    fStack_778 = fVar159 * 4.0;
    fVar160 = local_6c0._12_4_;
    fStack_774 = fVar160 * 4.0;
    fVar162 = local_6c0._16_4_;
    fStack_770 = fVar162 * 4.0;
    fVar163 = local_6c0._20_4_;
    fStack_76c = fVar163 * 4.0;
    fVar378 = local_6c0._24_4_;
    fStack_768 = fVar378 * 4.0;
    fStack_764 = 4.0;
    auVar73._4_4_ = auVar36._4_4_ * (float)local_780._4_4_;
    auVar73._0_4_ = auVar36._0_4_ * (float)local_780._0_4_;
    auVar73._8_4_ = auVar36._8_4_ * fStack_778;
    auVar73._12_4_ = auVar36._12_4_ * fStack_774;
    auVar73._16_4_ = auVar36._16_4_ * fStack_770;
    auVar73._20_4_ = auVar36._20_4_ * fStack_76c;
    auVar73._24_4_ = auVar36._24_4_ * fStack_768;
    auVar73._28_4_ = 0x40800000;
    auVar37 = vsubps_avx(local_640,auVar73);
    auVar147 = vcmpps_avx(auVar37,auVar183,5);
    fVar226 = local_6c0._28_4_;
    if ((((((((auVar147 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar147 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar147 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar147 >> 0x7f,0) == '\0') &&
          (auVar147 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar147 >> 0xbf,0) == '\0') &&
        (auVar147 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar147[0x1f])
    {
      auVar258._8_4_ = 0x7f800000;
      auVar258._0_8_ = 0x7f8000007f800000;
      auVar258._12_4_ = 0x7f800000;
      auVar258._16_4_ = 0x7f800000;
      auVar258._20_4_ = 0x7f800000;
      auVar258._24_4_ = 0x7f800000;
      auVar258._28_4_ = 0x7f800000;
      fStack_498 = -INFINITY;
      local_4a0 = (undefined1  [8])0xff800000ff800000;
      fStack_494 = -INFINITY;
      fStack_490 = -INFINITY;
      fStack_48c = -INFINITY;
      fStack_488 = -INFINITY;
      fStack_484 = -INFINITY;
      fVar409 = 0.0;
    }
    else {
      auVar352 = vsqrtps_avx(auVar37);
      auVar305._0_4_ = fVar155 + fVar155;
      auVar305._4_4_ = fVar157 + fVar157;
      auVar305._8_4_ = fVar159 + fVar159;
      auVar305._12_4_ = fVar160 + fVar160;
      auVar305._16_4_ = fVar162 + fVar162;
      auVar305._20_4_ = fVar163 + fVar163;
      auVar305._24_4_ = fVar378 + fVar378;
      auVar305._28_4_ = fVar226 + fVar226;
      auVar186 = vrcpps_avx(auVar305);
      auVar183 = vcmpps_avx(auVar37,auVar183,5);
      fVar247 = auVar186._0_4_;
      fVar264 = auVar186._4_4_;
      auVar74._4_4_ = auVar305._4_4_ * fVar264;
      auVar74._0_4_ = auVar305._0_4_ * fVar247;
      fVar266 = auVar186._8_4_;
      auVar74._8_4_ = auVar305._8_4_ * fVar266;
      fVar268 = auVar186._12_4_;
      auVar74._12_4_ = auVar305._12_4_ * fVar268;
      fVar270 = auVar186._16_4_;
      auVar74._16_4_ = auVar305._16_4_ * fVar270;
      fVar272 = auVar186._20_4_;
      auVar74._20_4_ = auVar305._20_4_ * fVar272;
      fVar274 = auVar186._24_4_;
      auVar74._24_4_ = auVar305._24_4_ * fVar274;
      auVar74._28_4_ = auVar37._28_4_;
      auVar184._8_4_ = 0x3f800000;
      auVar184._0_8_ = &DAT_3f8000003f800000;
      auVar184._12_4_ = 0x3f800000;
      auVar184._16_4_ = 0x3f800000;
      auVar184._20_4_ = 0x3f800000;
      auVar184._24_4_ = 0x3f800000;
      auVar184._28_4_ = 0x3f800000;
      auVar37 = vsubps_avx(auVar184,auVar74);
      fVar247 = fVar247 + fVar247 * auVar37._0_4_;
      fVar264 = fVar264 + fVar264 * auVar37._4_4_;
      fVar266 = fVar266 + fVar266 * auVar37._8_4_;
      fVar268 = fVar268 + fVar268 * auVar37._12_4_;
      fVar270 = fVar270 + fVar270 * auVar37._16_4_;
      fVar272 = fVar272 + fVar272 * auVar37._20_4_;
      fVar274 = fVar274 + fVar274 * auVar37._24_4_;
      auVar306._0_8_ = CONCAT44(fVar417,fVar409) ^ 0x8000000080000000;
      auVar306._8_4_ = -local_580._8_4_;
      auVar306._12_4_ = -local_580._12_4_;
      auVar306._16_4_ = -local_580._16_4_;
      auVar306._20_4_ = -local_580._20_4_;
      auVar306._24_4_ = -local_580._24_4_;
      auVar306._28_4_ = -local_580._28_4_;
      auVar38 = vsubps_avx(auVar306,auVar352);
      fVar409 = auVar38._0_4_ * fVar247;
      fVar417 = auVar38._4_4_ * fVar264;
      auVar75._4_4_ = fVar417;
      auVar75._0_4_ = fVar409;
      fVar313 = auVar38._8_4_ * fVar266;
      auVar75._8_4_ = fVar313;
      fVar315 = auVar38._12_4_ * fVar268;
      auVar75._12_4_ = fVar315;
      fVar317 = auVar38._16_4_ * fVar270;
      auVar75._16_4_ = fVar317;
      fVar321 = auVar38._20_4_ * fVar272;
      auVar75._20_4_ = fVar321;
      fVar325 = auVar38._24_4_ * fVar274;
      auVar75._24_4_ = fVar325;
      auVar75._28_4_ = auVar38._28_4_;
      auVar352 = vsubps_avx(auVar352,local_580);
      fVar247 = auVar352._0_4_ * fVar247;
      fVar264 = auVar352._4_4_ * fVar264;
      auVar76._4_4_ = fVar264;
      auVar76._0_4_ = fVar247;
      fVar266 = auVar352._8_4_ * fVar266;
      auVar76._8_4_ = fVar266;
      fVar268 = auVar352._12_4_ * fVar268;
      auVar76._12_4_ = fVar268;
      fVar270 = auVar352._16_4_ * fVar270;
      auVar76._16_4_ = fVar270;
      fVar272 = auVar352._20_4_ * fVar272;
      auVar76._20_4_ = fVar272;
      fVar274 = auVar352._24_4_ * fVar274;
      auVar76._24_4_ = fVar274;
      auVar76._28_4_ = auVar352._28_4_;
      fStack_4c4 = local_6e0._28_4_ + auVar186._28_4_ + auVar37._28_4_;
      local_4e0[0] = fVar243 * (local_6e0._0_4_ + fVar343 * fVar409);
      local_4e0[1] = fVar271 * (local_6e0._4_4_ + fVar357 * fVar417);
      local_4e0[2] = fVar298 * (local_6e0._8_4_ + fVar359 * fVar313);
      local_4e0[3] = fVar338 * (local_6e0._12_4_ + fVar361 * fVar315);
      fStack_4d0 = fVar362 * (local_6e0._16_4_ + fVar363 * fVar317);
      fStack_4cc = fVar423 * (local_6e0._20_4_ + fVar365 * fVar321);
      fStack_4c8 = fVar299 * (local_6e0._24_4_ + fVar367 * fVar325);
      local_a80._4_4_ = fVar357;
      local_a80._0_4_ = fVar343;
      fStack_a78 = fVar359;
      fStack_a74 = fVar361;
      fStack_a70 = fVar363;
      fStack_a6c = fVar365;
      fStack_a68 = fVar367;
      fStack_a64 = fVar369;
      local_500[0] = fVar243 * (local_6e0._0_4_ + fVar343 * fVar247);
      local_500[1] = fVar271 * (local_6e0._4_4_ + fVar357 * fVar264);
      local_500[2] = fVar298 * (local_6e0._8_4_ + fVar359 * fVar266);
      local_500[3] = fVar338 * (local_6e0._12_4_ + fVar361 * fVar268);
      fStack_4f0 = fVar362 * (local_6e0._16_4_ + fVar363 * fVar270);
      fStack_4ec = fVar423 * (local_6e0._20_4_ + fVar365 * fVar272);
      fStack_4e8 = fVar299 * (local_6e0._24_4_ + fVar367 * fVar274);
      fStack_4e4 = local_6e0._28_4_ + fStack_4c4;
      auVar259._8_4_ = 0x7f800000;
      auVar259._0_8_ = 0x7f8000007f800000;
      auVar259._12_4_ = 0x7f800000;
      auVar259._16_4_ = 0x7f800000;
      auVar259._20_4_ = 0x7f800000;
      auVar259._24_4_ = 0x7f800000;
      auVar259._28_4_ = 0x7f800000;
      auVar258 = vblendvps_avx(auVar259,auVar75,auVar183);
      auVar333._8_4_ = 0x7fffffff;
      auVar333._0_8_ = 0x7fffffff7fffffff;
      auVar333._12_4_ = 0x7fffffff;
      auVar333._16_4_ = 0x7fffffff;
      auVar333._20_4_ = 0x7fffffff;
      auVar333._24_4_ = 0x7fffffff;
      auVar333._28_4_ = 0x7fffffff;
      auVar37 = vandps_avx(local_5c0,auVar333);
      auVar37 = vmaxps_avx(local_400,auVar37);
      auVar77._4_4_ = auVar37._4_4_ * 1.9073486e-06;
      auVar77._0_4_ = auVar37._0_4_ * 1.9073486e-06;
      auVar77._8_4_ = auVar37._8_4_ * 1.9073486e-06;
      auVar77._12_4_ = auVar37._12_4_ * 1.9073486e-06;
      auVar77._16_4_ = auVar37._16_4_ * 1.9073486e-06;
      auVar77._20_4_ = auVar37._20_4_ * 1.9073486e-06;
      auVar77._24_4_ = auVar37._24_4_ * 1.9073486e-06;
      auVar77._28_4_ = auVar37._28_4_;
      auVar37 = vandps_avx(_local_6c0,auVar333);
      auVar37 = vcmpps_avx(auVar37,auVar77,1);
      auVar389 = ZEXT3264(auVar37);
      auVar307._8_4_ = 0xff800000;
      auVar307._0_8_ = 0xff800000ff800000;
      auVar307._12_4_ = 0xff800000;
      auVar307._16_4_ = 0xff800000;
      auVar307._20_4_ = 0xff800000;
      auVar307._24_4_ = 0xff800000;
      auVar307._28_4_ = 0xff800000;
      _local_4a0 = vblendvps_avx(auVar307,auVar76,auVar183);
      auVar186 = auVar183 & auVar37;
      fVar409 = local_6e0._28_4_;
      if ((((((((auVar186 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar186 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar186 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar186 >> 0x7f,0) != '\0') ||
            (auVar186 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar186 >> 0xbf,0) != '\0') ||
          (auVar186 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar186[0x1f] < '\0') {
        auVar147 = vandps_avx(auVar37,auVar183);
        auVar170 = vpackssdw_avx(auVar147._0_16_,auVar147._16_16_);
        auVar37 = vcmpps_avx(auVar36,ZEXT832(0) << 0x20,2);
        auVar443._8_4_ = 0xff800000;
        auVar443._0_8_ = 0xff800000ff800000;
        auVar443._12_4_ = 0xff800000;
        auVar443._16_4_ = 0xff800000;
        auVar443._20_4_ = 0xff800000;
        auVar443._24_4_ = 0xff800000;
        auVar443._28_4_ = 0xff800000;
        auVar354._8_4_ = 0x7f800000;
        auVar354._0_8_ = 0x7f8000007f800000;
        auVar354._12_4_ = 0x7f800000;
        auVar354._16_4_ = 0x7f800000;
        auVar354._20_4_ = 0x7f800000;
        auVar354._24_4_ = 0x7f800000;
        auVar354._28_4_ = 0x7f800000;
        auVar36 = vblendvps_avx(auVar354,auVar443,auVar37);
        auVar132 = vpmovsxwd_avx(auVar170);
        auVar389 = ZEXT1664(auVar132);
        auVar170 = vpunpckhwd_avx(auVar170,auVar170);
        auVar291._16_16_ = auVar170;
        auVar291._0_16_ = auVar132;
        auVar258 = vblendvps_avx(auVar258,auVar36,auVar291);
        auVar36 = vblendvps_avx(auVar443,auVar354,auVar37);
        _local_4a0 = vblendvps_avx(_local_4a0,auVar36,auVar291);
        auVar36 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
        auVar151._0_4_ = auVar147._0_4_ ^ auVar36._0_4_;
        auVar151._4_4_ = auVar147._4_4_ ^ auVar36._4_4_;
        auVar151._8_4_ = auVar147._8_4_ ^ auVar36._8_4_;
        auVar151._12_4_ = auVar147._12_4_ ^ auVar36._12_4_;
        auVar151._16_4_ = auVar147._16_4_ ^ auVar36._16_4_;
        auVar151._20_4_ = auVar147._20_4_ ^ auVar36._20_4_;
        auVar151._24_4_ = auVar147._24_4_ ^ auVar36._24_4_;
        auVar151._28_4_ = auVar147._28_4_ ^ auVar36._28_4_;
        auVar147 = vorps_avx(auVar37,auVar151);
        auVar147 = vandps_avx(auVar183,auVar147);
      }
    }
    auVar36 = local_280 & auVar147;
    auVar282._8_4_ = 0x3f800000;
    auVar282._0_8_ = &DAT_3f8000003f800000;
    auVar282._12_4_ = 0x3f800000;
    auVar282._16_4_ = 0x3f800000;
    auVar282._20_4_ = 0x3f800000;
    auVar282._24_4_ = 0x3f800000;
    auVar282._28_4_ = 0x3f800000;
    if ((((((((auVar36 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar36 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar36 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar36 >> 0x7f,0) == '\0') &&
          (auVar36 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar36 >> 0xbf,0) == '\0') &&
        (auVar36 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar36[0x1f]) {
LAB_01212dcf:
      auVar310 = ZEXT3264(local_820);
      auVar415 = ZEXT3264(_local_4a0);
      auVar292 = ZEXT3264(auVar282);
      auVar335 = ZEXT1664(ZEXT816(0) << 0x40);
    }
    else {
      local_a80._4_4_ = fVar357;
      local_a80._0_4_ = fVar343;
      fStack_a78 = fVar359;
      fStack_a74 = fVar361;
      fStack_a70 = fVar363;
      fStack_a6c = fVar365;
      fStack_a68 = fVar367;
      fStack_a64 = fVar369;
      auVar170 = ZEXT416((uint)((ray->super_RayK<1>).org.field_0.m128[3] - (float)local_7a0._0_4_));
      auVar170 = vshufps_avx(auVar170,auVar170,0);
      auVar283._16_16_ = auVar170;
      auVar283._0_16_ = auVar170;
      auVar37 = vmaxps_avx(auVar283,auVar258);
      auVar170 = ZEXT416((uint)((ray->super_RayK<1>).tfar - (float)local_7a0._0_4_));
      auVar170 = vshufps_avx(auVar170,auVar170,0);
      auVar284._16_16_ = auVar170;
      auVar284._0_16_ = auVar170;
      auVar183 = vminps_avx(auVar284,_local_4a0);
      fVar270 = auVar182._28_4_;
      auVar220._0_4_ = local_520 * fVar300 + local_540 * fVar408 + fVar424 * local_620;
      auVar220._4_4_ = fStack_51c * fVar311 + fStack_53c * fVar416 + fVar428 * fStack_61c;
      auVar220._8_4_ = fStack_518 * fVar312 + fStack_538 * fVar418 + fVar430 * fStack_618;
      auVar220._12_4_ = fStack_514 * fVar314 + fStack_534 * fVar419 + fVar432 * fStack_614;
      auVar220._16_4_ = fStack_510 * fVar316 + fStack_530 * fVar420 + fVar434 * fStack_610;
      auVar220._20_4_ = fStack_50c * fVar320 + fStack_52c * fVar421 + fVar436 * fStack_60c;
      auVar220._24_4_ = fStack_508 * fVar324 + fStack_528 * fVar422 + fVar438 * fStack_608;
      auVar220._28_4_ = fVar326 + fStack_184 + fVar270;
      auVar182 = vrcpps_avx(auVar220);
      fVar326 = auVar182._0_4_;
      fVar369 = auVar182._4_4_;
      auVar78._4_4_ = auVar220._4_4_ * fVar369;
      auVar78._0_4_ = auVar220._0_4_ * fVar326;
      fVar417 = auVar182._8_4_;
      auVar78._8_4_ = auVar220._8_4_ * fVar417;
      fVar247 = auVar182._12_4_;
      auVar78._12_4_ = auVar220._12_4_ * fVar247;
      fVar264 = auVar182._16_4_;
      auVar78._16_4_ = auVar220._16_4_ * fVar264;
      fVar266 = auVar182._20_4_;
      auVar78._20_4_ = auVar220._20_4_ * fVar266;
      fVar268 = auVar182._24_4_;
      auVar78._24_4_ = auVar220._24_4_ * fVar268;
      auVar78._28_4_ = fStack_184;
      auVar36 = vsubps_avx(auVar282,auVar78);
      auVar334._8_4_ = 0x7fffffff;
      auVar334._0_8_ = 0x7fffffff7fffffff;
      auVar334._12_4_ = 0x7fffffff;
      auVar334._16_4_ = 0x7fffffff;
      auVar334._20_4_ = 0x7fffffff;
      auVar334._24_4_ = 0x7fffffff;
      auVar334._28_4_ = 0x7fffffff;
      auVar182 = vandps_avx(auVar220,auVar334);
      auVar376._8_4_ = 0x219392ef;
      auVar376._0_8_ = 0x219392ef219392ef;
      auVar376._12_4_ = 0x219392ef;
      auVar376._16_4_ = 0x219392ef;
      auVar376._20_4_ = 0x219392ef;
      auVar376._24_4_ = 0x219392ef;
      auVar376._28_4_ = 0x219392ef;
      auVar377 = ZEXT3264(auVar376);
      auVar182 = vcmpps_avx(auVar182,auVar376,1);
      auVar415 = ZEXT3264(CONCAT428(0x80000000,
                                    CONCAT424(0x80000000,
                                              CONCAT420(0x80000000,
                                                        CONCAT416(0x80000000,
                                                                  CONCAT412(0x80000000,
                                                                            CONCAT48(0x80000000,
                                                                                                                                                                          
                                                  0x8000000080000000)))))));
      auVar79._4_4_ =
           (fVar369 + fVar369 * auVar36._4_4_) *
           -(fVar401 * fVar311 + fVar416 * fVar269 + fVar428 * fVar267);
      auVar79._0_4_ =
           (fVar326 + fVar326 * auVar36._0_4_) *
           -(fVar390 * fVar300 + fVar408 * fVar127 + fVar424 * fVar242);
      auVar79._8_4_ =
           (fVar417 + fVar417 * auVar36._8_4_) *
           -(fVar402 * fVar312 + fVar418 * fVar297 + fVar430 * fVar296);
      auVar79._12_4_ =
           (fVar247 + fVar247 * auVar36._12_4_) *
           -(fVar403 * fVar314 + fVar419 * fVar337 + fVar432 * fVar336);
      auVar79._16_4_ =
           (fVar264 + fVar264 * auVar36._16_4_) *
           -(fVar404 * fVar316 + fVar420 * fVar360 + fVar434 * fVar358);
      auVar79._20_4_ =
           (fVar266 + fVar266 * auVar36._20_4_) *
           -(fVar405 * fVar320 + fVar421 * fVar40 + fVar436 * fVar407);
      auVar79._24_4_ =
           (fVar268 + fVar268 * auVar36._24_4_) *
           -(fVar406 * fVar324 + fVar422 * fVar47 + fVar438 * fVar46);
      auVar79._28_4_ = -(fVar270 + fVar409 + fVar270);
      auVar352 = ZEXT1232(ZEXT812(0)) << 0x20;
      auVar36 = vcmpps_avx(auVar220,auVar352,1);
      auVar186 = vorps_avx(auVar182,auVar36);
      auVar36 = vcmpps_avx(auVar220,auVar352,6);
      auVar36 = vorps_avx(auVar182,auVar36);
      auVar398._8_4_ = 0xff800000;
      auVar398._0_8_ = 0xff800000ff800000;
      auVar398._12_4_ = 0xff800000;
      auVar398._16_4_ = 0xff800000;
      auVar398._20_4_ = 0xff800000;
      auVar398._24_4_ = 0xff800000;
      auVar398._28_4_ = 0xff800000;
      auVar400 = ZEXT3264(auVar398);
      auVar182 = vblendvps_avx(auVar79,auVar398,auVar186);
      auVar442._8_4_ = 0x7f800000;
      auVar442._0_8_ = 0x7f8000007f800000;
      auVar442._12_4_ = 0x7f800000;
      auVar442._16_4_ = 0x7f800000;
      auVar442._20_4_ = 0x7f800000;
      auVar442._24_4_ = 0x7f800000;
      auVar442._28_4_ = 0x7f800000;
      auVar36 = vblendvps_avx(auVar79,auVar442,auVar36);
      auVar37 = vmaxps_avx(auVar37,auVar182);
      auVar183 = vminps_avx(auVar183,auVar36);
      auVar186 = ZEXT1232(ZEXT812(0)) << 0x20;
      auVar182 = vsubps_avx(auVar186,_local_880);
      auVar36 = vsubps_avx(auVar186,_local_8a0);
      auVar80._4_4_ = auVar36._4_4_ * -fVar429;
      auVar80._0_4_ = auVar36._0_4_ * -fVar425;
      auVar80._8_4_ = auVar36._8_4_ * -fVar431;
      auVar80._12_4_ = auVar36._12_4_ * -fVar433;
      auVar80._16_4_ = auVar36._16_4_ * -fVar435;
      auVar80._20_4_ = auVar36._20_4_ * -fVar437;
      auVar80._24_4_ = auVar36._24_4_ * -fVar439;
      auVar80._28_4_ = auVar36._28_4_;
      auVar81._4_4_ = fVar263 * auVar182._4_4_;
      auVar81._0_4_ = fVar225 * auVar182._0_4_;
      auVar81._8_4_ = fVar294 * auVar182._8_4_;
      auVar81._12_4_ = fVar323 * auVar182._12_4_;
      auVar81._16_4_ = fVar342 * auVar182._16_4_;
      auVar81._20_4_ = fVar379 * auVar182._20_4_;
      auVar81._24_4_ = fVar44 * auVar182._24_4_;
      auVar81._28_4_ = auVar182._28_4_;
      auVar182 = vsubps_avx(auVar80,auVar81);
      auVar36 = vsubps_avx(auVar186,local_960);
      auVar82._4_4_ = fVar265 * auVar36._4_4_;
      auVar82._0_4_ = fVar205 * auVar36._0_4_;
      auVar82._8_4_ = fVar295 * auVar36._8_4_;
      auVar82._12_4_ = fVar327 * auVar36._12_4_;
      auVar82._16_4_ = fVar356 * auVar36._16_4_;
      auVar82._20_4_ = fVar380 * auVar36._20_4_;
      uVar8 = auVar36._28_4_;
      auVar82._24_4_ = fVar45 * auVar36._24_4_;
      auVar82._28_4_ = uVar8;
      auVar186 = vsubps_avx(auVar182,auVar82);
      auVar83._4_4_ = -fVar429 * fStack_61c;
      auVar83._0_4_ = -fVar425 * local_620;
      auVar83._8_4_ = -fVar431 * fStack_618;
      auVar83._12_4_ = -fVar433 * fStack_614;
      auVar83._16_4_ = -fVar435 * fStack_610;
      auVar83._20_4_ = -fVar437 * fStack_60c;
      auVar83._24_4_ = -fVar439 * fStack_608;
      auVar83._28_4_ = uVar117 ^ 0x80000000;
      auVar84._4_4_ = fStack_53c * fVar263;
      auVar84._0_4_ = local_540 * fVar225;
      auVar84._8_4_ = fStack_538 * fVar294;
      auVar84._12_4_ = fStack_534 * fVar323;
      auVar84._16_4_ = fStack_530 * fVar342;
      auVar84._20_4_ = fStack_52c * fVar379;
      auVar84._24_4_ = fStack_528 * fVar44;
      auVar84._28_4_ = uVar8;
      auVar387._8_4_ = 0x3f800000;
      auVar387._0_8_ = &DAT_3f8000003f800000;
      auVar387._12_4_ = 0x3f800000;
      auVar387._16_4_ = 0x3f800000;
      auVar387._20_4_ = 0x3f800000;
      auVar387._24_4_ = 0x3f800000;
      auVar387._28_4_ = 0x3f800000;
      auVar389 = ZEXT3264(auVar387);
      auVar182 = vsubps_avx(auVar83,auVar84);
      auVar85._4_4_ = fStack_51c * fVar265;
      auVar85._0_4_ = local_520 * fVar205;
      auVar85._8_4_ = fStack_518 * fVar295;
      auVar85._12_4_ = fStack_514 * fVar327;
      auVar85._16_4_ = fStack_510 * fVar356;
      auVar85._20_4_ = fStack_50c * fVar380;
      auVar85._24_4_ = fStack_508 * fVar45;
      auVar85._28_4_ = uVar8;
      auVar352 = vsubps_avx(auVar182,auVar85);
      auVar182 = vrcpps_avx(auVar352);
      fVar225 = auVar182._0_4_;
      fVar205 = auVar182._4_4_;
      auVar86._4_4_ = auVar352._4_4_ * fVar205;
      auVar86._0_4_ = auVar352._0_4_ * fVar225;
      fVar242 = auVar182._8_4_;
      auVar86._8_4_ = auVar352._8_4_ * fVar242;
      fVar127 = auVar182._12_4_;
      auVar86._12_4_ = auVar352._12_4_ * fVar127;
      fVar263 = auVar182._16_4_;
      auVar86._16_4_ = auVar352._16_4_ * fVar263;
      fVar265 = auVar182._20_4_;
      auVar86._20_4_ = auVar352._20_4_ * fVar265;
      fVar267 = auVar182._24_4_;
      auVar86._24_4_ = auVar352._24_4_ * fVar267;
      auVar86._28_4_ = local_a00._28_4_;
      auVar38 = vsubps_avx(auVar387,auVar86);
      auVar182 = vandps_avx(auVar352,auVar334);
      auVar36 = vcmpps_avx(auVar182,auVar376,1);
      auVar87._4_4_ = (fVar205 + fVar205 * auVar38._4_4_) * -auVar186._4_4_;
      auVar87._0_4_ = (fVar225 + fVar225 * auVar38._0_4_) * -auVar186._0_4_;
      auVar87._8_4_ = (fVar242 + fVar242 * auVar38._8_4_) * -auVar186._8_4_;
      auVar87._12_4_ = (fVar127 + fVar127 * auVar38._12_4_) * -auVar186._12_4_;
      auVar87._16_4_ = (fVar263 + fVar263 * auVar38._16_4_) * -auVar186._16_4_;
      auVar87._20_4_ = (fVar265 + fVar265 * auVar38._20_4_) * -auVar186._20_4_;
      auVar87._24_4_ = (fVar267 + fVar267 * auVar38._24_4_) * -auVar186._24_4_;
      auVar87._28_4_ = auVar186._28_4_ ^ 0x80000000;
      auVar182 = vcmpps_avx(auVar352,ZEXT832(0) << 0x20,1);
      auVar182 = vorps_avx(auVar36,auVar182);
      auVar182 = vblendvps_avx(auVar87,auVar398,auVar182);
      local_420 = vmaxps_avx(auVar37,auVar182);
      auVar182 = vcmpps_avx(auVar352,ZEXT832(0) << 0x20,6);
      auVar182 = vorps_avx(auVar36,auVar182);
      auVar182 = vblendvps_avx(auVar87,auVar442,auVar182);
      auVar147 = vandps_avx(local_280,auVar147);
      local_480 = vminps_avx(auVar183,auVar182);
      auVar182 = vcmpps_avx(local_420,local_480,2);
      auVar36 = auVar147 & auVar182;
      if ((((((((auVar36 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar36 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar36 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar36 >> 0x7f,0) == '\0') &&
            (auVar36 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar36 >> 0xbf,0) == '\0') &&
          (auVar36 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar36[0x1f])
      {
        auVar292 = ZEXT3264(auVar387);
        auVar335 = ZEXT864(0) << 0x20;
        auVar310 = ZEXT3264(local_820);
      }
      else {
        auVar36 = vminps_avx(local_800,_local_740);
        auVar37 = vminps_avx(local_700,local_720);
        auVar36 = vminps_avx(auVar36,auVar37);
        auVar36 = vsubps_avx(auVar36,_local_660);
        auVar147 = vandps_avx(auVar182,auVar147);
        auVar116._4_4_ = local_4e0[1];
        auVar116._0_4_ = local_4e0[0];
        auVar116._8_4_ = local_4e0[2];
        auVar116._12_4_ = local_4e0[3];
        auVar116._16_4_ = fStack_4d0;
        auVar116._20_4_ = fStack_4cc;
        auVar116._24_4_ = fStack_4c8;
        auVar116._28_4_ = fStack_4c4;
        auVar182 = vminps_avx(auVar116,auVar387);
        auVar182 = vmaxps_avx(auVar182,ZEXT832(0) << 0x20);
        local_4e0[0] = fVar126 + fVar164 * (auVar182._0_4_ + 0.0) * 0.125;
        local_4e0[1] = fVar154 + fVar199 * (auVar182._4_4_ + 1.0) * 0.125;
        local_4e0[2] = fVar156 + fVar201 * (auVar182._8_4_ + 2.0) * 0.125;
        local_4e0[3] = fVar158 + fVar203 * (auVar182._12_4_ + 3.0) * 0.125;
        fStack_4d0 = fVar126 + fVar164 * (auVar182._16_4_ + 4.0) * 0.125;
        fStack_4cc = fVar154 + fVar199 * (auVar182._20_4_ + 5.0) * 0.125;
        fStack_4c8 = fVar156 + fVar201 * (auVar182._24_4_ + 6.0) * 0.125;
        fStack_4c4 = fVar158 + auVar182._28_4_ + 7.0;
        auVar115._4_4_ = local_500[1];
        auVar115._0_4_ = local_500[0];
        auVar115._8_4_ = local_500[2];
        auVar115._12_4_ = local_500[3];
        auVar115._16_4_ = fStack_4f0;
        auVar115._20_4_ = fStack_4ec;
        auVar115._24_4_ = fStack_4e8;
        auVar115._28_4_ = fStack_4e4;
        auVar182 = vminps_avx(auVar115,auVar387);
        auVar182 = vmaxps_avx(auVar182,ZEXT832(0) << 0x20);
        local_500[0] = fVar126 + fVar164 * (auVar182._0_4_ + 0.0) * 0.125;
        local_500[1] = fVar154 + fVar199 * (auVar182._4_4_ + 1.0) * 0.125;
        local_500[2] = fVar156 + fVar201 * (auVar182._8_4_ + 2.0) * 0.125;
        local_500[3] = fVar158 + fVar203 * (auVar182._12_4_ + 3.0) * 0.125;
        fStack_4f0 = fVar126 + fVar164 * (auVar182._16_4_ + 4.0) * 0.125;
        fStack_4ec = fVar154 + fVar199 * (auVar182._20_4_ + 5.0) * 0.125;
        fStack_4e8 = fVar156 + fVar201 * (auVar182._24_4_ + 6.0) * 0.125;
        fStack_4e4 = fVar158 + auVar182._28_4_ + 7.0;
        auVar89._4_4_ = auVar36._4_4_ * 0.99999976;
        auVar89._0_4_ = auVar36._0_4_ * 0.99999976;
        auVar89._8_4_ = auVar36._8_4_ * 0.99999976;
        auVar89._12_4_ = auVar36._12_4_ * 0.99999976;
        auVar89._16_4_ = auVar36._16_4_ * 0.99999976;
        auVar89._20_4_ = auVar36._20_4_ * 0.99999976;
        auVar89._24_4_ = auVar36._24_4_ * 0.99999976;
        auVar89._28_4_ = 0x3f7ffffc;
        auVar182 = vmaxps_avx(ZEXT832(0) << 0x20,auVar89);
        auVar90._4_4_ = auVar182._4_4_ * auVar182._4_4_;
        auVar90._0_4_ = auVar182._0_4_ * auVar182._0_4_;
        auVar90._8_4_ = auVar182._8_4_ * auVar182._8_4_;
        auVar90._12_4_ = auVar182._12_4_ * auVar182._12_4_;
        auVar90._16_4_ = auVar182._16_4_ * auVar182._16_4_;
        auVar90._20_4_ = auVar182._20_4_ * auVar182._20_4_;
        auVar90._24_4_ = auVar182._24_4_ * auVar182._24_4_;
        auVar90._28_4_ = auVar182._28_4_;
        auVar36 = vsubps_avx(local_760,auVar90);
        auVar91._4_4_ = auVar36._4_4_ * (float)local_780._4_4_;
        auVar91._0_4_ = auVar36._0_4_ * (float)local_780._0_4_;
        auVar91._8_4_ = auVar36._8_4_ * fStack_778;
        auVar91._12_4_ = auVar36._12_4_ * fStack_774;
        auVar91._16_4_ = auVar36._16_4_ * fStack_770;
        auVar91._20_4_ = auVar36._20_4_ * fStack_76c;
        auVar91._24_4_ = auVar36._24_4_ * fStack_768;
        auVar91._28_4_ = auVar182._28_4_;
        auVar37 = vsubps_avx(local_640,auVar91);
        auVar182 = vcmpps_avx(auVar37,ZEXT832(0) << 0x20,5);
        fVar225 = local_820._28_4_;
        if ((((((((auVar182 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar182 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar182 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar182 >> 0x7f,0) == '\0') &&
              (auVar182 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar182 >> 0xbf,0) == '\0') &&
            (auVar182 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar182[0x1f]) {
          auVar186 = SUB6432(ZEXT864(0),0) << 0x20;
          _local_660 = ZEXT832(0) << 0x20;
          _local_6a0 = ZEXT832(0) << 0x20;
          _local_680 = ZEXT832(0) << 0x20;
          auVar233 = ZEXT1228(ZEXT812(0)) << 0x20;
          auVar377 = ZEXT864(0) << 0x20;
          auVar260._8_4_ = 0x7f800000;
          auVar260._0_8_ = 0x7f8000007f800000;
          auVar260._12_4_ = 0x7f800000;
          auVar260._16_4_ = 0x7f800000;
          auVar260._20_4_ = 0x7f800000;
          auVar260._24_4_ = 0x7f800000;
          auVar260._28_4_ = 0x7f800000;
          auVar285._8_4_ = 0xff800000;
          auVar285._0_8_ = 0xff800000ff800000;
          auVar285._12_4_ = 0xff800000;
          auVar285._16_4_ = 0xff800000;
          auVar285._20_4_ = 0xff800000;
          auVar285._24_4_ = 0xff800000;
          auVar285._28_4_ = 0xff800000;
        }
        else {
          local_960 = auVar36;
          local_8c0 = auVar182;
          _local_880 = auVar147;
          auVar186 = vsqrtps_avx(auVar37);
          auVar239._0_4_ = fVar155 + fVar155;
          auVar239._4_4_ = fVar157 + fVar157;
          auVar239._8_4_ = fVar159 + fVar159;
          auVar239._12_4_ = fVar160 + fVar160;
          auVar239._16_4_ = fVar162 + fVar162;
          auVar239._20_4_ = fVar163 + fVar163;
          auVar239._24_4_ = fVar378 + fVar378;
          auVar239._28_4_ = fVar226 + fVar226;
          auVar183 = vrcpps_avx(auVar239);
          fVar226 = auVar183._0_4_;
          fVar205 = auVar183._4_4_;
          auVar92._4_4_ = auVar239._4_4_ * fVar205;
          auVar92._0_4_ = auVar239._0_4_ * fVar226;
          fVar242 = auVar183._8_4_;
          auVar92._8_4_ = auVar239._8_4_ * fVar242;
          fVar127 = auVar183._12_4_;
          auVar92._12_4_ = auVar239._12_4_ * fVar127;
          fVar263 = auVar183._16_4_;
          auVar92._16_4_ = auVar239._16_4_ * fVar263;
          fVar265 = auVar183._20_4_;
          auVar92._20_4_ = auVar239._20_4_ * fVar265;
          fVar267 = auVar183._24_4_;
          auVar92._24_4_ = auVar239._24_4_ * fVar267;
          auVar92._28_4_ = auVar239._28_4_;
          auVar352 = vsubps_avx(auVar387,auVar92);
          fVar226 = fVar226 + fVar226 * auVar352._0_4_;
          fVar205 = fVar205 + fVar205 * auVar352._4_4_;
          fVar242 = fVar242 + fVar242 * auVar352._8_4_;
          fVar127 = fVar127 + fVar127 * auVar352._12_4_;
          fVar263 = fVar263 + fVar263 * auVar352._16_4_;
          fVar265 = fVar265 + fVar265 * auVar352._20_4_;
          fVar267 = fVar267 + fVar267 * auVar352._24_4_;
          fVar269 = auVar183._28_4_ + auVar352._28_4_;
          auVar286._0_8_ = local_580._0_8_ ^ 0x8000000080000000;
          auVar286._8_4_ = -local_580._8_4_;
          auVar286._12_4_ = -local_580._12_4_;
          auVar286._16_4_ = -local_580._16_4_;
          auVar286._20_4_ = -local_580._20_4_;
          auVar286._24_4_ = -local_580._24_4_;
          auVar286._28_4_ = -local_580._28_4_;
          auVar183 = vsubps_avx(auVar286,auVar186);
          fVar337 = auVar183._0_4_ * fVar226;
          fVar342 = auVar183._4_4_ * fVar205;
          auVar93._4_4_ = fVar342;
          auVar93._0_4_ = fVar337;
          fVar356 = auVar183._8_4_ * fVar242;
          auVar93._8_4_ = fVar356;
          fVar358 = auVar183._12_4_ * fVar127;
          auVar93._12_4_ = fVar358;
          fVar360 = auVar183._16_4_ * fVar263;
          auVar93._16_4_ = fVar360;
          fVar379 = auVar183._20_4_ * fVar265;
          auVar93._20_4_ = fVar379;
          fVar380 = auVar183._24_4_ * fVar267;
          auVar93._24_4_ = fVar380;
          auVar93._28_4_ = local_280._28_4_;
          auVar186 = vsubps_avx(auVar186,local_580);
          fVar226 = auVar186._0_4_ * fVar226;
          fVar205 = auVar186._4_4_ * fVar205;
          auVar94._4_4_ = fVar205;
          auVar94._0_4_ = fVar226;
          fVar242 = auVar186._8_4_ * fVar242;
          auVar94._8_4_ = fVar242;
          fVar127 = auVar186._12_4_ * fVar127;
          auVar94._12_4_ = fVar127;
          fVar263 = auVar186._16_4_ * fVar263;
          auVar94._16_4_ = fVar263;
          fVar265 = auVar186._20_4_ * fVar265;
          auVar94._20_4_ = fVar265;
          fVar267 = auVar186._24_4_ * fVar267;
          auVar94._24_4_ = fVar267;
          auVar94._28_4_ = 0x80000000;
          fVar294 = fVar243 * (fVar337 * fVar343 + local_6e0._0_4_);
          fVar295 = fVar271 * (fVar342 * fVar357 + local_6e0._4_4_);
          fVar296 = fVar298 * (fVar356 * fVar359 + local_6e0._8_4_);
          fVar297 = fVar338 * (fVar358 * fVar361 + local_6e0._12_4_);
          fVar323 = fVar362 * (fVar360 * fVar363 + local_6e0._16_4_);
          fVar327 = fVar423 * (fVar379 * fVar365 + local_6e0._20_4_);
          fVar336 = fVar299 * (fVar380 * fVar367 + local_6e0._24_4_);
          auVar187._0_4_ = local_a60 + fVar204 * fVar294;
          auVar187._4_4_ = fStack_a5c + fVar246 * fVar295;
          auVar187._8_4_ = fStack_a58 + fVar293 * fVar296;
          auVar187._12_4_ = fStack_a54 + fVar322 * fVar297;
          auVar187._16_4_ = fStack_a50 + fVar341 * fVar323;
          auVar187._20_4_ = fStack_a4c + fVar368 * fVar327;
          auVar187._24_4_ = fStack_a48 + fVar43 * fVar336;
          auVar187._28_4_ = fStack_a44 + auVar186._28_4_ + local_6e0._28_4_;
          auVar95._4_4_ = fStack_51c * fVar342;
          auVar95._0_4_ = local_520 * fVar337;
          auVar95._8_4_ = fStack_518 * fVar356;
          auVar95._12_4_ = fStack_514 * fVar358;
          auVar95._16_4_ = fStack_510 * fVar360;
          auVar95._20_4_ = fStack_50c * fVar379;
          auVar95._24_4_ = fStack_508 * fVar380;
          auVar95._28_4_ = fVar269;
          auVar186 = vsubps_avx(auVar95,auVar187);
          _local_8a0 = auVar186;
          auVar240._0_4_ = local_ae0 + fVar200 * fVar294;
          auVar240._4_4_ = fStack_adc + fVar244 * fVar295;
          auVar240._8_4_ = fStack_ad8 + fVar273 * fVar296;
          auVar240._12_4_ = fStack_ad4 + fVar318 * fVar297;
          auVar240._16_4_ = fStack_ad0 + fVar339 * fVar323;
          auVar240._20_4_ = fStack_acc + fVar364 * fVar327;
          auVar240._24_4_ = fStack_ac8 + fVar41 * fVar336;
          auVar240._28_4_ = fStack_ac4 + fVar269;
          auVar96._4_4_ = fStack_53c * fVar342;
          auVar96._0_4_ = local_540 * fVar337;
          auVar96._8_4_ = fStack_538 * fVar356;
          auVar96._12_4_ = fStack_534 * fVar358;
          auVar96._16_4_ = fStack_530 * fVar360;
          auVar96._20_4_ = fStack_52c * fVar379;
          auVar96._24_4_ = fStack_528 * fVar380;
          auVar96._28_4_ = fVar225;
          local_9a0 = vsubps_avx(auVar96,auVar240);
          auVar287._0_4_ = local_ac0 + fVar241 * fVar294;
          auVar287._4_4_ = fStack_abc + fVar245 * fVar295;
          auVar287._8_4_ = fStack_ab8 + fVar275 * fVar296;
          auVar287._12_4_ = fStack_ab4 + fVar319 * fVar297;
          auVar287._16_4_ = fStack_ab0 + fVar340 * fVar323;
          auVar287._20_4_ = fStack_aac + fVar366 * fVar327;
          auVar287._24_4_ = fStack_aa8 + fVar42 * fVar336;
          auVar287._28_4_ = fStack_aa4 + auVar183._28_4_;
          auVar97._4_4_ = fStack_61c * fVar342;
          auVar97._0_4_ = local_620 * fVar337;
          auVar97._8_4_ = fStack_618 * fVar356;
          auVar97._12_4_ = fStack_614 * fVar358;
          auVar97._16_4_ = fStack_610 * fVar360;
          auVar97._20_4_ = fStack_60c * fVar379;
          auVar97._24_4_ = fStack_608 * fVar380;
          auVar97._28_4_ = fVar225;
          local_940 = vsubps_avx(auVar97,auVar287);
          fVar243 = fVar243 * (fVar226 * fVar343 + local_6e0._0_4_);
          fVar271 = fVar271 * (fVar205 * fVar357 + local_6e0._4_4_);
          fVar298 = fVar298 * (fVar242 * fVar359 + local_6e0._8_4_);
          fVar338 = fVar338 * (fVar127 * fVar361 + local_6e0._12_4_);
          fVar362 = fVar362 * (fVar263 * fVar363 + local_6e0._16_4_);
          fVar423 = fVar423 * (fVar265 * fVar365 + local_6e0._20_4_);
          fVar299 = fVar299 * (fVar267 * fVar367 + local_6e0._24_4_);
          auVar308._0_4_ = local_a60 + fVar204 * fVar243;
          auVar308._4_4_ = fStack_a5c + fVar246 * fVar271;
          auVar308._8_4_ = fStack_a58 + fVar293 * fVar298;
          auVar308._12_4_ = fStack_a54 + fVar322 * fVar338;
          auVar308._16_4_ = fStack_a50 + fVar341 * fVar362;
          auVar308._20_4_ = fStack_a4c + fVar368 * fVar423;
          auVar308._24_4_ = fStack_a48 + fVar43 * fVar299;
          auVar308._28_4_ = fStack_a44 + fVar225;
          auVar98._4_4_ = fStack_51c * fVar205;
          auVar98._0_4_ = local_520 * fVar226;
          auVar98._8_4_ = fStack_518 * fVar242;
          auVar98._12_4_ = fStack_514 * fVar127;
          auVar98._16_4_ = fStack_510 * fVar263;
          auVar98._20_4_ = fStack_50c * fVar265;
          auVar98._24_4_ = fStack_508 * fVar267;
          auVar98._28_4_ = fStack_504;
          _local_660 = vsubps_avx(auVar98,auVar308);
          auVar309._0_4_ = local_ae0 + fVar200 * fVar243;
          auVar309._4_4_ = fStack_adc + fVar244 * fVar271;
          auVar309._8_4_ = fStack_ad8 + fVar273 * fVar298;
          auVar309._12_4_ = fStack_ad4 + fVar318 * fVar338;
          auVar309._16_4_ = fStack_ad0 + fVar339 * fVar362;
          auVar309._20_4_ = fStack_acc + fVar364 * fVar423;
          auVar309._24_4_ = fStack_ac8 + fVar41 * fVar299;
          auVar309._28_4_ = fStack_ac4 + local_660._28_4_;
          auVar99._4_4_ = fStack_53c * fVar205;
          auVar99._0_4_ = local_540 * fVar226;
          auVar99._8_4_ = fStack_538 * fVar242;
          auVar99._12_4_ = fStack_534 * fVar127;
          auVar99._16_4_ = fStack_530 * fVar263;
          auVar99._20_4_ = fStack_52c * fVar265;
          auVar99._24_4_ = fStack_528 * fVar267;
          auVar99._28_4_ = fStack_504;
          _local_6a0 = vsubps_avx(auVar99,auVar309);
          auVar288._0_4_ = local_ac0 + fVar241 * fVar243;
          auVar288._4_4_ = fStack_abc + fVar245 * fVar271;
          auVar288._8_4_ = fStack_ab8 + fVar275 * fVar298;
          auVar288._12_4_ = fStack_ab4 + fVar319 * fVar338;
          auVar288._16_4_ = fStack_ab0 + fVar340 * fVar362;
          auVar288._20_4_ = fStack_aac + fVar366 * fVar423;
          auVar288._24_4_ = fStack_aa8 + fVar42 * fVar299;
          auVar288._28_4_ = fStack_aa4 + local_940._28_4_ + local_6e0._28_4_;
          auVar100._4_4_ = fStack_61c * fVar205;
          auVar100._0_4_ = local_620 * fVar226;
          auVar100._8_4_ = fStack_618 * fVar242;
          auVar100._12_4_ = fStack_614 * fVar127;
          auVar100._16_4_ = fStack_610 * fVar263;
          auVar100._20_4_ = fStack_60c * fVar265;
          auVar100._24_4_ = fStack_608 * fVar267;
          auVar100._28_4_ = local_6a0._28_4_;
          _local_680 = vsubps_avx(auVar100,auVar288);
          auVar183 = vcmpps_avx(auVar37,_DAT_02020f00,5);
          auVar261._8_4_ = 0x7f800000;
          auVar261._0_8_ = 0x7f8000007f800000;
          auVar261._12_4_ = 0x7f800000;
          auVar261._16_4_ = 0x7f800000;
          auVar261._20_4_ = 0x7f800000;
          auVar261._24_4_ = 0x7f800000;
          auVar261._28_4_ = 0x7f800000;
          auVar260 = vblendvps_avx(auVar261,auVar93,auVar183);
          auVar353._8_4_ = 0x7fffffff;
          auVar353._0_8_ = 0x7fffffff7fffffff;
          auVar353._12_4_ = 0x7fffffff;
          auVar353._16_4_ = 0x7fffffff;
          auVar353._20_4_ = 0x7fffffff;
          auVar353._24_4_ = 0x7fffffff;
          auVar353._28_4_ = 0x7fffffff;
          auVar37 = vandps_avx(auVar353,local_5c0);
          auVar37 = vmaxps_avx(local_400,auVar37);
          auVar101._4_4_ = auVar37._4_4_ * 1.9073486e-06;
          auVar101._0_4_ = auVar37._0_4_ * 1.9073486e-06;
          auVar101._8_4_ = auVar37._8_4_ * 1.9073486e-06;
          auVar101._12_4_ = auVar37._12_4_ * 1.9073486e-06;
          auVar101._16_4_ = auVar37._16_4_ * 1.9073486e-06;
          auVar101._20_4_ = auVar37._20_4_ * 1.9073486e-06;
          auVar101._24_4_ = auVar37._24_4_ * 1.9073486e-06;
          auVar101._28_4_ = auVar37._28_4_;
          auVar37 = vandps_avx(auVar353,_local_6c0);
          auVar37 = vcmpps_avx(auVar37,auVar101,1);
          auVar289._8_4_ = 0xff800000;
          auVar289._0_8_ = 0xff800000ff800000;
          auVar289._12_4_ = 0xff800000;
          auVar289._16_4_ = 0xff800000;
          auVar289._20_4_ = 0xff800000;
          auVar289._24_4_ = 0xff800000;
          auVar289._28_4_ = 0xff800000;
          auVar285 = vblendvps_avx(auVar289,auVar94,auVar183);
          auVar352 = auVar183 & auVar37;
          if ((((((((auVar352 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar352 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar352 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar352 >> 0x7f,0) != '\0') ||
                (auVar352 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar352 >> 0xbf,0) != '\0') ||
              (auVar352 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar352[0x1f] < '\0') {
            auVar182 = vandps_avx(auVar37,auVar183);
            auVar170 = vpackssdw_avx(auVar182._0_16_,auVar182._16_16_);
            auVar352 = ZEXT1232(ZEXT412(0)) << 0x20;
            auVar37 = vcmpps_avx(auVar36,auVar352,2);
            auVar444._8_4_ = 0xff800000;
            auVar444._0_8_ = 0xff800000ff800000;
            auVar444._12_4_ = 0xff800000;
            auVar444._16_4_ = 0xff800000;
            auVar444._20_4_ = 0xff800000;
            auVar444._24_4_ = 0xff800000;
            auVar444._28_4_ = 0xff800000;
            auVar446._8_4_ = 0x7f800000;
            auVar446._0_8_ = 0x7f8000007f800000;
            auVar446._12_4_ = 0x7f800000;
            auVar446._16_4_ = 0x7f800000;
            auVar446._20_4_ = 0x7f800000;
            auVar446._24_4_ = 0x7f800000;
            auVar446._28_4_ = 0x7f800000;
            auVar36 = vblendvps_avx(auVar446,auVar444,auVar37);
            auVar132 = vpmovsxwd_avx(auVar170);
            auVar170 = vpunpckhwd_avx(auVar170,auVar170);
            auVar355._16_16_ = auVar170;
            auVar355._0_16_ = auVar132;
            auVar260 = vblendvps_avx(auVar260,auVar36,auVar355);
            auVar36 = vblendvps_avx(auVar444,auVar446,auVar37);
            auVar285 = vblendvps_avx(auVar285,auVar36,auVar355);
            auVar36 = vcmpps_avx(auVar352,ZEXT1232(ZEXT412(0)) << 0x20,0xf);
            auVar152._0_4_ = auVar36._0_4_ ^ auVar182._0_4_;
            auVar152._4_4_ = auVar36._4_4_ ^ auVar182._4_4_;
            auVar152._8_4_ = auVar36._8_4_ ^ auVar182._8_4_;
            auVar152._12_4_ = auVar36._12_4_ ^ auVar182._12_4_;
            auVar152._16_4_ = auVar36._16_4_ ^ auVar182._16_4_;
            auVar152._20_4_ = auVar36._20_4_ ^ auVar182._20_4_;
            auVar152._24_4_ = auVar36._24_4_ ^ auVar182._24_4_;
            auVar152._28_4_ = auVar36._28_4_ ^ auVar182._28_4_;
            auVar182 = vorps_avx(auVar37,auVar152);
            auVar182 = vandps_avx(auVar183,auVar182);
          }
          auVar233 = local_9a0._0_28_;
          auVar377 = ZEXT3264(local_940);
        }
        fVar226 = (ray->super_RayK<1>).dir.field_0.m128[0];
        auVar388._4_4_ = fVar226;
        auVar388._0_4_ = fVar226;
        auVar388._8_4_ = fVar226;
        auVar388._12_4_ = fVar226;
        auVar388._16_4_ = fVar226;
        auVar388._20_4_ = fVar226;
        auVar388._24_4_ = fVar226;
        auVar388._28_4_ = fVar226;
        auVar389 = ZEXT3264(auVar388);
        fVar200 = (ray->super_RayK<1>).dir.field_0.m128[1];
        fVar241 = (ray->super_RayK<1>).dir.field_0.m128[2];
        auVar399._4_4_ = fVar241;
        auVar399._0_4_ = fVar241;
        auVar399._8_4_ = fVar241;
        auVar399._12_4_ = fVar241;
        auVar399._16_4_ = fVar241;
        auVar399._20_4_ = fVar241;
        auVar399._24_4_ = fVar241;
        auVar399._28_4_ = fVar241;
        auVar400 = ZEXT3264(auVar399);
        local_460 = local_420;
        local_440 = vminps_avx(local_480,auVar260);
        _local_4a0 = vmaxps_avx(local_420,auVar285);
        auVar36 = vcmpps_avx(local_420,local_440,2);
        local_560 = vandps_avx(auVar36,auVar147);
        local_5e0 = local_560;
        auVar36 = vcmpps_avx(_local_4a0,local_480,2);
        local_600 = vandps_avx(auVar36,auVar147);
        auVar147 = vorps_avx(local_600,local_560);
        if ((((((((auVar147 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar147 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar147 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar147 >> 0x7f,0) == '\0') &&
              (auVar147 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar147 >> 0xbf,0) == '\0') &&
            (auVar147 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar147[0x1f]) {
          auVar282._8_4_ = 0x3f800000;
          auVar282._0_8_ = &DAT_3f8000003f800000;
          auVar282._12_4_ = 0x3f800000;
          auVar282._16_4_ = 0x3f800000;
          auVar282._20_4_ = 0x3f800000;
          auVar282._24_4_ = 0x3f800000;
          auVar282._28_4_ = 0x3f800000;
          goto LAB_01212dcf;
        }
        _local_6c0 = _local_4a0;
        local_6e0 = local_600;
        auVar147 = vcmpps_avx(ZEXT1632(ZEXT816(0) << 0x20),ZEXT1632(ZEXT816(0) << 0x20),0xf);
        local_5c0._0_4_ = auVar182._0_4_ ^ auVar147._0_4_;
        local_5c0._4_4_ = auVar182._4_4_ ^ auVar147._4_4_;
        local_5c0._8_4_ = auVar182._8_4_ ^ auVar147._8_4_;
        local_5c0._12_4_ = auVar182._12_4_ ^ auVar147._12_4_;
        local_5c0._16_4_ = auVar182._16_4_ ^ auVar147._16_4_;
        local_5c0._20_4_ = auVar182._20_4_ ^ auVar147._20_4_;
        local_5c0._24_4_ = auVar182._24_4_ ^ auVar147._24_4_;
        local_5c0._28_4_ = (uint)auVar182._28_4_ ^ (uint)auVar147._28_4_;
        auVar415 = ZEXT3264(auVar388);
        auVar146._0_4_ =
             fVar226 * auVar186._0_4_ + fVar200 * auVar233._0_4_ + auVar377._0_4_ * fVar241;
        auVar146._4_4_ =
             fVar226 * auVar186._4_4_ + fVar200 * auVar233._4_4_ + auVar377._4_4_ * fVar241;
        auVar146._8_4_ =
             fVar226 * auVar186._8_4_ + fVar200 * auVar233._8_4_ + auVar377._8_4_ * fVar241;
        auVar146._12_4_ =
             fVar226 * auVar186._12_4_ + fVar200 * auVar233._12_4_ + auVar377._12_4_ * fVar241;
        auVar146._16_4_ =
             fVar226 * auVar186._16_4_ + fVar200 * auVar233._16_4_ + auVar377._16_4_ * fVar241;
        auVar146._20_4_ =
             fVar226 * auVar186._20_4_ + fVar200 * auVar233._20_4_ + auVar377._20_4_ * fVar241;
        auVar146._24_4_ =
             fVar226 * auVar186._24_4_ + fVar200 * auVar233._24_4_ + auVar377._24_4_ * fVar241;
        auVar146._28_4_ = auVar182._28_4_ + auVar186._28_4_ + auVar147._28_4_;
        auVar188._8_4_ = 0x7fffffff;
        auVar188._0_8_ = 0x7fffffff7fffffff;
        auVar188._12_4_ = 0x7fffffff;
        auVar188._16_4_ = 0x7fffffff;
        auVar188._20_4_ = 0x7fffffff;
        auVar188._24_4_ = 0x7fffffff;
        auVar188._28_4_ = 0x7fffffff;
        auVar147 = vandps_avx(auVar146,auVar188);
        auVar189._8_4_ = 0x3e99999a;
        auVar189._0_8_ = 0x3e99999a3e99999a;
        auVar189._12_4_ = 0x3e99999a;
        auVar189._16_4_ = 0x3e99999a;
        auVar189._20_4_ = 0x3e99999a;
        auVar189._24_4_ = 0x3e99999a;
        auVar189._28_4_ = 0x3e99999a;
        auVar147 = vcmpps_avx(auVar147,auVar189,1);
        auVar147 = vorps_avx(auVar147,local_5c0);
        auVar190._8_4_ = 3;
        auVar190._0_8_ = 0x300000003;
        auVar190._12_4_ = 3;
        auVar190._16_4_ = 3;
        auVar190._20_4_ = 3;
        auVar190._24_4_ = 3;
        auVar190._28_4_ = 3;
        auVar221._8_4_ = 2;
        auVar221._0_8_ = 0x200000002;
        auVar221._12_4_ = 2;
        auVar221._16_4_ = 2;
        auVar221._20_4_ = 2;
        auVar221._24_4_ = 2;
        auVar221._28_4_ = 2;
        auVar147 = vblendvps_avx(auVar221,auVar190,auVar147);
        local_5a0 = ZEXT432((uint)uVar124);
        local_4b0 = vpshufd_avx(ZEXT416((uint)uVar124),0);
        auVar170 = vpcmpgtd_avx(auVar147._16_16_,local_4b0);
        auVar132 = vpcmpgtd_avx(auVar147._0_16_,local_4b0);
        auVar191._16_16_ = auVar170;
        auVar191._0_16_ = auVar132;
        auVar147 = vblendps_avx(ZEXT1632(auVar132),auVar191,0xf0);
        local_5e0 = vandnps_avx(auVar147,local_560);
        auVar292 = ZEXT3264(local_5e0);
        local_580 = auVar147;
        auVar182 = local_560 & ~auVar147;
        auVar335 = ZEXT464(0) << 0x20;
        auVar310 = ZEXT1664(CONCAT412(0x7fffffff,CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
        local_640._0_8_ = uVar124;
        fVar226 = fVar200;
        fVar241 = fVar200;
        fVar204 = fVar200;
        fVar205 = fVar200;
        fVar242 = fVar200;
        fVar127 = fVar200;
        local_a00 = auVar39;
        if ((((((((auVar182 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar182 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar182 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar182 >> 0x7f,0) != '\0') ||
              (auVar182 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar182 >> 0xbf,0) != '\0') ||
            (auVar182 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar182[0x1f] < '\0') {
          local_780._4_4_ = local_420._4_4_ + local_820._4_4_;
          local_780._0_4_ = local_420._0_4_ + local_820._0_4_;
          fStack_778 = local_420._8_4_ + local_820._8_4_;
          fStack_774 = local_420._12_4_ + local_820._12_4_;
          fStack_770 = local_420._16_4_ + local_820._16_4_;
          fStack_76c = local_420._20_4_ + local_820._20_4_;
          fStack_768 = local_420._24_4_ + local_820._24_4_;
          fStack_764 = local_420._28_4_ + fVar225;
          local_8e0 = auVar388;
          local_840._4_4_ = fVar200;
          local_840._0_4_ = fVar200;
          fStack_838 = fVar200;
          fStack_834 = fVar200;
          fStack_830 = fVar200;
          fStack_82c = fVar200;
          fStack_828 = fVar200;
          fStack_824 = fVar200;
          local_860 = auVar399;
          do {
            auVar250 = auVar310._0_16_;
            auVar192._8_4_ = 0x7f800000;
            auVar192._0_8_ = 0x7f8000007f800000;
            auVar192._12_4_ = 0x7f800000;
            auVar192._16_4_ = 0x7f800000;
            auVar192._20_4_ = 0x7f800000;
            auVar192._24_4_ = 0x7f800000;
            auVar192._28_4_ = 0x7f800000;
            auVar147 = auVar292._0_32_;
            auVar182 = vblendvps_avx(auVar192,local_420,auVar147);
            auVar36 = vshufps_avx(auVar182,auVar182,0xb1);
            auVar36 = vminps_avx(auVar182,auVar36);
            auVar37 = vshufpd_avx(auVar36,auVar36,5);
            auVar36 = vminps_avx(auVar36,auVar37);
            auVar37 = vperm2f128_avx(auVar36,auVar36,1);
            auVar36 = vminps_avx(auVar36,auVar37);
            auVar182 = vcmpps_avx(auVar182,auVar36,0);
            auVar36 = auVar147 & auVar182;
            if ((((((((auVar36 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar36 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar36 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar36 >> 0x7f,0) != '\0') ||
                  (auVar36 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar36 >> 0xbf,0) != '\0') ||
                (auVar36 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar36[0x1f] < '\0') {
              auVar147 = vandps_avx(auVar182,auVar147);
            }
            uVar122 = vmovmskps_avx(auVar147);
            uVar117 = 0;
            if (uVar122 != 0) {
              for (; (uVar122 >> uVar117 & 1) == 0; uVar117 = uVar117 + 1) {
              }
            }
            uVar124 = (ulong)uVar117;
            *(undefined4 *)(local_5e0 + uVar124 * 4) = 0;
            aVar12 = (ray->super_RayK<1>).dir.field_0;
            _local_8a0 = (undefined1  [16])aVar12;
            auVar170 = vdpps_avx((undefined1  [16])aVar12,(undefined1  [16])aVar12,0x7f);
            local_ac0 = local_4e0[uVar124];
            auVar292 = ZEXT464((uint)local_ac0);
            local_ae0 = *(float *)(local_460 + uVar124 * 4);
            auVar447 = ZEXT464((uint)local_ae0);
            if (auVar170._0_4_ < 0.0) {
              fStack_abc = 0.0;
              fStack_ab8 = 0.0;
              fStack_ab4 = 0.0;
              fStack_adc = 0.0;
              fStack_ad8 = 0.0;
              fStack_ad4 = 0.0;
              fVar226 = sqrtf(auVar170._0_4_);
              auVar447 = ZEXT1664(CONCAT412(fStack_ad4,
                                            CONCAT48(fStack_ad8,CONCAT44(fStack_adc,local_ae0))));
              auVar292 = ZEXT1664(CONCAT412(fStack_ab4,
                                            CONCAT48(fStack_ab8,CONCAT44(fStack_abc,local_ac0))));
              auVar250._8_4_ = 0x7fffffff;
              auVar250._0_8_ = 0x7fffffff7fffffff;
              auVar250._12_4_ = 0x7fffffff;
              auVar335 = ZEXT1664(ZEXT816(0) << 0x40);
            }
            else {
              auVar170 = vsqrtss_avx(auVar170,auVar170);
              fVar226 = auVar170._0_4_;
            }
            auVar132 = vminps_avx(_local_9b0,_local_9d0);
            auVar170 = vmaxps_avx(_local_9b0,_local_9d0);
            auVar161 = vminps_avx(_local_9c0,_local_9e0);
            auVar131 = vminps_avx(auVar132,auVar161);
            auVar132 = vmaxps_avx(_local_9c0,_local_9e0);
            auVar161 = vmaxps_avx(auVar170,auVar132);
            auVar170 = vandps_avx(auVar131,auVar250);
            auVar132 = vandps_avx(auVar161,auVar250);
            auVar170 = vmaxps_avx(auVar170,auVar132);
            auVar132 = vmovshdup_avx(auVar170);
            auVar132 = vmaxss_avx(auVar132,auVar170);
            auVar170 = vshufpd_avx(auVar170,auVar170,1);
            auVar170 = vmaxss_avx(auVar170,auVar132);
            local_9a0._0_4_ = auVar170._0_4_ * 1.9073486e-06;
            local_7e0._0_4_ = fVar226 * 1.9073486e-06;
            local_760._0_16_ = vshufps_avx(auVar161,auVar161,0xff);
            lVar120 = 4;
            do {
              local_ac0 = auVar292._0_4_;
              fVar205 = 1.0 - local_ac0;
              local_940._0_16_ = ZEXT416((uint)fVar205);
              fVar226 = fVar205 * fVar205;
              fVar200 = fVar205 * fVar226;
              fVar241 = local_ac0 * local_ac0;
              fVar204 = local_ac0 * fVar241;
              fVar225 = local_ac0 * fVar205;
              auVar170 = vshufps_avx(ZEXT416((uint)(fVar204 * 0.16666667)),
                                     ZEXT416((uint)(fVar204 * 0.16666667)),0);
              auVar132 = ZEXT416((uint)((fVar204 * 4.0 + fVar200 +
                                        local_ac0 * fVar225 * 12.0 + fVar205 * fVar225 * 6.0) *
                                       0.16666667));
              auVar132 = vshufps_avx(auVar132,auVar132,0);
              auVar161 = ZEXT416((uint)((fVar200 * 4.0 + fVar204 +
                                        fVar205 * fVar225 * 12.0 + local_ac0 * fVar225 * 6.0) *
                                       0.16666667));
              auVar161 = vshufps_avx(auVar161,auVar161,0);
              auVar445 = auVar447._0_16_;
              auVar131 = vshufps_avx(auVar445,auVar445,0);
              auVar208._0_4_ = auVar131._0_4_ * (float)local_8a0._0_4_ + 0.0;
              auVar208._4_4_ = auVar131._4_4_ * (float)local_8a0._4_4_ + 0.0;
              auVar208._8_4_ = auVar131._8_4_ * fStack_898 + 0.0;
              auVar208._12_4_ = auVar131._12_4_ * fStack_894 + 0.0;
              auVar131 = vshufps_avx(ZEXT416((uint)(fVar200 * 0.16666667)),
                                     ZEXT416((uint)(fVar200 * 0.16666667)),0);
              auVar130._0_4_ =
                   auVar131._0_4_ * (float)local_9b0._0_4_ +
                   auVar161._0_4_ * (float)local_9d0._0_4_ +
                   auVar170._0_4_ * (float)local_9e0._0_4_ + auVar132._0_4_ * (float)local_9c0._0_4_
              ;
              auVar130._4_4_ =
                   auVar131._4_4_ * (float)local_9b0._4_4_ +
                   auVar161._4_4_ * (float)local_9d0._4_4_ +
                   auVar170._4_4_ * (float)local_9e0._4_4_ + auVar132._4_4_ * (float)local_9c0._4_4_
              ;
              auVar130._8_4_ =
                   auVar131._8_4_ * fStack_9a8 +
                   auVar161._8_4_ * fStack_9c8 +
                   auVar170._8_4_ * fStack_9d8 + auVar132._8_4_ * fStack_9b8;
              auVar130._12_4_ =
                   auVar131._12_4_ * fStack_9a4 +
                   auVar161._12_4_ * fStack_9c4 +
                   auVar170._12_4_ * fStack_9d4 + auVar132._12_4_ * fStack_9b4;
              local_8c0._0_16_ = auVar130;
              auVar170 = vsubps_avx(auVar208,auVar130);
              _local_880 = auVar170;
              auVar170 = vdpps_avx(auVar170,auVar170,0x7f);
              local_a60 = auVar170._0_4_;
              auVar440 = auVar292._0_16_;
              fStack_abc = auVar292._4_4_;
              fStack_ab8 = auVar292._8_4_;
              fStack_ab4 = auVar292._12_4_;
              local_ae0 = auVar447._0_4_;
              fStack_adc = auVar447._4_4_;
              fStack_ad8 = auVar447._8_4_;
              fStack_ad4 = auVar447._12_4_;
              fStack_a5c = auVar170._4_4_;
              fStack_a58 = auVar170._8_4_;
              fStack_a54 = auVar170._12_4_;
              local_a80._0_4_ = fVar225;
              if (local_a60 < 0.0) {
                local_940._0_16_ = ZEXT416((uint)fVar205);
                local_960._0_4_ = fVar241;
                local_a00._0_4_ = fVar226;
                fVar200 = sqrtf(local_a60);
                auVar445._4_4_ = fStack_adc;
                auVar445._0_4_ = local_ae0;
                auVar445._8_4_ = fStack_ad8;
                auVar445._12_4_ = fStack_ad4;
                auVar440._4_4_ = fStack_abc;
                auVar440._0_4_ = local_ac0;
                auVar440._8_4_ = fStack_ab8;
                auVar440._12_4_ = fStack_ab4;
                auVar335 = ZEXT1664(ZEXT816(0) << 0x40);
                fVar226 = (float)local_a00._0_4_;
                fVar241 = (float)local_960._0_4_;
              }
              else {
                auVar170 = vsqrtss_avx(auVar170,auVar170);
                fVar200 = auVar170._0_4_;
              }
              fVar204 = local_940._0_4_;
              fVar225 = auVar440._0_4_;
              auVar170 = vshufps_avx(ZEXT416((uint)(fVar241 * 0.5)),ZEXT416((uint)(fVar241 * 0.5)),0
                                    );
              auVar132 = ZEXT416((uint)((fVar226 + (float)local_a80._0_4_ * 4.0) * 0.5));
              auVar132 = vshufps_avx(auVar132,auVar132,0);
              auVar161 = ZEXT416((uint)((fVar225 * -fVar225 - (float)local_a80._0_4_ * 4.0) * 0.5));
              auVar161 = vshufps_avx(auVar161,auVar161,0);
              auVar131 = ZEXT416((uint)(fVar204 * -fVar204 * 0.5));
              auVar131 = vshufps_avx(auVar131,auVar131,0);
              auVar370._0_4_ =
                   (float)local_9b0._0_4_ * auVar131._0_4_ +
                   (float)local_9d0._0_4_ * auVar161._0_4_ +
                   (float)local_9e0._0_4_ * auVar170._0_4_ + (float)local_9c0._0_4_ * auVar132._0_4_
              ;
              auVar370._4_4_ =
                   (float)local_9b0._4_4_ * auVar131._4_4_ +
                   (float)local_9d0._4_4_ * auVar161._4_4_ +
                   (float)local_9e0._4_4_ * auVar170._4_4_ + (float)local_9c0._4_4_ * auVar132._4_4_
              ;
              auVar370._8_4_ =
                   fStack_9a8 * auVar131._8_4_ +
                   fStack_9c8 * auVar161._8_4_ +
                   fStack_9d8 * auVar170._8_4_ + fStack_9b8 * auVar132._8_4_;
              auVar370._12_4_ =
                   fStack_9a4 * auVar131._12_4_ +
                   fStack_9c4 * auVar161._12_4_ +
                   fStack_9d4 * auVar170._12_4_ + fStack_9b4 * auVar132._12_4_;
              auVar170 = vshufps_avx(auVar440,auVar440,0);
              auVar132 = ZEXT416((uint)(fVar204 - (fVar225 + fVar225)));
              auVar161 = vshufps_avx(auVar132,auVar132,0);
              auVar132 = ZEXT416((uint)(fVar225 - (fVar204 + fVar204)));
              auVar131 = vshufps_avx(auVar132,auVar132,0);
              auVar137 = vshufps_avx(local_940._0_16_,local_940._0_16_,0);
              auVar132 = vdpps_avx(auVar370,auVar370,0x7f);
              auVar168._0_4_ =
                   (float)local_9b0._0_4_ * auVar137._0_4_ +
                   (float)local_9d0._0_4_ * auVar131._0_4_ +
                   (float)local_9e0._0_4_ * auVar170._0_4_ + (float)local_9c0._0_4_ * auVar161._0_4_
              ;
              auVar168._4_4_ =
                   (float)local_9b0._4_4_ * auVar137._4_4_ +
                   (float)local_9d0._4_4_ * auVar131._4_4_ +
                   (float)local_9e0._4_4_ * auVar170._4_4_ + (float)local_9c0._4_4_ * auVar161._4_4_
              ;
              auVar168._8_4_ =
                   fStack_9a8 * auVar137._8_4_ +
                   fStack_9c8 * auVar131._8_4_ +
                   fStack_9d8 * auVar170._8_4_ + fStack_9b8 * auVar161._8_4_;
              auVar168._12_4_ =
                   fStack_9a4 * auVar137._12_4_ +
                   fStack_9c4 * auVar131._12_4_ +
                   fStack_9d4 * auVar170._12_4_ + fStack_9b4 * auVar161._12_4_;
              auVar170 = vblendps_avx(auVar132,_DAT_01feba10,0xe);
              auVar161 = vrsqrtss_avx(auVar170,auVar170);
              fVar241 = auVar161._0_4_;
              fVar226 = auVar132._0_4_;
              auVar161 = vdpps_avx(auVar370,auVar168,0x7f);
              auVar131 = vshufps_avx(auVar132,auVar132,0);
              auVar169._0_4_ = auVar168._0_4_ * auVar131._0_4_;
              auVar169._4_4_ = auVar168._4_4_ * auVar131._4_4_;
              auVar169._8_4_ = auVar168._8_4_ * auVar131._8_4_;
              auVar169._12_4_ = auVar168._12_4_ * auVar131._12_4_;
              auVar161 = vshufps_avx(auVar161,auVar161,0);
              auVar251._0_4_ = auVar370._0_4_ * auVar161._0_4_;
              auVar251._4_4_ = auVar370._4_4_ * auVar161._4_4_;
              auVar251._8_4_ = auVar370._8_4_ * auVar161._8_4_;
              auVar251._12_4_ = auVar370._12_4_ * auVar161._12_4_;
              auVar131 = vsubps_avx(auVar169,auVar251);
              auVar161 = vrcpss_avx(auVar170,auVar170);
              auVar170 = vmaxss_avx(ZEXT416((uint)local_9a0._0_4_),
                                    ZEXT416((uint)(auVar445._0_4_ * (float)local_7e0._0_4_)));
              local_a80._0_4_ = auVar170._0_4_;
              auVar170 = ZEXT416((uint)(auVar161._0_4_ * (2.0 - fVar226 * auVar161._0_4_)));
              auVar170 = vshufps_avx(auVar170,auVar170,0);
              uVar124 = CONCAT44(auVar370._4_4_,auVar370._0_4_);
              auVar391._0_8_ = uVar124 ^ 0x8000000080000000;
              auVar391._8_4_ = -auVar370._8_4_;
              auVar391._12_4_ = -auVar370._12_4_;
              auVar161 = ZEXT416((uint)(fVar241 * 1.5 + fVar226 * -0.5 * fVar241 * fVar241 * fVar241
                                       ));
              auVar161 = vshufps_avx(auVar161,auVar161,0);
              auVar229._0_4_ = auVar161._0_4_ * auVar131._0_4_ * auVar170._0_4_;
              auVar229._4_4_ = auVar161._4_4_ * auVar131._4_4_ * auVar170._4_4_;
              auVar229._8_4_ = auVar161._8_4_ * auVar131._8_4_ * auVar170._8_4_;
              auVar229._12_4_ = auVar161._12_4_ * auVar131._12_4_ * auVar170._12_4_;
              local_980._0_4_ = auVar370._0_4_ * auVar161._0_4_;
              local_980._4_4_ = auVar370._4_4_ * auVar161._4_4_;
              local_980._8_4_ = auVar370._8_4_ * auVar161._8_4_;
              local_980._12_4_ = auVar370._12_4_ * auVar161._12_4_;
              local_940._0_16_ = auVar370;
              if (fVar226 < 0.0) {
                local_960._0_4_ = fVar200;
                local_a00._0_16_ = auVar391;
                local_800._0_16_ = auVar229;
                fVar226 = sqrtf(fVar226);
                auVar335 = ZEXT1664(ZEXT816(0) << 0x40);
                auVar229 = local_800._0_16_;
                auVar391 = local_a00._0_16_;
              }
              else {
                auVar170 = vsqrtss_avx(auVar132,auVar132);
                fVar226 = auVar170._0_4_;
                local_960._0_4_ = fVar200;
              }
              auVar344._4_4_ = fStack_a5c;
              auVar344._0_4_ = local_a60;
              auVar344._8_4_ = fStack_a58;
              auVar344._12_4_ = fStack_a54;
              auVar170 = vdpps_avx(_local_880,local_980._0_16_,0x7f);
              local_a00._0_4_ =
                   ((float)local_9a0._0_4_ / fVar226) * ((float)local_960._0_4_ + 1.0) +
                   (float)local_960._0_4_ * (float)local_9a0._0_4_ + (float)local_a80._0_4_;
              auVar132 = vdpps_avx(auVar391,local_980._0_16_,0x7f);
              auVar161 = vdpps_avx(_local_880,auVar229,0x7f);
              auVar131 = vdpps_avx(_local_8a0,local_980._0_16_,0x7f);
              auVar137 = vdpps_avx(_local_880,auVar391,0x7f);
              fVar226 = auVar132._0_4_ + auVar161._0_4_;
              fVar200 = auVar170._0_4_;
              auVar133._0_4_ = fVar200 * fVar200;
              auVar133._4_4_ = auVar170._4_4_ * auVar170._4_4_;
              auVar133._8_4_ = auVar170._8_4_ * auVar170._8_4_;
              auVar133._12_4_ = auVar170._12_4_ * auVar170._12_4_;
              auVar161 = vsubps_avx(auVar344,auVar133);
              local_980._0_16_ = ZEXT416((uint)fVar226);
              auVar132 = vdpps_avx(_local_880,_local_8a0,0x7f);
              fVar241 = auVar137._0_4_ - fVar200 * fVar226;
              local_960._0_16_ = auVar170;
              fVar200 = auVar132._0_4_ - fVar200 * auVar131._0_4_;
              auVar170 = vrsqrtss_avx(auVar161,auVar161);
              fVar204 = auVar161._0_4_;
              fVar226 = auVar170._0_4_;
              fVar226 = fVar226 * 1.5 + fVar204 * -0.5 * fVar226 * fVar226 * fVar226;
              if (fVar204 < 0.0) {
                local_800._0_16_ = auVar131;
                local_700._0_4_ = fVar241;
                local_720._0_4_ = fVar200;
                local_740._0_4_ = fVar226;
                fVar204 = sqrtf(fVar204);
                auVar344._4_4_ = fStack_a5c;
                auVar344._0_4_ = local_a60;
                auVar344._8_4_ = fStack_a58;
                auVar344._12_4_ = fStack_a54;
                auVar335 = ZEXT1664(ZEXT816(0) << 0x40);
                fVar226 = (float)local_740._0_4_;
                fVar241 = (float)local_700._0_4_;
                fVar200 = (float)local_720._0_4_;
                auVar131 = local_800._0_16_;
              }
              else {
                auVar170 = vsqrtss_avx(auVar161,auVar161);
                fVar204 = auVar170._0_4_;
              }
              auVar415 = ZEXT3264(local_8e0);
              auVar400 = ZEXT3264(local_860);
              auVar377 = ZEXT1664(local_940._0_16_);
              auVar132 = vpermilps_avx(local_8c0._0_16_,0xff);
              auVar137 = vshufps_avx(local_940._0_16_,local_940._0_16_,0xff);
              fVar241 = fVar241 * fVar226 - auVar137._0_4_;
              auVar252._0_8_ = auVar131._0_8_ ^ 0x8000000080000000;
              auVar252._8_4_ = auVar131._8_4_ ^ 0x80000000;
              auVar252._12_4_ = auVar131._12_4_ ^ 0x80000000;
              auVar278._0_4_ = -fVar241;
              auVar278._4_4_ = 0x80000000;
              auVar278._8_4_ = 0x80000000;
              auVar278._12_4_ = 0x80000000;
              auVar389 = ZEXT1664(local_980._0_16_);
              auVar170 = vinsertps_avx(ZEXT416((uint)(fVar200 * fVar226)),auVar252,0x10);
              auVar161 = vmovsldup_avx(ZEXT416((uint)(local_980._0_4_ * fVar200 * fVar226 -
                                                     auVar131._0_4_ * fVar241)));
              auVar170 = vdivps_avx(auVar170,auVar161);
              auVar131 = ZEXT416((uint)(fVar204 - auVar132._0_4_));
              auVar132 = vinsertps_avx(local_960._0_16_,auVar131,0x10);
              auVar230._0_4_ = auVar132._0_4_ * auVar170._0_4_;
              auVar230._4_4_ = auVar132._4_4_ * auVar170._4_4_;
              auVar230._8_4_ = auVar132._8_4_ * auVar170._8_4_;
              auVar230._12_4_ = auVar132._12_4_ * auVar170._12_4_;
              auVar170 = vinsertps_avx(auVar278,local_980._0_16_,0x1c);
              auVar170 = vdivps_avx(auVar170,auVar161);
              auVar209._0_4_ = auVar132._0_4_ * auVar170._0_4_;
              auVar209._4_4_ = auVar132._4_4_ * auVar170._4_4_;
              auVar209._8_4_ = auVar132._8_4_ * auVar170._8_4_;
              auVar209._12_4_ = auVar132._12_4_ * auVar170._12_4_;
              auVar170 = vhaddps_avx(auVar230,auVar230);
              auVar132 = vhaddps_avx(auVar209,auVar209);
              local_ac0 = local_ac0 - auVar170._0_4_;
              auVar292 = ZEXT464((uint)local_ac0);
              local_ae0 = local_ae0 - auVar132._0_4_;
              auVar447 = ZEXT464((uint)local_ae0);
              auVar253._8_4_ = 0x7fffffff;
              auVar253._0_8_ = 0x7fffffff7fffffff;
              auVar253._12_4_ = 0x7fffffff;
              auVar310 = ZEXT1664(auVar253);
              auVar170 = vandps_avx(local_960._0_16_,auVar253);
              fVar226 = (float)local_840._4_4_;
              fVar241 = fStack_838;
              fVar204 = fStack_834;
              fVar205 = fStack_830;
              fVar242 = fStack_82c;
              fVar127 = fStack_828;
              fVar200 = (float)local_840._0_4_;
              if ((float)local_a00._0_4_ <= auVar170._0_4_) {
LAB_01213e43:
                bVar88 = false;
              }
              else {
                auVar170 = vandps_avx(auVar131,auVar253);
                if ((float)local_760._0_4_ * 1.9073486e-06 +
                    (float)local_a00._0_4_ + (float)local_a80._0_4_ <= auVar170._0_4_)
                goto LAB_01213e43;
                local_ae0 = local_ae0 + (float)local_7a0._0_4_;
                auVar447 = ZEXT464((uint)local_ae0);
                bVar88 = true;
                if (((((ray->super_RayK<1>).org.field_0.m128[3] <= local_ae0) &&
                     (fVar225 = (ray->super_RayK<1>).tfar, local_ae0 <= fVar225)) &&
                    (0.0 <= local_ac0)) && (local_ac0 <= 1.0)) {
                  auVar170 = vrsqrtss_avx(auVar344,auVar344);
                  fVar243 = auVar170._0_4_;
                  pGVar32 = (context->scene->geometries).items[local_ae8].ptr;
                  if ((pGVar32->mask & (ray->super_RayK<1>).mask) != 0) {
                    auVar170 = ZEXT416((uint)(fVar243 * 1.5 +
                                             auVar344._0_4_ * -0.5 * fVar243 * fVar243 * fVar243));
                    auVar170 = vshufps_avx(auVar170,auVar170,0);
                    auVar171._0_4_ = auVar170._0_4_ * (float)local_880._0_4_;
                    auVar171._4_4_ = auVar170._4_4_ * (float)local_880._4_4_;
                    auVar171._8_4_ = auVar170._8_4_ * fStack_878;
                    auVar171._12_4_ = auVar170._12_4_ * fStack_874;
                    auVar134._0_4_ = local_940._0_4_ + auVar137._0_4_ * auVar171._0_4_;
                    auVar134._4_4_ = local_940._4_4_ + auVar137._4_4_ * auVar171._4_4_;
                    auVar134._8_4_ = local_940._8_4_ + auVar137._8_4_ * auVar171._8_4_;
                    auVar134._12_4_ = local_940._12_4_ + auVar137._12_4_ * auVar171._12_4_;
                    auVar170 = vshufps_avx(auVar171,auVar171,0xc9);
                    auVar132 = vshufps_avx(local_940._0_16_,local_940._0_16_,0xc9);
                    auVar172._0_4_ = auVar132._0_4_ * auVar171._0_4_;
                    auVar172._4_4_ = auVar132._4_4_ * auVar171._4_4_;
                    auVar172._8_4_ = auVar132._8_4_ * auVar171._8_4_;
                    auVar172._12_4_ = auVar132._12_4_ * auVar171._12_4_;
                    auVar210._0_4_ = local_940._0_4_ * auVar170._0_4_;
                    auVar210._4_4_ = local_940._4_4_ * auVar170._4_4_;
                    auVar210._8_4_ = local_940._8_4_ * auVar170._8_4_;
                    auVar210._12_4_ = local_940._12_4_ * auVar170._12_4_;
                    auVar161 = vsubps_avx(auVar210,auVar172);
                    auVar170 = vshufps_avx(auVar161,auVar161,0xc9);
                    auVar132 = vshufps_avx(auVar134,auVar134,0xc9);
                    auVar211._0_4_ = auVar132._0_4_ * auVar170._0_4_;
                    auVar211._4_4_ = auVar132._4_4_ * auVar170._4_4_;
                    auVar211._8_4_ = auVar132._8_4_ * auVar170._8_4_;
                    auVar211._12_4_ = auVar132._12_4_ * auVar170._12_4_;
                    auVar170 = vshufps_avx(auVar161,auVar161,0xd2);
                    auVar135._0_4_ = auVar134._0_4_ * auVar170._0_4_;
                    auVar135._4_4_ = auVar134._4_4_ * auVar170._4_4_;
                    auVar135._8_4_ = auVar134._8_4_ * auVar170._8_4_;
                    auVar135._12_4_ = auVar134._12_4_ * auVar170._12_4_;
                    auVar170 = vsubps_avx(auVar211,auVar135);
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar32->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                      (ray->super_RayK<1>).tfar = local_ae0;
                      auVar132 = vshufps_avx(auVar170,auVar170,0xe9);
                      uVar9 = vmovlps_avx(auVar132);
                      *(undefined8 *)&(ray->Ng).field_0 = uVar9;
                      (ray->Ng).field_0.field_0.z = auVar170._0_4_;
                      ray->u = local_ac0;
                      ray->v = 0.0;
                      ray->primID = (uint)local_a88;
                      ray->geomID = (uint)local_ae8;
                      ray->instID[0] = context->user->instID[0];
                      ray->instPrimID[0] = context->user->instPrimID[0];
                    }
                    else {
                      auVar132 = vshufps_avx(auVar170,auVar170,0xe9);
                      local_910 = vmovlps_avx(auVar132);
                      local_908 = auVar170._0_4_;
                      local_904 = local_ac0;
                      local_900 = 0;
                      local_8fc = (uint)local_a88;
                      local_8f8 = (uint)local_ae8;
                      local_8f4 = context->user->instID[0];
                      local_8f0 = context->user->instPrimID[0];
                      (ray->super_RayK<1>).tfar = local_ae0;
                      local_aec = -1;
                      local_a30.valid = &local_aec;
                      local_a30.geometryUserPtr = pGVar32->userPtr;
                      local_a30.context = context->user;
                      local_a30.ray = (RTCRayN *)ray;
                      local_a30.hit = (RTCHitN *)&local_910;
                      local_a30.N = 1;
                      fStack_abc = 0.0;
                      fStack_ab8 = 0.0;
                      fStack_ab4 = 0.0;
                      fStack_adc = 0.0;
                      fStack_ad8 = 0.0;
                      fStack_ad4 = 0.0;
                      local_a60 = fVar225;
                      if (pGVar32->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01213f96:
                        p_Var35 = context->args->filter;
                        fVar200 = (float)local_840._0_4_;
                        fVar226 = (float)local_840._4_4_;
                        fVar241 = fStack_838;
                        fVar204 = fStack_834;
                        fVar205 = fStack_830;
                        fVar242 = fStack_82c;
                        fVar127 = fStack_828;
                        if (p_Var35 != (RTCFilterFunctionN)0x0) {
                          if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                             (((pGVar32->field_8).field_0x2 & 0x40) != 0)) {
                            auVar377 = ZEXT1664(auVar377._0_16_);
                            auVar389 = ZEXT1664(auVar389._0_16_);
                            (*p_Var35)(&local_a30);
                            auVar447 = ZEXT1664(CONCAT412(fStack_ad4,
                                                          CONCAT48(fStack_ad8,
                                                                   CONCAT44(fStack_adc,local_ae0))))
                            ;
                            auVar292 = ZEXT1664(CONCAT412(fStack_ab4,
                                                          CONCAT48(fStack_ab8,
                                                                   CONCAT44(fStack_abc,local_ac0))))
                            ;
                            auVar400 = ZEXT3264(local_860);
                            auVar415 = ZEXT3264(local_8e0);
                            auVar310 = ZEXT1664(CONCAT412(0x7fffffff,
                                                          CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                            auVar335 = ZEXT1664(ZEXT816(0) << 0x40);
                            fVar200 = (float)local_840._0_4_;
                            fVar226 = (float)local_840._4_4_;
                            fVar241 = fStack_838;
                            fVar204 = fStack_834;
                            fVar205 = fStack_830;
                            fVar242 = fStack_82c;
                            fVar127 = fStack_828;
                          }
                          if (*local_a30.valid == 0) goto LAB_01214066;
                        }
                        (((Vec3f *)((long)local_a30.ray + 0x30))->field_0).components[0] =
                             *(float *)local_a30.hit;
                        (((Vec3f *)((long)local_a30.ray + 0x30))->field_0).field_0.y =
                             *(float *)(local_a30.hit + 4);
                        (((Vec3f *)((long)local_a30.ray + 0x30))->field_0).field_0.z =
                             *(float *)(local_a30.hit + 8);
                        *(float *)((long)local_a30.ray + 0x3c) = *(float *)(local_a30.hit + 0xc);
                        *(float *)((long)local_a30.ray + 0x40) = *(float *)(local_a30.hit + 0x10);
                        *(float *)((long)local_a30.ray + 0x44) = *(float *)(local_a30.hit + 0x14);
                        *(float *)((long)local_a30.ray + 0x48) = *(float *)(local_a30.hit + 0x18);
                        *(float *)((long)local_a30.ray + 0x4c) = *(float *)(local_a30.hit + 0x1c);
                        *(float *)((long)local_a30.ray + 0x50) = *(float *)(local_a30.hit + 0x20);
                      }
                      else {
                        auVar377 = ZEXT1664(local_940._0_16_);
                        auVar389 = ZEXT1664(local_980._0_16_);
                        (*pGVar32->intersectionFilterN)(&local_a30);
                        auVar447 = ZEXT1664(CONCAT412(fStack_ad4,
                                                      CONCAT48(fStack_ad8,
                                                               CONCAT44(fStack_adc,local_ae0))));
                        auVar292 = ZEXT1664(CONCAT412(fStack_ab4,
                                                      CONCAT48(fStack_ab8,
                                                               CONCAT44(fStack_abc,local_ac0))));
                        auVar400 = ZEXT3264(local_860);
                        auVar415 = ZEXT3264(local_8e0);
                        auVar310 = ZEXT1664(CONCAT412(0x7fffffff,
                                                      CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                        auVar335 = ZEXT1664(ZEXT816(0) << 0x40);
                        fVar200 = (float)local_840._0_4_;
                        fVar226 = (float)local_840._4_4_;
                        fVar241 = fStack_838;
                        fVar204 = fStack_834;
                        fVar205 = fStack_830;
                        fVar242 = fStack_82c;
                        fVar127 = fStack_828;
                        if (*local_a30.valid != 0) goto LAB_01213f96;
LAB_01214066:
                        (ray->super_RayK<1>).tfar = local_a60;
                      }
                    }
                  }
                }
              }
              auVar182 = local_5e0;
              bVar125 = lVar120 != 0;
              lVar120 = lVar120 + -1;
            } while ((!bVar88) && (bVar125));
            fVar225 = (ray->super_RayK<1>).tfar;
            auVar148._4_4_ = fVar225;
            auVar148._0_4_ = fVar225;
            auVar148._8_4_ = fVar225;
            auVar148._12_4_ = fVar225;
            auVar148._16_4_ = fVar225;
            auVar148._20_4_ = fVar225;
            auVar148._24_4_ = fVar225;
            auVar148._28_4_ = fVar225;
            auVar147 = vcmpps_avx(_local_780,auVar148,2);
            local_5e0 = vandps_avx(auVar147,local_5e0);
            auVar292 = ZEXT3264(local_5e0);
            auVar182 = auVar182 & auVar147;
            uVar124 = local_640._0_8_;
          } while ((((((((auVar182 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                        (auVar182 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (auVar182 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      SUB321(auVar182 >> 0x7f,0) != '\0') ||
                     (auVar182 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    SUB321(auVar182 >> 0xbf,0) != '\0') ||
                   (auVar182 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   auVar182[0x1f] < '\0');
        }
        auVar149._0_4_ =
             auVar415._0_4_ * (float)local_660._0_4_ +
             fVar200 * (float)local_6a0._0_4_ + auVar400._0_4_ * (float)local_680._0_4_;
        auVar149._4_4_ =
             auVar415._4_4_ * (float)local_660._4_4_ +
             fVar226 * (float)local_6a0._4_4_ + auVar400._4_4_ * (float)local_680._4_4_;
        auVar149._8_4_ =
             auVar415._8_4_ * fStack_658 + fVar241 * fStack_698 + auVar400._8_4_ * fStack_678;
        auVar149._12_4_ =
             auVar415._12_4_ * fStack_654 + fVar204 * fStack_694 + auVar400._12_4_ * fStack_674;
        auVar149._16_4_ =
             auVar415._16_4_ * fStack_650 + fVar205 * fStack_690 + auVar400._16_4_ * fStack_670;
        auVar149._20_4_ =
             auVar415._20_4_ * fStack_64c + fVar242 * fStack_68c + auVar400._20_4_ * fStack_66c;
        auVar149._24_4_ =
             auVar415._24_4_ * fStack_648 + fVar127 * fStack_688 + auVar400._24_4_ * fStack_668;
        auVar149._28_4_ = auVar147._28_4_ + auVar147._28_4_ + auVar292._28_4_;
        auVar193._8_4_ = 0x7fffffff;
        auVar193._0_8_ = 0x7fffffff7fffffff;
        auVar193._12_4_ = 0x7fffffff;
        auVar193._16_4_ = 0x7fffffff;
        auVar193._20_4_ = 0x7fffffff;
        auVar193._24_4_ = 0x7fffffff;
        auVar193._28_4_ = 0x7fffffff;
        auVar147 = vandps_avx(auVar149,auVar193);
        auVar194._8_4_ = 0x3e99999a;
        auVar194._0_8_ = 0x3e99999a3e99999a;
        auVar194._12_4_ = 0x3e99999a;
        auVar194._16_4_ = 0x3e99999a;
        auVar194._20_4_ = 0x3e99999a;
        auVar194._24_4_ = 0x3e99999a;
        auVar194._28_4_ = 0x3e99999a;
        auVar147 = vcmpps_avx(auVar147,auVar194,1);
        auVar182 = vorps_avx(auVar147,local_5c0);
        auVar195._0_4_ = local_820._0_4_ + (float)local_6c0._0_4_;
        auVar195._4_4_ = local_820._4_4_ + (float)local_6c0._4_4_;
        auVar195._8_4_ = local_820._8_4_ + fStack_6b8;
        auVar195._12_4_ = local_820._12_4_ + fStack_6b4;
        auVar195._16_4_ = local_820._16_4_ + fStack_6b0;
        auVar195._20_4_ = local_820._20_4_ + fStack_6ac;
        auVar195._24_4_ = local_820._24_4_ + fStack_6a8;
        auVar195._28_4_ = local_820._28_4_ + fStack_6a4;
        fVar226 = (ray->super_RayK<1>).tfar;
        auVar222._4_4_ = fVar226;
        auVar222._0_4_ = fVar226;
        auVar222._8_4_ = fVar226;
        auVar222._12_4_ = fVar226;
        auVar222._16_4_ = fVar226;
        auVar222._20_4_ = fVar226;
        auVar222._24_4_ = fVar226;
        auVar222._28_4_ = fVar226;
        auVar147 = vcmpps_avx(auVar195,auVar222,2);
        local_760 = vandps_avx(auVar147,local_6e0);
        auVar196._8_4_ = 3;
        auVar196._0_8_ = 0x300000003;
        auVar196._12_4_ = 3;
        auVar196._16_4_ = 3;
        auVar196._20_4_ = 3;
        auVar196._24_4_ = 3;
        auVar196._28_4_ = 3;
        auVar223._8_4_ = 2;
        auVar223._0_8_ = 0x200000002;
        auVar223._12_4_ = 2;
        auVar223._16_4_ = 2;
        auVar223._20_4_ = 2;
        auVar223._24_4_ = 2;
        auVar223._28_4_ = 2;
        auVar147 = vblendvps_avx(auVar223,auVar196,auVar182);
        auVar170 = vpcmpgtd_avx(auVar147._16_16_,local_4b0);
        auVar132 = vpshufd_avx(local_5a0._0_16_,0);
        auVar132 = vpcmpgtd_avx(auVar147._0_16_,auVar132);
        auVar197._16_16_ = auVar170;
        auVar197._0_16_ = auVar132;
        _local_780 = vblendps_avx(ZEXT1632(auVar132),auVar197,0xf0);
        local_600 = vandnps_avx(_local_780,local_760);
        auVar147 = local_760 & ~_local_780;
        if ((((((((auVar147 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar147 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar147 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar147 >> 0x7f,0) != '\0') ||
              (auVar147 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar147 >> 0xbf,0) != '\0') ||
            (auVar147 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar147[0x1f] < '\0') {
          local_720 = _local_4a0;
          local_740._4_4_ = local_820._4_4_ + (float)local_4a0._4_4_;
          local_740._0_4_ = local_820._0_4_ + (float)local_4a0._0_4_;
          fStack_738 = local_820._8_4_ + fStack_498;
          fStack_734 = local_820._12_4_ + fStack_494;
          fStack_730 = local_820._16_4_ + fStack_490;
          fStack_72c = local_820._20_4_ + fStack_48c;
          fStack_728 = local_820._24_4_ + fStack_488;
          fStack_724 = local_820._28_4_ + fStack_484;
          do {
            auVar254 = auVar310._0_16_;
            auVar198._8_4_ = 0x7f800000;
            auVar198._0_8_ = 0x7f8000007f800000;
            auVar198._12_4_ = 0x7f800000;
            auVar198._16_4_ = 0x7f800000;
            auVar198._20_4_ = 0x7f800000;
            auVar198._24_4_ = 0x7f800000;
            auVar198._28_4_ = 0x7f800000;
            auVar147 = vblendvps_avx(auVar198,local_720,local_600);
            auVar182 = vshufps_avx(auVar147,auVar147,0xb1);
            auVar182 = vminps_avx(auVar147,auVar182);
            auVar36 = vshufpd_avx(auVar182,auVar182,5);
            auVar182 = vminps_avx(auVar182,auVar36);
            auVar36 = vperm2f128_avx(auVar182,auVar182,1);
            auVar182 = vminps_avx(auVar182,auVar36);
            auVar182 = vcmpps_avx(auVar147,auVar182,0);
            auVar36 = local_600 & auVar182;
            auVar147 = local_600;
            if ((((((((auVar36 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar36 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar36 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar36 >> 0x7f,0) != '\0') ||
                  (auVar36 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar36 >> 0xbf,0) != '\0') ||
                (auVar36 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar36[0x1f] < '\0') {
              auVar147 = vandps_avx(auVar182,local_600);
            }
            uVar122 = vmovmskps_avx(auVar147);
            uVar117 = 0;
            if (uVar122 != 0) {
              for (; (uVar122 >> uVar117 & 1) == 0; uVar117 = uVar117 + 1) {
              }
            }
            uVar124 = (ulong)uVar117;
            *(undefined4 *)(local_600 + uVar124 * 4) = 0;
            aVar12 = (ray->super_RayK<1>).dir.field_0;
            _local_880 = (undefined1  [16])aVar12;
            auVar170 = vdpps_avx((undefined1  [16])aVar12,(undefined1  [16])aVar12,0x7f);
            local_ac0 = local_500[uVar124];
            auVar389 = ZEXT464((uint)local_ac0);
            local_ae0 = *(float *)(local_480 + uVar124 * 4);
            auVar400 = ZEXT464((uint)local_ae0);
            if (auVar170._0_4_ < 0.0) {
              fStack_abc = 0.0;
              fStack_ab8 = 0.0;
              fStack_ab4 = 0.0;
              fStack_adc = 0.0;
              fStack_ad8 = 0.0;
              fStack_ad4 = 0.0;
              fVar226 = sqrtf(auVar170._0_4_);
              auVar400 = ZEXT1664(CONCAT412(fStack_ad4,
                                            CONCAT48(fStack_ad8,CONCAT44(fStack_adc,local_ae0))));
              auVar389 = ZEXT1664(CONCAT412(fStack_ab4,
                                            CONCAT48(fStack_ab8,CONCAT44(fStack_abc,local_ac0))));
              auVar254._8_4_ = 0x7fffffff;
              auVar254._0_8_ = 0x7fffffff7fffffff;
              auVar254._12_4_ = 0x7fffffff;
              auVar335 = ZEXT1664(ZEXT816(0) << 0x40);
            }
            else {
              auVar170 = vsqrtss_avx(auVar170,auVar170);
              fVar226 = auVar170._0_4_;
            }
            auVar132 = vminps_avx(_local_9b0,_local_9d0);
            auVar170 = vmaxps_avx(_local_9b0,_local_9d0);
            auVar161 = vminps_avx(_local_9c0,_local_9e0);
            auVar131 = vminps_avx(auVar132,auVar161);
            auVar132 = vmaxps_avx(_local_9c0,_local_9e0);
            auVar161 = vmaxps_avx(auVar170,auVar132);
            auVar170 = vandps_avx(auVar131,auVar254);
            auVar132 = vandps_avx(auVar161,auVar254);
            auVar170 = vmaxps_avx(auVar170,auVar132);
            auVar132 = vmovshdup_avx(auVar170);
            auVar132 = vmaxss_avx(auVar132,auVar170);
            auVar170 = vshufpd_avx(auVar170,auVar170,1);
            auVar170 = vmaxss_avx(auVar170,auVar132);
            local_8a0._0_4_ = auVar170._0_4_ * 1.9073486e-06;
            local_960._0_4_ = fVar226 * 1.9073486e-06;
            local_700._0_16_ = vshufps_avx(auVar161,auVar161,0xff);
            lVar120 = 4;
            do {
              local_ac0 = auVar389._0_4_;
              fVar205 = 1.0 - local_ac0;
              fVar226 = fVar205 * fVar205;
              fVar200 = fVar205 * fVar226;
              fVar241 = local_ac0 * local_ac0;
              fVar204 = local_ac0 * fVar241;
              fVar225 = local_ac0 * fVar205;
              local_9a0._0_4_ = fVar225;
              auVar170 = vshufps_avx(ZEXT416((uint)(fVar204 * 0.16666667)),
                                     ZEXT416((uint)(fVar204 * 0.16666667)),0);
              auVar132 = ZEXT416((uint)((fVar204 * 4.0 + fVar200 +
                                        local_ac0 * fVar225 * 12.0 + fVar205 * fVar225 * 6.0) *
                                       0.16666667));
              auVar132 = vshufps_avx(auVar132,auVar132,0);
              auVar161 = ZEXT416((uint)((fVar200 * 4.0 + fVar204 +
                                        fVar205 * fVar225 * 12.0 + local_ac0 * fVar225 * 6.0) *
                                       0.16666667));
              auVar161 = vshufps_avx(auVar161,auVar161,0);
              auVar392 = auVar400._0_16_;
              auVar131 = vshufps_avx(auVar392,auVar392,0);
              auVar212._0_4_ = auVar131._0_4_ * (float)local_880._0_4_ + 0.0;
              auVar212._4_4_ = auVar131._4_4_ * (float)local_880._4_4_ + 0.0;
              auVar212._8_4_ = auVar131._8_4_ * fStack_878 + 0.0;
              auVar212._12_4_ = auVar131._12_4_ * fStack_874 + 0.0;
              auVar131 = vshufps_avx(ZEXT416((uint)(fVar200 * 0.16666667)),
                                     ZEXT416((uint)(fVar200 * 0.16666667)),0);
              auVar136._0_4_ =
                   auVar131._0_4_ * (float)local_9b0._0_4_ +
                   auVar161._0_4_ * (float)local_9d0._0_4_ +
                   auVar170._0_4_ * (float)local_9e0._0_4_ + auVar132._0_4_ * (float)local_9c0._0_4_
              ;
              auVar136._4_4_ =
                   auVar131._4_4_ * (float)local_9b0._4_4_ +
                   auVar161._4_4_ * (float)local_9d0._4_4_ +
                   auVar170._4_4_ * (float)local_9e0._4_4_ + auVar132._4_4_ * (float)local_9c0._4_4_
              ;
              auVar136._8_4_ =
                   auVar131._8_4_ * fStack_9a8 +
                   auVar161._8_4_ * fStack_9c8 +
                   auVar170._8_4_ * fStack_9d8 + auVar132._8_4_ * fStack_9b8;
              auVar136._12_4_ =
                   auVar131._12_4_ * fStack_9a4 +
                   auVar161._12_4_ * fStack_9c4 +
                   auVar170._12_4_ * fStack_9d4 + auVar132._12_4_ * fStack_9b4;
              local_940._0_16_ = auVar136;
              auVar170 = vsubps_avx(auVar212,auVar136);
              _local_a80 = auVar170;
              auVar170 = vdpps_avx(auVar170,auVar170,0x7f);
              local_a60 = auVar170._0_4_;
              auVar381 = auVar389._0_16_;
              fStack_abc = auVar389._4_4_;
              fStack_ab8 = auVar389._8_4_;
              fStack_ab4 = auVar389._12_4_;
              local_ae0 = auVar400._0_4_;
              fStack_adc = auVar400._4_4_;
              fStack_ad8 = auVar400._8_4_;
              fStack_ad4 = auVar400._12_4_;
              fStack_a5c = auVar170._4_4_;
              fStack_a58 = auVar170._8_4_;
              fStack_a54 = auVar170._12_4_;
              if (local_a60 < 0.0) {
                local_8c0._0_16_ = ZEXT416((uint)fVar205);
                local_a00._0_4_ = fVar241;
                local_980._0_4_ = fVar226;
                fVar200 = sqrtf(local_a60);
                auVar392._4_4_ = fStack_adc;
                auVar392._0_4_ = local_ae0;
                auVar392._8_4_ = fStack_ad8;
                auVar392._12_4_ = fStack_ad4;
                auVar381._4_4_ = fStack_abc;
                auVar381._0_4_ = local_ac0;
                auVar381._8_4_ = fStack_ab8;
                auVar381._12_4_ = fStack_ab4;
                auVar335 = ZEXT1664(ZEXT816(0) << 0x40);
                fVar226 = (float)local_980._0_4_;
                fVar241 = (float)local_a00._0_4_;
                auVar170 = local_8c0._0_16_;
              }
              else {
                auVar170 = vsqrtss_avx(auVar170,auVar170);
                fVar200 = auVar170._0_4_;
                auVar170 = ZEXT416((uint)fVar205);
              }
              fVar225 = auVar170._0_4_;
              fVar204 = auVar381._0_4_;
              auVar132 = vshufps_avx(ZEXT416((uint)(fVar241 * 0.5)),ZEXT416((uint)(fVar241 * 0.5)),0
                                    );
              auVar161 = ZEXT416((uint)((fVar226 + (float)local_9a0._0_4_ * 4.0) * 0.5));
              auVar161 = vshufps_avx(auVar161,auVar161,0);
              auVar131 = ZEXT416((uint)((fVar204 * -fVar204 - (float)local_9a0._0_4_ * 4.0) * 0.5));
              auVar131 = vshufps_avx(auVar131,auVar131,0);
              auVar137 = ZEXT416((uint)(fVar225 * -fVar225 * 0.5));
              auVar137 = vshufps_avx(auVar137,auVar137,0);
              auVar371._0_4_ =
                   (float)local_9b0._0_4_ * auVar137._0_4_ +
                   (float)local_9d0._0_4_ * auVar131._0_4_ +
                   (float)local_9e0._0_4_ * auVar132._0_4_ + (float)local_9c0._0_4_ * auVar161._0_4_
              ;
              auVar371._4_4_ =
                   (float)local_9b0._4_4_ * auVar137._4_4_ +
                   (float)local_9d0._4_4_ * auVar131._4_4_ +
                   (float)local_9e0._4_4_ * auVar132._4_4_ + (float)local_9c0._4_4_ * auVar161._4_4_
              ;
              auVar371._8_4_ =
                   fStack_9a8 * auVar137._8_4_ +
                   fStack_9c8 * auVar131._8_4_ +
                   fStack_9d8 * auVar132._8_4_ + fStack_9b8 * auVar161._8_4_;
              auVar371._12_4_ =
                   fStack_9a4 * auVar137._12_4_ +
                   fStack_9c4 * auVar131._12_4_ +
                   fStack_9d4 * auVar132._12_4_ + fStack_9b4 * auVar161._12_4_;
              auVar161 = vshufps_avx(auVar381,auVar381,0);
              auVar132 = ZEXT416((uint)(fVar225 - (fVar204 + fVar204)));
              auVar131 = vshufps_avx(auVar132,auVar132,0);
              auVar132 = ZEXT416((uint)(fVar204 - (fVar225 + fVar225)));
              auVar137 = vshufps_avx(auVar132,auVar132,0);
              auVar170 = vshufps_avx(auVar170,auVar170,0);
              auVar132 = vdpps_avx(auVar371,auVar371,0x7f);
              auVar173._0_4_ =
                   (float)local_9b0._0_4_ * auVar170._0_4_ +
                   (float)local_9d0._0_4_ * auVar137._0_4_ +
                   (float)local_9e0._0_4_ * auVar161._0_4_ + (float)local_9c0._0_4_ * auVar131._0_4_
              ;
              auVar173._4_4_ =
                   (float)local_9b0._4_4_ * auVar170._4_4_ +
                   (float)local_9d0._4_4_ * auVar137._4_4_ +
                   (float)local_9e0._4_4_ * auVar161._4_4_ + (float)local_9c0._4_4_ * auVar131._4_4_
              ;
              auVar173._8_4_ =
                   fStack_9a8 * auVar170._8_4_ +
                   fStack_9c8 * auVar137._8_4_ +
                   fStack_9d8 * auVar161._8_4_ + fStack_9b8 * auVar131._8_4_;
              auVar173._12_4_ =
                   fStack_9a4 * auVar170._12_4_ +
                   fStack_9c4 * auVar137._12_4_ +
                   fStack_9d4 * auVar161._12_4_ + fStack_9b4 * auVar131._12_4_;
              auVar170 = vblendps_avx(auVar132,_DAT_01feba10,0xe);
              auVar161 = vrsqrtss_avx(auVar170,auVar170);
              fVar241 = auVar161._0_4_;
              fVar226 = auVar132._0_4_;
              auVar161 = vdpps_avx(auVar371,auVar173,0x7f);
              auVar131 = vshufps_avx(auVar132,auVar132,0);
              auVar174._0_4_ = auVar173._0_4_ * auVar131._0_4_;
              auVar174._4_4_ = auVar173._4_4_ * auVar131._4_4_;
              auVar174._8_4_ = auVar173._8_4_ * auVar131._8_4_;
              auVar174._12_4_ = auVar173._12_4_ * auVar131._12_4_;
              auVar161 = vshufps_avx(auVar161,auVar161,0);
              auVar255._0_4_ = auVar371._0_4_ * auVar161._0_4_;
              auVar255._4_4_ = auVar371._4_4_ * auVar161._4_4_;
              auVar255._8_4_ = auVar371._8_4_ * auVar161._8_4_;
              auVar255._12_4_ = auVar371._12_4_ * auVar161._12_4_;
              auVar137 = vsubps_avx(auVar174,auVar255);
              auVar161 = vrcpss_avx(auVar170,auVar170);
              auVar170 = vmaxss_avx(ZEXT416((uint)local_8a0._0_4_),
                                    ZEXT416((uint)(auVar392._0_4_ * (float)local_960._0_4_)));
              auVar415 = ZEXT1664(auVar170);
              auVar161 = ZEXT416((uint)(auVar161._0_4_ * (2.0 - fVar226 * auVar161._0_4_)));
              auVar161 = vshufps_avx(auVar161,auVar161,0);
              uVar124 = CONCAT44(auVar371._4_4_,auVar371._0_4_);
              auVar279._0_8_ = uVar124 ^ 0x8000000080000000;
              auVar279._8_4_ = -auVar371._8_4_;
              auVar279._12_4_ = -auVar371._12_4_;
              auVar131 = ZEXT416((uint)(fVar241 * 1.5 + fVar226 * -0.5 * fVar241 * fVar241 * fVar241
                                       ));
              auVar131 = vshufps_avx(auVar131,auVar131,0);
              auVar231._0_4_ = auVar131._0_4_ * auVar137._0_4_ * auVar161._0_4_;
              auVar231._4_4_ = auVar131._4_4_ * auVar137._4_4_ * auVar161._4_4_;
              auVar231._8_4_ = auVar131._8_4_ * auVar137._8_4_ * auVar161._8_4_;
              auVar231._12_4_ = auVar131._12_4_ * auVar137._12_4_ * auVar161._12_4_;
              auVar303._0_4_ = auVar371._0_4_ * auVar131._0_4_;
              auVar303._4_4_ = auVar371._4_4_ * auVar131._4_4_;
              auVar303._8_4_ = auVar371._8_4_ * auVar131._8_4_;
              auVar303._12_4_ = auVar371._12_4_ * auVar131._12_4_;
              local_9a0._0_16_ = auVar371;
              local_8c0._0_4_ = auVar170._0_4_;
              if (fVar226 < 0.0) {
                local_a00._0_4_ = fVar200;
                local_980._0_16_ = auVar279;
                local_7e0._0_16_ = auVar303;
                local_8e0._0_16_ = auVar231;
                fVar226 = sqrtf(fVar226);
                auVar415 = ZEXT464((uint)local_8c0._0_4_);
                auVar335 = ZEXT1664(ZEXT816(0) << 0x40);
                auVar231 = local_8e0._0_16_;
                auVar279 = local_980._0_16_;
                auVar303 = local_7e0._0_16_;
                fVar200 = (float)local_a00._0_4_;
              }
              else {
                auVar170 = vsqrtss_avx(auVar132,auVar132);
                fVar226 = auVar170._0_4_;
              }
              auVar345._4_4_ = fStack_a5c;
              auVar345._0_4_ = local_a60;
              auVar345._8_4_ = fStack_a58;
              auVar345._12_4_ = fStack_a54;
              auVar170 = vdpps_avx(_local_a80,auVar303,0x7f);
              fVar226 = ((float)local_8a0._0_4_ / fVar226) * (fVar200 + 1.0) +
                        auVar415._0_4_ + fVar200 * (float)local_8a0._0_4_;
              auVar132 = vdpps_avx(auVar279,auVar303,0x7f);
              auVar161 = vdpps_avx(_local_a80,auVar231,0x7f);
              auVar131 = vdpps_avx(_local_880,auVar303,0x7f);
              auVar137 = vdpps_avx(_local_a80,auVar279,0x7f);
              fVar200 = auVar132._0_4_ + auVar161._0_4_;
              fVar241 = auVar170._0_4_;
              auVar138._0_4_ = fVar241 * fVar241;
              auVar138._4_4_ = auVar170._4_4_ * auVar170._4_4_;
              auVar138._8_4_ = auVar170._8_4_ * auVar170._8_4_;
              auVar138._12_4_ = auVar170._12_4_ * auVar170._12_4_;
              auVar161 = vsubps_avx(auVar345,auVar138);
              auVar132 = vdpps_avx(_local_a80,_local_880,0x7f);
              fVar204 = auVar137._0_4_ - fVar241 * fVar200;
              fVar225 = auVar132._0_4_ - fVar241 * auVar131._0_4_;
              auVar132 = vrsqrtss_avx(auVar161,auVar161);
              fVar205 = auVar161._0_4_;
              fVar241 = auVar132._0_4_;
              fVar241 = fVar241 * 1.5 + fVar205 * -0.5 * fVar241 * fVar241 * fVar241;
              if (fVar205 < 0.0) {
                local_a00._0_16_ = auVar170;
                local_980._0_4_ = fVar226;
                local_7e0._0_16_ = ZEXT416((uint)fVar200);
                local_8e0._0_16_ = auVar131;
                local_840._0_4_ = fVar204;
                local_860._0_4_ = fVar225;
                local_800._0_4_ = fVar241;
                fVar205 = sqrtf(fVar205);
                auVar415 = ZEXT464((uint)local_8c0._0_4_);
                auVar345._4_4_ = fStack_a5c;
                auVar345._0_4_ = local_a60;
                auVar345._8_4_ = fStack_a58;
                auVar345._12_4_ = fStack_a54;
                auVar335 = ZEXT1664(ZEXT816(0) << 0x40);
                fVar241 = (float)local_800._0_4_;
                fVar204 = (float)local_840._0_4_;
                fVar225 = (float)local_860._0_4_;
                auVar131 = local_8e0._0_16_;
                fVar226 = (float)local_980._0_4_;
                auVar170 = local_a00._0_16_;
                auVar132 = local_7e0._0_16_;
              }
              else {
                auVar132 = vsqrtss_avx(auVar161,auVar161);
                fVar205 = auVar132._0_4_;
                auVar132 = ZEXT416((uint)fVar200);
              }
              auVar377 = ZEXT1664(local_9a0._0_16_);
              auVar175 = vpermilps_avx(local_940._0_16_,0xff);
              auVar13 = vshufps_avx(local_9a0._0_16_,local_9a0._0_16_,0xff);
              fVar200 = fVar204 * fVar241 - auVar13._0_4_;
              auVar256._0_8_ = auVar131._0_8_ ^ 0x8000000080000000;
              auVar256._8_4_ = auVar131._8_4_ ^ 0x80000000;
              auVar256._12_4_ = auVar131._12_4_ ^ 0x80000000;
              auVar280._0_4_ = -fVar200;
              auVar280._4_4_ = 0x80000000;
              auVar280._8_4_ = 0x80000000;
              auVar280._12_4_ = 0x80000000;
              auVar161 = vinsertps_avx(ZEXT416((uint)(fVar225 * fVar241)),auVar256,0x10);
              auVar137 = vmovsldup_avx(ZEXT416((uint)(auVar132._0_4_ * fVar225 * fVar241 -
                                                     auVar131._0_4_ * fVar200)));
              auVar161 = vdivps_avx(auVar161,auVar137);
              auVar175 = ZEXT416((uint)(fVar205 - auVar175._0_4_));
              auVar131 = vinsertps_avx(auVar170,auVar175,0x10);
              auVar232._0_4_ = auVar131._0_4_ * auVar161._0_4_;
              auVar232._4_4_ = auVar131._4_4_ * auVar161._4_4_;
              auVar232._8_4_ = auVar131._8_4_ * auVar161._8_4_;
              auVar232._12_4_ = auVar131._12_4_ * auVar161._12_4_;
              auVar132 = vinsertps_avx(auVar280,auVar132,0x1c);
              auVar132 = vdivps_avx(auVar132,auVar137);
              auVar213._0_4_ = auVar131._0_4_ * auVar132._0_4_;
              auVar213._4_4_ = auVar131._4_4_ * auVar132._4_4_;
              auVar213._8_4_ = auVar131._8_4_ * auVar132._8_4_;
              auVar213._12_4_ = auVar131._12_4_ * auVar132._12_4_;
              auVar132 = vhaddps_avx(auVar232,auVar232);
              auVar161 = vhaddps_avx(auVar213,auVar213);
              local_ac0 = local_ac0 - auVar132._0_4_;
              auVar389 = ZEXT464((uint)local_ac0);
              local_ae0 = local_ae0 - auVar161._0_4_;
              auVar400 = ZEXT464((uint)local_ae0);
              auVar257._8_4_ = 0x7fffffff;
              auVar257._0_8_ = 0x7fffffff7fffffff;
              auVar257._12_4_ = 0x7fffffff;
              auVar310 = ZEXT1664(auVar257);
              auVar170 = vandps_avx(auVar170,auVar257);
              if (fVar226 <= auVar170._0_4_) {
LAB_012149c2:
                bVar88 = false;
              }
              else {
                auVar170 = vandps_avx(auVar175,auVar257);
                if ((float)local_700._0_4_ * 1.9073486e-06 + auVar415._0_4_ + fVar226 <=
                    auVar170._0_4_) goto LAB_012149c2;
                local_ae0 = local_ae0 + (float)local_7a0._0_4_;
                auVar400 = ZEXT464((uint)local_ae0);
                bVar88 = true;
                if (((((ray->super_RayK<1>).org.field_0.m128[3] <= local_ae0) &&
                     (fVar226 = (ray->super_RayK<1>).tfar, local_ae0 <= fVar226)) &&
                    (0.0 <= local_ac0)) && (local_ac0 <= 1.0)) {
                  auVar170 = vrsqrtss_avx(auVar345,auVar345);
                  fVar200 = auVar170._0_4_;
                  pGVar32 = (context->scene->geometries).items[local_ae8].ptr;
                  if ((pGVar32->mask & (ray->super_RayK<1>).mask) != 0) {
                    auVar170 = ZEXT416((uint)(fVar200 * 1.5 +
                                             auVar345._0_4_ * -0.5 * fVar200 * fVar200 * fVar200));
                    auVar170 = vshufps_avx(auVar170,auVar170,0);
                    auVar176._0_4_ = auVar170._0_4_ * (float)local_a80._0_4_;
                    auVar176._4_4_ = auVar170._4_4_ * (float)local_a80._4_4_;
                    auVar176._8_4_ = auVar170._8_4_ * fStack_a78;
                    auVar176._12_4_ = auVar170._12_4_ * fStack_a74;
                    auVar139._0_4_ = local_9a0._0_4_ + auVar13._0_4_ * auVar176._0_4_;
                    auVar139._4_4_ = local_9a0._4_4_ + auVar13._4_4_ * auVar176._4_4_;
                    auVar139._8_4_ = local_9a0._8_4_ + auVar13._8_4_ * auVar176._8_4_;
                    auVar139._12_4_ = local_9a0._12_4_ + auVar13._12_4_ * auVar176._12_4_;
                    auVar170 = vshufps_avx(auVar176,auVar176,0xc9);
                    auVar132 = vshufps_avx(local_9a0._0_16_,local_9a0._0_16_,0xc9);
                    auVar177._0_4_ = auVar132._0_4_ * auVar176._0_4_;
                    auVar177._4_4_ = auVar132._4_4_ * auVar176._4_4_;
                    auVar177._8_4_ = auVar132._8_4_ * auVar176._8_4_;
                    auVar177._12_4_ = auVar132._12_4_ * auVar176._12_4_;
                    auVar214._0_4_ = local_9a0._0_4_ * auVar170._0_4_;
                    auVar214._4_4_ = local_9a0._4_4_ * auVar170._4_4_;
                    auVar214._8_4_ = local_9a0._8_4_ * auVar170._8_4_;
                    auVar214._12_4_ = local_9a0._12_4_ * auVar170._12_4_;
                    auVar161 = vsubps_avx(auVar214,auVar177);
                    auVar170 = vshufps_avx(auVar161,auVar161,0xc9);
                    auVar132 = vshufps_avx(auVar139,auVar139,0xc9);
                    auVar215._0_4_ = auVar132._0_4_ * auVar170._0_4_;
                    auVar215._4_4_ = auVar132._4_4_ * auVar170._4_4_;
                    auVar215._8_4_ = auVar132._8_4_ * auVar170._8_4_;
                    auVar215._12_4_ = auVar132._12_4_ * auVar170._12_4_;
                    auVar170 = vshufps_avx(auVar161,auVar161,0xd2);
                    auVar140._0_4_ = auVar139._0_4_ * auVar170._0_4_;
                    auVar140._4_4_ = auVar139._4_4_ * auVar170._4_4_;
                    auVar140._8_4_ = auVar139._8_4_ * auVar170._8_4_;
                    auVar140._12_4_ = auVar139._12_4_ * auVar170._12_4_;
                    auVar170 = vsubps_avx(auVar215,auVar140);
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar32->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                      (ray->super_RayK<1>).tfar = local_ae0;
                      auVar132 = vshufps_avx(auVar170,auVar170,0xe9);
                      uVar9 = vmovlps_avx(auVar132);
                      *(undefined8 *)&(ray->Ng).field_0 = uVar9;
                      (ray->Ng).field_0.field_0.z = auVar170._0_4_;
                      ray->u = local_ac0;
                      ray->v = 0.0;
                      ray->primID = (uint)local_a88;
                      ray->geomID = (uint)local_ae8;
                      ray->instID[0] = context->user->instID[0];
                      ray->instPrimID[0] = context->user->instPrimID[0];
                    }
                    else {
                      auVar132 = vshufps_avx(auVar170,auVar170,0xe9);
                      local_910 = vmovlps_avx(auVar132);
                      local_908 = auVar170._0_4_;
                      local_904 = local_ac0;
                      local_900 = 0;
                      local_8fc = (uint)local_a88;
                      local_8f8 = (uint)local_ae8;
                      local_8f4 = context->user->instID[0];
                      local_8f0 = context->user->instPrimID[0];
                      (ray->super_RayK<1>).tfar = local_ae0;
                      local_aec = -1;
                      local_a30.valid = &local_aec;
                      local_a30.geometryUserPtr = pGVar32->userPtr;
                      local_a30.context = context->user;
                      local_a30.ray = (RTCRayN *)ray;
                      local_a30.hit = (RTCHitN *)&local_910;
                      local_a30.N = 1;
                      fStack_abc = 0.0;
                      fStack_ab8 = 0.0;
                      fStack_ab4 = 0.0;
                      fStack_adc = 0.0;
                      fStack_ad8 = 0.0;
                      fStack_ad4 = 0.0;
                      local_a60 = fVar226;
                      if (pGVar32->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01214afa:
                        p_Var35 = context->args->filter;
                        if (p_Var35 != (RTCFilterFunctionN)0x0) {
                          if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                             (((pGVar32->field_8).field_0x2 & 0x40) != 0)) {
                            auVar377 = ZEXT1664(auVar377._0_16_);
                            auVar415 = ZEXT1664(auVar415._0_16_);
                            (*p_Var35)(&local_a30);
                            auVar400 = ZEXT1664(CONCAT412(fStack_ad4,
                                                          CONCAT48(fStack_ad8,
                                                                   CONCAT44(fStack_adc,local_ae0))))
                            ;
                            auVar389 = ZEXT1664(CONCAT412(fStack_ab4,
                                                          CONCAT48(fStack_ab8,
                                                                   CONCAT44(fStack_abc,local_ac0))))
                            ;
                            auVar310 = ZEXT1664(CONCAT412(0x7fffffff,
                                                          CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                            auVar335 = ZEXT1664(ZEXT816(0) << 0x40);
                          }
                          if (*local_a30.valid == 0) goto LAB_01214baf;
                        }
                        (((Vec3f *)((long)local_a30.ray + 0x30))->field_0).components[0] =
                             *(float *)local_a30.hit;
                        (((Vec3f *)((long)local_a30.ray + 0x30))->field_0).field_0.y =
                             *(float *)(local_a30.hit + 4);
                        (((Vec3f *)((long)local_a30.ray + 0x30))->field_0).field_0.z =
                             *(float *)(local_a30.hit + 8);
                        *(float *)((long)local_a30.ray + 0x3c) = *(float *)(local_a30.hit + 0xc);
                        *(float *)((long)local_a30.ray + 0x40) = *(float *)(local_a30.hit + 0x10);
                        *(float *)((long)local_a30.ray + 0x44) = *(float *)(local_a30.hit + 0x14);
                        *(float *)((long)local_a30.ray + 0x48) = *(float *)(local_a30.hit + 0x18);
                        *(float *)((long)local_a30.ray + 0x4c) = *(float *)(local_a30.hit + 0x1c);
                        *(float *)((long)local_a30.ray + 0x50) = *(float *)(local_a30.hit + 0x20);
                      }
                      else {
                        auVar377 = ZEXT1664(local_9a0._0_16_);
                        auVar415 = ZEXT1664(auVar415._0_16_);
                        (*pGVar32->intersectionFilterN)(&local_a30);
                        auVar400 = ZEXT1664(CONCAT412(fStack_ad4,
                                                      CONCAT48(fStack_ad8,
                                                               CONCAT44(fStack_adc,local_ae0))));
                        auVar389 = ZEXT1664(CONCAT412(fStack_ab4,
                                                      CONCAT48(fStack_ab8,
                                                               CONCAT44(fStack_abc,local_ac0))));
                        auVar310 = ZEXT1664(CONCAT412(0x7fffffff,
                                                      CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                        auVar335 = ZEXT1664(ZEXT816(0) << 0x40);
                        if (*local_a30.valid != 0) goto LAB_01214afa;
LAB_01214baf:
                        (ray->super_RayK<1>).tfar = local_a60;
                      }
                    }
                  }
                }
              }
              auVar147 = local_600;
              bVar125 = lVar120 != 0;
              lVar120 = lVar120 + -1;
            } while ((!bVar88) && (bVar125));
            fVar226 = (ray->super_RayK<1>).tfar;
            auVar150._4_4_ = fVar226;
            auVar150._0_4_ = fVar226;
            auVar150._8_4_ = fVar226;
            auVar150._12_4_ = fVar226;
            auVar150._16_4_ = fVar226;
            auVar150._20_4_ = fVar226;
            auVar150._24_4_ = fVar226;
            auVar150._28_4_ = fVar226;
            auVar182 = vcmpps_avx(_local_740,auVar150,2);
            local_600 = vandps_avx(auVar182,local_600);
            auVar147 = auVar147 & auVar182;
            uVar124 = local_640._0_8_;
          } while ((((((((auVar147 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                        (auVar147 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (auVar147 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      SUB321(auVar147 >> 0x7f,0) != '\0') ||
                     (auVar147 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    SUB321(auVar147 >> 0xbf,0) != '\0') ||
                   (auVar147 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   auVar147[0x1f] < '\0');
        }
        auVar310 = ZEXT3264(local_820);
        auVar147 = vandps_avx(local_580,local_560);
        auVar182 = vandps_avx(_local_780,local_760);
        auVar224._0_4_ = local_820._0_4_ + local_460._0_4_;
        auVar224._4_4_ = local_820._4_4_ + local_460._4_4_;
        auVar224._8_4_ = local_820._8_4_ + local_460._8_4_;
        auVar224._12_4_ = local_820._12_4_ + local_460._12_4_;
        auVar224._16_4_ = local_820._16_4_ + local_460._16_4_;
        auVar224._20_4_ = local_820._20_4_ + local_460._20_4_;
        auVar224._24_4_ = local_820._24_4_ + local_460._24_4_;
        auVar224._28_4_ = local_820._28_4_ + local_460._28_4_;
        fVar226 = (ray->super_RayK<1>).tfar;
        auVar262._4_4_ = fVar226;
        auVar262._0_4_ = fVar226;
        auVar262._8_4_ = fVar226;
        auVar262._12_4_ = fVar226;
        auVar262._16_4_ = fVar226;
        auVar262._20_4_ = fVar226;
        auVar262._24_4_ = fVar226;
        auVar262._28_4_ = fVar226;
        auVar36 = vcmpps_avx(auVar224,auVar262,2);
        auVar147 = vandps_avx(auVar36,auVar147);
        auVar290._0_4_ = local_820._0_4_ + local_4a0._0_4_;
        auVar290._4_4_ = local_820._4_4_ + local_4a0._4_4_;
        auVar290._8_4_ = local_820._8_4_ + local_4a0._8_4_;
        auVar290._12_4_ = local_820._12_4_ + local_4a0._12_4_;
        auVar290._16_4_ = local_820._16_4_ + local_4a0._16_4_;
        auVar290._20_4_ = local_820._20_4_ + local_4a0._20_4_;
        auVar290._24_4_ = local_820._24_4_ + local_4a0._24_4_;
        auVar290._28_4_ = local_820._28_4_ + local_4a0._28_4_;
        auVar36 = vcmpps_avx(auVar290,auVar262,2);
        auVar182 = vandps_avx(auVar36,auVar182);
        auVar182 = vorps_avx(auVar147,auVar182);
        if ((((((((auVar182 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar182 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar182 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar182 >> 0x7f,0) != '\0') ||
              (auVar182 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar182 >> 0xbf,0) != '\0') ||
            (auVar182 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar182[0x1f] < '\0') {
          *(undefined1 (*) [32])(auStack_180 + uVar118 * 0x60) = auVar182;
          auVar147 = vblendvps_avx(_local_4a0,local_460,auVar147);
          *(undefined1 (*) [32])(auStack_160 + uVar118 * 0x60) = auVar147;
          auVar114._8_8_ = uStack_7a8;
          auVar114._0_8_ = local_7b0;
          uVar9 = vmovlps_avx(auVar114);
          *(undefined8 *)(afStack_140 + uVar118 * 0x18) = uVar9;
          auStack_138[uVar118 * 0x18] = (int)uVar124 + 1;
          uVar118 = (ulong)((int)uVar118 + 1);
        }
        auVar292 = ZEXT3264(CONCAT428(0x3f800000,
                                      CONCAT424(0x3f800000,
                                                CONCAT420(0x3f800000,
                                                          CONCAT416(0x3f800000,
                                                                    CONCAT412(0x3f800000,
                                                                              CONCAT48(0x3f800000,
                                                                                       &
                                                  DAT_3f8000003f800000)))))));
      }
    }
    fVar226 = (ray->super_RayK<1>).tfar;
    auVar145._4_4_ = fVar226;
    auVar145._0_4_ = fVar226;
    auVar145._8_4_ = fVar226;
    auVar145._12_4_ = fVar226;
    auVar145._16_4_ = fVar226;
    auVar145._20_4_ = fVar226;
    auVar145._24_4_ = fVar226;
    auVar145._28_4_ = fVar226;
    do {
      if ((int)uVar118 == 0) {
        fVar226 = (ray->super_RayK<1>).tfar;
        auVar153._4_4_ = fVar226;
        auVar153._0_4_ = fVar226;
        auVar153._8_4_ = fVar226;
        auVar153._12_4_ = fVar226;
        auVar153._16_4_ = fVar226;
        auVar153._20_4_ = fVar226;
        auVar153._24_4_ = fVar226;
        auVar153._28_4_ = fVar226;
        auVar147 = vcmpps_avx(local_2a0,auVar153,2);
        uVar117 = vmovmskps_avx(auVar147);
        uVar117 = (uint)local_788 - 1 & (uint)local_788 & uVar117;
        if (uVar117 == 0) {
          return;
        }
        goto LAB_01212281;
      }
      uVar119 = (ulong)((int)uVar118 - 1);
      lVar120 = uVar119 * 0x60;
      auVar147 = *(undefined1 (*) [32])(auStack_160 + lVar120);
      auVar185._0_4_ = auVar310._0_4_ + auVar147._0_4_;
      auVar185._4_4_ = auVar310._4_4_ + auVar147._4_4_;
      auVar185._8_4_ = auVar310._8_4_ + auVar147._8_4_;
      auVar185._12_4_ = auVar310._12_4_ + auVar147._12_4_;
      auVar185._16_4_ = auVar310._16_4_ + auVar147._16_4_;
      auVar185._20_4_ = auVar310._20_4_ + auVar147._20_4_;
      auVar185._24_4_ = auVar310._24_4_ + auVar147._24_4_;
      auVar185._28_4_ = auVar310._28_4_ + auVar147._28_4_;
      auVar36 = vcmpps_avx(auVar185,auVar145,2);
      auVar182 = vandps_avx(auVar36,*(undefined1 (*) [32])(auStack_180 + lVar120));
      local_460 = auVar182;
      auVar36 = *(undefined1 (*) [32])(auStack_180 + lVar120) & auVar36;
      bVar106 = (auVar36 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar107 = (auVar36 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar105 = (auVar36 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar104 = SUB321(auVar36 >> 0x7f,0) == '\0';
      bVar103 = (auVar36 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
      bVar102 = SUB321(auVar36 >> 0xbf,0) == '\0';
      bVar125 = (auVar36 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
      bVar88 = -1 < auVar36[0x1f];
      if (((((((!bVar106 || !bVar107) || !bVar105) || !bVar104) || !bVar103) || !bVar102) ||
          !bVar125) || !bVar88) {
        auVar238._8_4_ = 0x7f800000;
        auVar238._0_8_ = 0x7f8000007f800000;
        auVar238._12_4_ = 0x7f800000;
        auVar238._16_4_ = 0x7f800000;
        auVar238._20_4_ = 0x7f800000;
        auVar238._24_4_ = 0x7f800000;
        auVar238._28_4_ = 0x7f800000;
        auVar147 = vblendvps_avx(auVar238,auVar147,auVar182);
        auVar36 = vshufps_avx(auVar147,auVar147,0xb1);
        auVar36 = vminps_avx(auVar147,auVar36);
        auVar37 = vshufpd_avx(auVar36,auVar36,5);
        auVar36 = vminps_avx(auVar36,auVar37);
        auVar37 = vperm2f128_avx(auVar36,auVar36,1);
        auVar36 = vminps_avx(auVar36,auVar37);
        auVar147 = vcmpps_avx(auVar147,auVar36,0);
        auVar36 = auVar182 & auVar147;
        if ((((((((auVar36 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar36 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar36 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar36 >> 0x7f,0) != '\0') ||
              (auVar36 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar36 >> 0xbf,0) != '\0') ||
            (auVar36 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar36[0x1f] < '\0') {
          auVar182 = vandps_avx(auVar147,auVar182);
        }
        fVar226 = afStack_140[uVar119 * 0x18 + 1];
        uVar124 = (ulong)auStack_138[uVar119 * 0x18];
        uVar122 = vmovmskps_avx(auVar182);
        uVar117 = 0;
        if (uVar122 != 0) {
          for (; (uVar122 >> uVar117 & 1) == 0; uVar117 = uVar117 + 1) {
          }
        }
        fVar200 = afStack_140[uVar119 * 0x18];
        *(undefined4 *)(local_460 + (ulong)uVar117 * 4) = 0;
        if ((((((((local_460 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (local_460 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (local_460 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(local_460 >> 0x7f,0) != '\0') ||
              (local_460 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(local_460 >> 0xbf,0) != '\0') ||
            (local_460 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            local_460[0x1f] < '\0') {
          uVar119 = uVar118;
        }
        *(undefined1 (*) [32])(auStack_180 + lVar120) = local_460;
        auVar170 = vshufps_avx(ZEXT416((uint)(fVar226 - fVar200)),ZEXT416((uint)(fVar226 - fVar200))
                               ,0);
        local_4a0._4_4_ = fVar200 + auVar170._4_4_ * 0.14285715;
        local_4a0._0_4_ = fVar200 + auVar170._0_4_ * 0.0;
        fStack_498 = fVar200 + auVar170._8_4_ * 0.2857143;
        fStack_494 = fVar200 + auVar170._12_4_ * 0.42857146;
        fStack_490 = fVar200 + auVar170._0_4_ * 0.5714286;
        fStack_48c = fVar200 + auVar170._4_4_ * 0.71428573;
        fStack_488 = fVar200 + auVar170._8_4_ * 0.8571429;
        fStack_484 = fVar200 + auVar170._12_4_;
        local_7b0 = *(undefined8 *)(local_4a0 + (ulong)uVar117 * 4);
        uStack_7a8 = 0;
      }
      uVar118 = uVar119;
    } while (((((((bVar106 && bVar107) && bVar105) && bVar104) && bVar103) && bVar102) && bVar125)
             && bVar88);
  } while( true );
}

Assistant:

static __forceinline void intersect_t(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time());

          Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }